

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  Primitive PVar12;
  Geometry *pGVar13;
  __int_type_conflict _Var14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  bool bVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  bool bVar81;
  bool bVar82;
  bool bVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  uint uVar95;
  ulong uVar96;
  ulong uVar97;
  long lVar98;
  byte bVar99;
  long lVar100;
  uint uVar101;
  byte unaff_R14B;
  vint4 bi_2;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar125;
  float fVar126;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar127;
  float fVar128;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar129;
  float fVar160;
  float fVar162;
  vint4 bi_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar165;
  undefined1 auVar133 [16];
  float fVar130;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar166;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar144 [32];
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar167;
  float fVar168;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar172;
  float fVar198;
  float fVar201;
  vint4 bi;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar173;
  float fVar174;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar199;
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar190 [32];
  float fVar200;
  float fVar203;
  float fVar206;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar210;
  float fVar222;
  float fVar223;
  vint4 ai_1;
  undefined1 auVar211 [16];
  float fVar224;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar225;
  float fVar240;
  float fVar241;
  vint4 ai_2;
  undefined1 auVar226 [16];
  float fVar242;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar238 [32];
  float fVar243;
  undefined1 auVar239 [64];
  float fVar244;
  float fVar245;
  float fVar258;
  float fVar260;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar262;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar259;
  float fVar261;
  float fVar263;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  float fVar268;
  float fVar280;
  float fVar281;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar283;
  float fVar285;
  float fVar287;
  float fVar289;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar288;
  float fVar290;
  undefined1 auVar279 [32];
  vint4 ai;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar298 [32];
  undefined1 auVar297 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [64];
  float fVar305;
  float fVar306;
  float fVar313;
  float fVar315;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar314;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar320;
  float fVar322;
  float fVar324;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  float fVar319;
  float fVar321;
  float fVar323;
  undefined1 auVar312 [64];
  float t_2;
  float fVar325;
  float fVar328;
  float fVar329;
  undefined1 auVar326 [16];
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar327 [32];
  float s;
  undefined1 auVar337 [16];
  float fVar341;
  undefined1 auVar338 [32];
  float fVar340;
  undefined1 auVar339 [64];
  float s_1;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  float fVar347;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [64];
  float fVar348;
  float fVar349;
  float fVar356;
  float fVar358;
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  float fVar357;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar375;
  float fVar377;
  float fVar379;
  undefined1 auVar372 [16];
  float fVar376;
  float fVar378;
  float fVar380;
  float fVar381;
  float fVar383;
  float fVar386;
  float fVar388;
  undefined1 auVar373 [32];
  float fVar382;
  float fVar384;
  float fVar385;
  float fVar387;
  undefined1 auVar374 [64];
  undefined1 auVar389 [28];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  float fVar393;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  undefined1 auVar394 [32];
  float t;
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_ad1;
  int local_ac4;
  float local_ac0;
  undefined4 uStack_abc;
  undefined4 uStack_ab8;
  undefined4 uStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  undefined4 uStack_a7c;
  undefined4 uStack_a78;
  undefined4 uStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  ulong local_a48;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  RTCFilterFunctionNArguments local_910;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined8 local_840;
  undefined4 local_838;
  float local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  uint local_824;
  uint local_820;
  ulong local_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  Primitive *local_690;
  ulong local_688;
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  ulong local_540;
  undefined1 auStack_538 [24];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_4a0 [4];
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float local_480 [4];
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar12 = prim[1];
  uVar96 = (ulong)(byte)PVar12;
  lVar100 = uVar96 * 0x25;
  fVar130 = *(float *)(prim + lVar100 + 0x12);
  auVar141 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar100 + 6));
  auVar291._0_4_ = fVar130 * (ray->dir).field_0.m128[0];
  auVar291._4_4_ = fVar130 * (ray->dir).field_0.m128[1];
  auVar291._8_4_ = fVar130 * (ray->dir).field_0.m128[2];
  auVar291._12_4_ = fVar130 * (ray->dir).field_0.m128[3];
  auVar175._0_4_ = fVar130 * auVar141._0_4_;
  auVar175._4_4_ = fVar130 * auVar141._4_4_;
  auVar175._8_4_ = fVar130 * auVar141._8_4_;
  auVar175._12_4_ = fVar130 * auVar141._12_4_;
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 4 + 6)));
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 5 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar185 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 6 + 6)));
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 0xf + 6)));
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar96 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 0x1a + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 0x1b + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 0x1c + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vshufps_avx(auVar291,auVar291,0);
  auVar23 = vshufps_avx(auVar291,auVar291,0x55);
  auVar24 = vshufps_avx(auVar291,auVar291,0xaa);
  fVar130 = auVar24._0_4_;
  fVar161 = auVar24._4_4_;
  fVar163 = auVar24._8_4_;
  fVar167 = auVar24._12_4_;
  fVar225 = auVar23._0_4_;
  fVar240 = auVar23._4_4_;
  fVar241 = auVar23._8_4_;
  fVar242 = auVar23._12_4_;
  fVar210 = auVar22._0_4_;
  fVar222 = auVar22._4_4_;
  fVar223 = auVar22._8_4_;
  fVar224 = auVar22._12_4_;
  auVar350._0_4_ = fVar210 * auVar141._0_4_ + fVar225 * auVar111._0_4_ + fVar130 * auVar185._0_4_;
  auVar350._4_4_ = fVar222 * auVar141._4_4_ + fVar240 * auVar111._4_4_ + fVar161 * auVar185._4_4_;
  auVar350._8_4_ = fVar223 * auVar141._8_4_ + fVar241 * auVar111._8_4_ + fVar163 * auVar185._8_4_;
  auVar350._12_4_ =
       fVar224 * auVar141._12_4_ + fVar242 * auVar111._12_4_ + fVar167 * auVar185._12_4_;
  auVar372._0_4_ = fVar210 * auVar138._0_4_ + fVar225 * auVar17._0_4_ + auVar18._0_4_ * fVar130;
  auVar372._4_4_ = fVar222 * auVar138._4_4_ + fVar240 * auVar17._4_4_ + auVar18._4_4_ * fVar161;
  auVar372._8_4_ = fVar223 * auVar138._8_4_ + fVar241 * auVar17._8_4_ + auVar18._8_4_ * fVar163;
  auVar372._12_4_ = fVar224 * auVar138._12_4_ + fVar242 * auVar17._12_4_ + auVar18._12_4_ * fVar167;
  auVar292._0_4_ = fVar210 * auVar19._0_4_ + fVar225 * auVar20._0_4_ + auVar21._0_4_ * fVar130;
  auVar292._4_4_ = fVar222 * auVar19._4_4_ + fVar240 * auVar20._4_4_ + auVar21._4_4_ * fVar161;
  auVar292._8_4_ = fVar223 * auVar19._8_4_ + fVar241 * auVar20._8_4_ + auVar21._8_4_ * fVar163;
  auVar292._12_4_ = fVar224 * auVar19._12_4_ + fVar242 * auVar20._12_4_ + auVar21._12_4_ * fVar167;
  auVar22 = vshufps_avx(auVar175,auVar175,0);
  auVar23 = vshufps_avx(auVar175,auVar175,0x55);
  auVar24 = vshufps_avx(auVar175,auVar175,0xaa);
  fVar130 = auVar24._0_4_;
  fVar161 = auVar24._4_4_;
  fVar163 = auVar24._8_4_;
  fVar167 = auVar24._12_4_;
  fVar225 = auVar23._0_4_;
  fVar240 = auVar23._4_4_;
  fVar241 = auVar23._8_4_;
  fVar242 = auVar23._12_4_;
  fVar210 = auVar22._0_4_;
  fVar222 = auVar22._4_4_;
  fVar223 = auVar22._8_4_;
  fVar224 = auVar22._12_4_;
  auVar176._0_4_ = fVar210 * auVar141._0_4_ + fVar225 * auVar111._0_4_ + fVar130 * auVar185._0_4_;
  auVar176._4_4_ = fVar222 * auVar141._4_4_ + fVar240 * auVar111._4_4_ + fVar161 * auVar185._4_4_;
  auVar176._8_4_ = fVar223 * auVar141._8_4_ + fVar241 * auVar111._8_4_ + fVar163 * auVar185._8_4_;
  auVar176._12_4_ =
       fVar224 * auVar141._12_4_ + fVar242 * auVar111._12_4_ + fVar167 * auVar185._12_4_;
  auVar131._0_4_ = fVar210 * auVar138._0_4_ + auVar18._0_4_ * fVar130 + fVar225 * auVar17._0_4_;
  auVar131._4_4_ = fVar222 * auVar138._4_4_ + auVar18._4_4_ * fVar161 + fVar240 * auVar17._4_4_;
  auVar131._8_4_ = fVar223 * auVar138._8_4_ + auVar18._8_4_ * fVar163 + fVar241 * auVar17._8_4_;
  auVar131._12_4_ = fVar224 * auVar138._12_4_ + auVar18._12_4_ * fVar167 + fVar242 * auVar17._12_4_;
  auVar102._0_4_ = fVar210 * auVar19._0_4_ + fVar225 * auVar20._0_4_ + auVar21._0_4_ * fVar130;
  auVar102._4_4_ = fVar222 * auVar19._4_4_ + fVar240 * auVar20._4_4_ + auVar21._4_4_ * fVar161;
  auVar102._8_4_ = fVar223 * auVar19._8_4_ + fVar241 * auVar20._8_4_ + auVar21._8_4_ * fVar163;
  auVar102._12_4_ = fVar224 * auVar19._12_4_ + fVar242 * auVar20._12_4_ + auVar21._12_4_ * fVar167;
  auVar269._8_4_ = 0x7fffffff;
  auVar269._0_8_ = 0x7fffffff7fffffff;
  auVar269._12_4_ = 0x7fffffff;
  auVar141 = vandps_avx(auVar350,auVar269);
  auVar226._8_4_ = 0x219392ef;
  auVar226._0_8_ = 0x219392ef219392ef;
  auVar226._12_4_ = 0x219392ef;
  auVar141 = vcmpps_avx(auVar141,auVar226,1);
  auVar111 = vblendvps_avx(auVar350,auVar226,auVar141);
  auVar141 = vandps_avx(auVar372,auVar269);
  auVar141 = vcmpps_avx(auVar141,auVar226,1);
  auVar185 = vblendvps_avx(auVar372,auVar226,auVar141);
  auVar141 = vandps_avx(auVar292,auVar269);
  auVar141 = vcmpps_avx(auVar141,auVar226,1);
  auVar141 = vblendvps_avx(auVar292,auVar226,auVar141);
  auVar138 = vrcpps_avx(auVar111);
  fVar210 = auVar138._0_4_;
  auVar211._0_4_ = fVar210 * auVar111._0_4_;
  fVar222 = auVar138._4_4_;
  auVar211._4_4_ = fVar222 * auVar111._4_4_;
  fVar223 = auVar138._8_4_;
  auVar211._8_4_ = fVar223 * auVar111._8_4_;
  fVar224 = auVar138._12_4_;
  auVar211._12_4_ = fVar224 * auVar111._12_4_;
  auVar293._8_4_ = 0x3f800000;
  auVar293._0_8_ = &DAT_3f8000003f800000;
  auVar293._12_4_ = 0x3f800000;
  auVar111 = vsubps_avx(auVar293,auVar211);
  fVar210 = fVar210 + fVar210 * auVar111._0_4_;
  fVar222 = fVar222 + fVar222 * auVar111._4_4_;
  fVar223 = fVar223 + fVar223 * auVar111._8_4_;
  fVar224 = fVar224 + fVar224 * auVar111._12_4_;
  auVar111 = vrcpps_avx(auVar185);
  fVar225 = auVar111._0_4_;
  auVar246._0_4_ = fVar225 * auVar185._0_4_;
  fVar240 = auVar111._4_4_;
  auVar246._4_4_ = fVar240 * auVar185._4_4_;
  fVar241 = auVar111._8_4_;
  auVar246._8_4_ = fVar241 * auVar185._8_4_;
  fVar242 = auVar111._12_4_;
  auVar246._12_4_ = fVar242 * auVar185._12_4_;
  auVar111 = vsubps_avx(auVar293,auVar246);
  fVar225 = fVar225 + fVar225 * auVar111._0_4_;
  fVar240 = fVar240 + fVar240 * auVar111._4_4_;
  fVar241 = fVar241 + fVar241 * auVar111._8_4_;
  fVar242 = fVar242 + fVar242 * auVar111._12_4_;
  auVar111 = vrcpps_avx(auVar141);
  fVar244 = auVar111._0_4_;
  auVar270._0_4_ = fVar244 * auVar141._0_4_;
  fVar258 = auVar111._4_4_;
  auVar270._4_4_ = fVar258 * auVar141._4_4_;
  fVar260 = auVar111._8_4_;
  auVar270._8_4_ = fVar260 * auVar141._8_4_;
  fVar262 = auVar111._12_4_;
  auVar270._12_4_ = fVar262 * auVar141._12_4_;
  auVar141 = vsubps_avx(auVar293,auVar270);
  fVar244 = fVar244 + fVar244 * auVar141._0_4_;
  fVar258 = fVar258 + fVar258 * auVar141._4_4_;
  fVar260 = fVar260 + fVar260 * auVar141._8_4_;
  fVar262 = fVar262 + fVar262 * auVar141._12_4_;
  auVar141 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar100 + 0x16)) *
                           *(float *)(prim + lVar100 + 0x1a)));
  auVar185 = vshufps_avx(auVar141,auVar141,0);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar96 * 7 + 6);
  auVar141 = vpmovsxwd_avx(auVar141);
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar96 * 0xb + 6);
  auVar111 = vpmovsxwd_avx(auVar111);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar141);
  fVar130 = auVar185._0_4_;
  fVar161 = auVar185._4_4_;
  fVar163 = auVar185._8_4_;
  fVar167 = auVar185._12_4_;
  auVar294._0_4_ = auVar111._0_4_ * fVar130 + auVar141._0_4_;
  auVar294._4_4_ = auVar111._4_4_ * fVar161 + auVar141._4_4_;
  auVar294._8_4_ = auVar111._8_4_ * fVar163 + auVar141._8_4_;
  auVar294._12_4_ = auVar111._12_4_ * fVar167 + auVar141._12_4_;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + uVar96 * 9 + 6);
  auVar141 = vpmovsxwd_avx(auVar185);
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar96 * 0xd + 6);
  auVar111 = vpmovsxwd_avx(auVar138);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar141);
  auVar307._0_4_ = auVar111._0_4_ * fVar130 + auVar141._0_4_;
  auVar307._4_4_ = auVar111._4_4_ * fVar161 + auVar141._4_4_;
  auVar307._8_4_ = auVar111._8_4_ * fVar163 + auVar141._8_4_;
  auVar307._12_4_ = auVar111._12_4_ * fVar167 + auVar141._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar96 * 0x12 + 6);
  auVar141 = vpmovsxwd_avx(auVar17);
  auVar141 = vcvtdq2ps_avx(auVar141);
  uVar97 = (ulong)(uint)((int)(uVar96 * 5) << 2);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar96 * 2 + uVar97 + 6);
  auVar111 = vpmovsxwd_avx(auVar18);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar141);
  auVar326._0_4_ = auVar111._0_4_ * fVar130 + auVar141._0_4_;
  auVar326._4_4_ = auVar111._4_4_ * fVar161 + auVar141._4_4_;
  auVar326._8_4_ = auVar111._8_4_ * fVar163 + auVar141._8_4_;
  auVar326._12_4_ = auVar111._12_4_ * fVar167 + auVar141._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar97 + 6);
  auVar141 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar96 * 0x18 + 6);
  auVar111 = vpmovsxwd_avx(auVar20);
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar141);
  auVar337._0_4_ = auVar111._0_4_ * fVar130 + auVar141._0_4_;
  auVar337._4_4_ = auVar111._4_4_ * fVar161 + auVar141._4_4_;
  auVar337._8_4_ = auVar111._8_4_ * fVar163 + auVar141._8_4_;
  auVar337._12_4_ = auVar111._12_4_ * fVar167 + auVar141._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar96 * 0x1d + 6);
  auVar141 = vpmovsxwd_avx(auVar21);
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar96 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar111 = vpmovsxwd_avx(auVar22);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar185 = vsubps_avx(auVar111,auVar141);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar96) + 6);
  auVar111 = vpmovsxwd_avx(auVar23);
  auVar342._0_4_ = auVar185._0_4_ * fVar130 + auVar141._0_4_;
  auVar342._4_4_ = auVar185._4_4_ * fVar161 + auVar141._4_4_;
  auVar342._8_4_ = auVar185._8_4_ * fVar163 + auVar141._8_4_;
  auVar342._12_4_ = auVar185._12_4_ * fVar167 + auVar141._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar96 * 0x23 + 6);
  auVar185 = vpmovsxwd_avx(auVar24);
  auVar141 = vcvtdq2ps_avx(auVar111);
  auVar111 = vcvtdq2ps_avx(auVar185);
  auVar111 = vsubps_avx(auVar111,auVar141);
  auVar271._0_4_ = auVar141._0_4_ + auVar111._0_4_ * fVar130;
  auVar271._4_4_ = auVar141._4_4_ + auVar111._4_4_ * fVar161;
  auVar271._8_4_ = auVar141._8_4_ + auVar111._8_4_ * fVar163;
  auVar271._12_4_ = auVar141._12_4_ + auVar111._12_4_ * fVar167;
  auVar141 = vsubps_avx(auVar294,auVar176);
  auVar295._0_4_ = fVar210 * auVar141._0_4_;
  auVar295._4_4_ = fVar222 * auVar141._4_4_;
  auVar295._8_4_ = fVar223 * auVar141._8_4_;
  auVar295._12_4_ = fVar224 * auVar141._12_4_;
  auVar141 = vsubps_avx(auVar307,auVar176);
  auVar177._0_4_ = fVar210 * auVar141._0_4_;
  auVar177._4_4_ = fVar222 * auVar141._4_4_;
  auVar177._8_4_ = fVar223 * auVar141._8_4_;
  auVar177._12_4_ = fVar224 * auVar141._12_4_;
  auVar141 = vsubps_avx(auVar326,auVar131);
  auVar212._0_4_ = fVar225 * auVar141._0_4_;
  auVar212._4_4_ = fVar240 * auVar141._4_4_;
  auVar212._8_4_ = fVar241 * auVar141._8_4_;
  auVar212._12_4_ = fVar242 * auVar141._12_4_;
  auVar141 = vsubps_avx(auVar337,auVar131);
  auVar132._0_4_ = fVar225 * auVar141._0_4_;
  auVar132._4_4_ = fVar240 * auVar141._4_4_;
  auVar132._8_4_ = fVar241 * auVar141._8_4_;
  auVar132._12_4_ = fVar242 * auVar141._12_4_;
  auVar141 = vsubps_avx(auVar342,auVar102);
  auVar227._0_4_ = fVar244 * auVar141._0_4_;
  auVar227._4_4_ = fVar258 * auVar141._4_4_;
  auVar227._8_4_ = fVar260 * auVar141._8_4_;
  auVar227._12_4_ = fVar262 * auVar141._12_4_;
  auVar141 = vsubps_avx(auVar271,auVar102);
  auVar103._0_4_ = fVar244 * auVar141._0_4_;
  auVar103._4_4_ = fVar258 * auVar141._4_4_;
  auVar103._8_4_ = fVar260 * auVar141._8_4_;
  auVar103._12_4_ = fVar262 * auVar141._12_4_;
  auVar141 = vpminsd_avx(auVar295,auVar177);
  auVar111 = vpminsd_avx(auVar212,auVar132);
  auVar141 = vmaxps_avx(auVar141,auVar111);
  auVar111 = vpminsd_avx(auVar227,auVar103);
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar308._4_4_ = uVar7;
  auVar308._0_4_ = uVar7;
  auVar308._8_4_ = uVar7;
  auVar308._12_4_ = uVar7;
  auVar111 = vmaxps_avx(auVar111,auVar308);
  auVar141 = vmaxps_avx(auVar141,auVar111);
  local_450._0_4_ = auVar141._0_4_ * 0.99999964;
  local_450._4_4_ = auVar141._4_4_ * 0.99999964;
  local_450._8_4_ = auVar141._8_4_ * 0.99999964;
  local_450._12_4_ = auVar141._12_4_ * 0.99999964;
  auVar141 = vpmaxsd_avx(auVar295,auVar177);
  auVar111 = vpmaxsd_avx(auVar212,auVar132);
  auVar141 = vminps_avx(auVar141,auVar111);
  auVar111 = vpmaxsd_avx(auVar227,auVar103);
  fVar130 = ray->tfar;
  auVar178._4_4_ = fVar130;
  auVar178._0_4_ = fVar130;
  auVar178._8_4_ = fVar130;
  auVar178._12_4_ = fVar130;
  auVar111 = vminps_avx(auVar111,auVar178);
  auVar141 = vminps_avx(auVar141,auVar111);
  auVar104._0_4_ = auVar141._0_4_ * 1.0000004;
  auVar104._4_4_ = auVar141._4_4_ * 1.0000004;
  auVar104._8_4_ = auVar141._8_4_ * 1.0000004;
  auVar104._12_4_ = auVar141._12_4_ * 1.0000004;
  auVar141 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar111 = vpcmpgtd_avx(auVar141,_DAT_01ff0cf0);
  auVar141 = vcmpps_avx(local_450,auVar104,2);
  auVar141 = vandps_avx(auVar141,auVar111);
  uVar95 = vmovmskps_avx(auVar141);
  local_ad1 = uVar95 != 0;
  if (uVar95 == 0) {
    return local_ad1;
  }
  uVar95 = uVar95 & 0xff;
  auVar121._16_16_ = mm_lookupmask_ps._240_16_;
  auVar121._0_16_ = mm_lookupmask_ps._240_16_;
  local_3a0 = vblendps_avx(auVar121,ZEXT832(0) << 0x20,0x80);
  auVar304 = ZEXT464(0) << 0x20;
  local_690 = prim;
LAB_01069af2:
  local_688 = (ulong)uVar95;
  lVar100 = 0;
  if (local_688 != 0) {
    for (; (uVar95 >> lVar100 & 1) == 0; lVar100 = lVar100 + 1) {
    }
  }
  local_a48 = (ulong)*(uint *)(local_690 + 2);
  local_808 = (ulong)*(uint *)(local_690 + lVar100 * 4 + 6);
  pGVar13 = (context->scene->geometries).items[local_a48].ptr;
  uVar96 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           local_808 *
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar130 = (pGVar13->time_range).lower;
  fVar130 = pGVar13->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar130) / ((pGVar13->time_range).upper - fVar130));
  auVar141 = vroundss_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130),9);
  auVar141 = vminss_avx(auVar141,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
  auVar141 = vmaxss_avx(auVar304._0_16_,auVar141);
  fVar130 = fVar130 - auVar141._0_4_;
  _Var14 = pGVar13[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar98 = (long)(int)auVar141._0_4_ * 0x38;
  lVar100 = *(long *)(_Var14 + lVar98);
  lVar15 = *(long *)(_Var14 + 0x10 + lVar98);
  auVar141 = vshufps_avx(ZEXT416((uint)(1.0 - fVar130)),ZEXT416((uint)(1.0 - fVar130)),0);
  pfVar1 = (float *)(lVar100 + lVar15 * uVar96);
  fVar167 = auVar141._0_4_;
  fVar210 = auVar141._4_4_;
  fVar222 = auVar141._8_4_;
  fVar223 = auVar141._12_4_;
  pfVar2 = (float *)(lVar100 + lVar15 * (uVar96 + 1));
  pfVar3 = (float *)(lVar100 + lVar15 * (uVar96 + 2));
  pfVar4 = (float *)(lVar100 + lVar15 * (uVar96 + 3));
  lVar100 = *(long *)(_Var14 + 0x38 + lVar98);
  lVar15 = *(long *)(_Var14 + 0x48 + lVar98);
  auVar141 = vshufps_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130),0);
  pfVar5 = (float *)(lVar100 + uVar96 * lVar15);
  fVar224 = auVar141._0_4_;
  fVar225 = auVar141._4_4_;
  fVar240 = auVar141._8_4_;
  fVar241 = auVar141._12_4_;
  pfVar6 = (float *)(lVar100 + (uVar96 + 1) * lVar15);
  auVar296._0_4_ = fVar224 * *pfVar5 + fVar167 * *pfVar1;
  auVar296._4_4_ = fVar225 * pfVar5[1] + fVar210 * pfVar1[1];
  auVar296._8_4_ = fVar240 * pfVar5[2] + fVar222 * pfVar1[2];
  auVar296._12_4_ = fVar241 * pfVar5[3] + fVar223 * pfVar1[3];
  auVar213._0_4_ = fVar167 * *pfVar2 + fVar224 * *pfVar6;
  auVar213._4_4_ = fVar210 * pfVar2[1] + fVar225 * pfVar6[1];
  auVar213._8_4_ = fVar222 * pfVar2[2] + fVar240 * pfVar6[2];
  auVar213._12_4_ = fVar223 * pfVar2[3] + fVar241 * pfVar6[3];
  auVar105._0_4_ = (auVar296._0_4_ + auVar213._0_4_) * 0.5;
  auVar105._4_4_ = (auVar296._4_4_ + auVar213._4_4_) * 0.5;
  auVar105._8_4_ = (auVar296._8_4_ + auVar213._8_4_) * 0.5;
  auVar105._12_4_ = (auVar296._12_4_ + auVar213._12_4_) * 0.5;
  aVar9 = (ray->org).field_0.field_1;
  aVar10 = (ray->dir).field_0.field_1;
  auVar141 = vsubps_avx(auVar105,(undefined1  [16])aVar9);
  auVar141 = vdpps_avx(auVar141,(undefined1  [16])aVar10,0x7f);
  auVar111 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
  pfVar1 = (float *)(lVar100 + (uVar96 + 2) * lVar15);
  auVar179._0_4_ = fVar224 * *pfVar1 + fVar167 * *pfVar3;
  auVar179._4_4_ = fVar225 * pfVar1[1] + fVar210 * pfVar3[1];
  auVar179._8_4_ = fVar240 * pfVar1[2] + fVar222 * pfVar3[2];
  auVar179._12_4_ = fVar241 * pfVar1[3] + fVar223 * pfVar3[3];
  auVar185 = vrcpss_avx(auVar111,auVar111);
  auVar339 = ZEXT464(0x40000000);
  fVar130 = auVar185._0_4_ * (2.0 - auVar111._0_4_ * auVar185._0_4_) * auVar141._0_4_;
  local_6b0 = ZEXT416((uint)fVar130);
  auVar111 = vshufps_avx(local_6b0,ZEXT416((uint)fVar130),0);
  fVar130 = aVar10.x;
  fVar161 = aVar10.y;
  fVar163 = aVar10.z;
  aVar165 = aVar10.field_3;
  auVar272._0_4_ = fVar130 * auVar111._0_4_ + aVar9.x;
  auVar272._4_4_ = fVar161 * auVar111._4_4_ + aVar9.y;
  auVar272._8_4_ = fVar163 * auVar111._8_4_ + aVar9.z;
  auVar272._12_4_ = aVar165.w * auVar111._12_4_ + aVar9.field_3.w;
  auVar141 = vblendps_avx(auVar272,_DAT_01feba10,8);
  _local_920 = vsubps_avx(auVar296,auVar141);
  _local_930 = vsubps_avx(auVar179,auVar141);
  pfVar1 = (float *)(lVar100 + lVar15 * (uVar96 + 3));
  auVar180._0_4_ = fVar167 * *pfVar4 + fVar224 * *pfVar1;
  auVar180._4_4_ = fVar210 * pfVar4[1] + fVar225 * pfVar1[1];
  auVar180._8_4_ = fVar222 * pfVar4[2] + fVar240 * pfVar1[2];
  auVar180._12_4_ = fVar223 * pfVar4[3] + fVar241 * pfVar1[3];
  _local_940 = vsubps_avx(auVar213,auVar141);
  auVar239 = ZEXT1664(_local_940);
  _local_950 = vsubps_avx(auVar180,auVar141);
  auVar141 = vshufps_avx(_local_920,_local_920,0);
  register0x00001290 = auVar141;
  _local_280 = auVar141;
  auVar141 = vshufps_avx(_local_920,_local_920,0x55);
  register0x00001290 = auVar141;
  _local_1a0 = auVar141;
  auVar141 = vshufps_avx(_local_920,_local_920,0xaa);
  register0x00001290 = auVar141;
  _local_1c0 = auVar141;
  auVar141 = vshufps_avx(_local_920,_local_920,0xff);
  register0x00001290 = auVar141;
  _local_1e0 = auVar141;
  auVar141 = vshufps_avx(_local_940,_local_940,0);
  register0x00001290 = auVar141;
  _local_2a0 = auVar141;
  auVar141 = vshufps_avx(_local_940,_local_940,0x55);
  register0x00001290 = auVar141;
  _local_2c0 = auVar141;
  auVar141 = vshufps_avx(_local_940,_local_940,0xaa);
  register0x00001290 = auVar141;
  _local_2e0 = auVar141;
  auVar133._0_4_ = fVar130 * fVar130;
  auVar133._4_4_ = fVar161 * fVar161;
  auVar133._8_4_ = fVar163 * fVar163;
  auVar133._12_4_ = aVar165.w * aVar165.w;
  auVar141 = vshufps_avx(auVar133,auVar133,0xaa);
  auVar185 = vshufps_avx(auVar133,auVar133,0x55);
  auVar138 = vshufps_avx(_local_940,_local_940,0xff);
  register0x000012d0 = auVar138;
  _local_200 = auVar138;
  auVar138 = vshufps_avx(auVar133,auVar133,0);
  local_220._0_4_ = auVar138._0_4_ + auVar185._0_4_ + auVar141._0_4_;
  local_220._4_4_ = auVar138._4_4_ + auVar185._4_4_ + auVar141._4_4_;
  local_220._8_4_ = auVar138._8_4_ + auVar185._8_4_ + auVar141._8_4_;
  local_220._12_4_ = auVar138._12_4_ + auVar185._12_4_ + auVar141._12_4_;
  local_220._16_4_ = auVar138._0_4_ + auVar185._0_4_ + auVar141._0_4_;
  local_220._20_4_ = auVar138._4_4_ + auVar185._4_4_ + auVar141._4_4_;
  local_220._24_4_ = auVar138._8_4_ + auVar185._8_4_ + auVar141._8_4_;
  local_220._28_4_ = auVar138._12_4_ + auVar185._12_4_ + auVar141._12_4_;
  auVar141 = vshufps_avx(_local_930,_local_930,0);
  register0x00001550 = auVar141;
  _local_a20 = auVar141;
  auVar374 = ZEXT3264(_local_a20);
  auVar141 = vshufps_avx(_local_930,_local_930,0x55);
  register0x00001250 = auVar141;
  _local_300 = auVar141;
  auVar141 = vshufps_avx(_local_930,_local_930,0xaa);
  register0x00001250 = auVar141;
  _local_320 = auVar141;
  auVar141 = vshufps_avx(_local_930,_local_930,0xff);
  register0x00001250 = auVar141;
  _local_340 = auVar141;
  auVar141 = vshufps_avx(_local_950,_local_950,0);
  register0x000014d0 = auVar141;
  _local_8a0 = auVar141;
  auVar346 = ZEXT3264(_local_8a0);
  auVar141 = vshufps_avx(_local_950,_local_950,0x55);
  register0x00001410 = auVar141;
  _local_780 = auVar141;
  auVar312 = ZEXT3264(_local_780);
  auVar141 = vshufps_avx(_local_950,_local_950,0xaa);
  register0x00001250 = auVar141;
  _local_360 = auVar141;
  auVar141 = vshufps_avx(_local_950,_local_950,0xff);
  register0x00001250 = auVar141;
  _local_240 = auVar141;
  register0x00001210 = auVar111;
  _local_700 = auVar111;
  local_540 = 1;
  uVar96 = 0;
  bVar99 = 0;
  local_380 = (ray->dir).field_0.m128[0];
  fStack_37c = local_380;
  fStack_378 = local_380;
  fStack_374 = local_380;
  fStack_370 = local_380;
  fStack_36c = local_380;
  fStack_368 = local_380;
  fStack_364 = local_380;
  local_640 = (ray->dir).field_0.m128[1];
  local_660 = (ray->dir).field_0.m128[2];
  auVar116._8_4_ = 0x7fffffff;
  auVar116._0_8_ = 0x7fffffff7fffffff;
  auVar116._12_4_ = 0x7fffffff;
  auVar116._16_4_ = 0x7fffffff;
  auVar116._20_4_ = 0x7fffffff;
  auVar116._24_4_ = 0x7fffffff;
  auVar116._28_4_ = 0x7fffffff;
  local_3c0 = vandps_avx(local_220,auVar116);
  local_6a0 = ZEXT816(0x3f80000000000000);
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  fStack_63c = local_640;
  fStack_638 = local_640;
  fStack_634 = local_640;
  fStack_630 = local_640;
  fStack_62c = local_640;
  fStack_628 = local_640;
  fStack_624 = local_640;
  do {
    auVar141 = vmovshdup_avx(local_6a0);
    fVar225 = auVar141._0_4_ - local_6a0._0_4_;
    auVar141 = vshufps_avx(local_6a0,local_6a0,0);
    register0x00001210 = auVar141;
    _local_880 = auVar141;
    auVar111 = vshufps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),0);
    register0x00001250 = auVar111;
    _local_7e0 = auVar111;
    fVar129 = auVar111._0_4_;
    fVar160 = auVar111._4_4_;
    fVar162 = auVar111._8_4_;
    fVar166 = auVar111._12_4_;
    fVar371 = auVar141._0_4_;
    auVar218._0_4_ = fVar371 + fVar129 * 0.0;
    fVar379 = auVar141._4_4_;
    auVar218._4_4_ = fVar379 + fVar160 * 0.14285715;
    fVar384 = auVar141._8_4_;
    auVar218._8_4_ = fVar384 + fVar162 * 0.2857143;
    fStack_8c4 = auVar141._12_4_;
    auVar218._12_4_ = fStack_8c4 + fVar166 * 0.42857146;
    auVar218._16_4_ = fVar371 + fVar129 * 0.5714286;
    auVar218._20_4_ = fVar379 + fVar160 * 0.71428573;
    auVar218._24_4_ = fVar384 + fVar162 * 0.8571429;
    auVar218._28_4_ = fStack_8c4 + fVar166;
    auVar144._8_4_ = 0x3f800000;
    auVar144._0_8_ = &DAT_3f8000003f800000;
    auVar144._12_4_ = 0x3f800000;
    auVar144._16_4_ = 0x3f800000;
    auVar144._20_4_ = 0x3f800000;
    auVar144._24_4_ = 0x3f800000;
    auVar144._28_4_ = 0x3f800000;
    auVar121 = vsubps_avx(auVar144,auVar218);
    local_8e0._4_4_ = auVar218._4_4_ * auVar218._4_4_;
    local_8e0._0_4_ = auVar218._0_4_ * auVar218._0_4_;
    fStack_8d8 = auVar218._8_4_ * auVar218._8_4_;
    fStack_8d4 = auVar218._12_4_ * auVar218._12_4_;
    fStack_8d0 = auVar218._16_4_ * auVar218._16_4_;
    fStack_8cc = auVar218._20_4_ * auVar218._20_4_;
    fStack_8c8 = auVar218._24_4_ * auVar218._24_4_;
    fVar241 = auVar218._0_4_ * 3.0;
    fVar242 = auVar218._4_4_ * 3.0;
    fVar244 = auVar218._8_4_ * 3.0;
    fVar258 = auVar218._12_4_ * 3.0;
    fVar260 = auVar218._16_4_ * 3.0;
    fVar262 = auVar218._20_4_ * 3.0;
    fVar243 = auVar218._24_4_ * 3.0;
    fVar161 = auVar121._0_4_;
    auVar304._0_4_ = fVar161 * fVar161;
    fVar163 = auVar121._4_4_;
    auVar304._4_4_ = fVar163 * fVar163;
    fVar167 = auVar121._8_4_;
    auVar304._8_4_ = fVar167 * fVar167;
    fVar210 = auVar121._12_4_;
    auVar304._12_4_ = fVar210 * fVar210;
    fVar222 = auVar121._16_4_;
    auVar304._16_4_ = fVar222 * fVar222;
    fVar223 = auVar121._20_4_;
    auVar304._20_4_ = fVar223 * fVar223;
    fVar224 = auVar121._24_4_;
    auVar304._28_36_ = auVar312._28_36_;
    auVar304._24_4_ = fVar224 * fVar224;
    fVar240 = auVar121._28_4_;
    fVar268 = (auVar304._0_4_ * (fVar161 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar280 = (auVar304._4_4_ * (fVar163 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar281 = (auVar304._8_4_ * (fVar167 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar283 = (auVar304._12_4_ * (fVar210 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar285 = (auVar304._16_4_ * (fVar222 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar287 = (auVar304._20_4_ * (fVar223 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar289 = (auVar304._24_4_ * (fVar224 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar325 = -fVar161 * auVar218._0_4_ * auVar218._0_4_ * 0.5;
    fVar328 = -fVar163 * auVar218._4_4_ * auVar218._4_4_ * 0.5;
    fVar329 = -fVar167 * auVar218._8_4_ * auVar218._8_4_ * 0.5;
    fVar330 = -fVar210 * auVar218._12_4_ * auVar218._12_4_ * 0.5;
    fVar331 = -fVar222 * auVar218._16_4_ * auVar218._16_4_ * 0.5;
    fVar333 = -fVar223 * auVar218._20_4_ * auVar218._20_4_ * 0.5;
    fVar335 = -fVar224 * auVar218._24_4_ * auVar218._24_4_ * 0.5;
    fVar130 = auVar374._28_4_;
    fVar341 = auVar339._28_4_ + fVar130;
    fVar347 = auVar346._28_4_ + fVar130;
    fVar369 = (auVar218._0_4_ * auVar218._0_4_ * (fVar241 + -5.0) + 2.0) * 0.5;
    fVar375 = (auVar218._4_4_ * auVar218._4_4_ * (fVar242 + -5.0) + 2.0) * 0.5;
    fVar377 = (auVar218._8_4_ * auVar218._8_4_ * (fVar244 + -5.0) + 2.0) * 0.5;
    fVar380 = (auVar218._12_4_ * auVar218._12_4_ * (fVar258 + -5.0) + 2.0) * 0.5;
    fVar382 = (auVar218._16_4_ * auVar218._16_4_ * (fVar260 + -5.0) + 2.0) * 0.5;
    fVar385 = (auVar218._20_4_ * auVar218._20_4_ * (fVar262 + -5.0) + 2.0) * 0.5;
    fVar387 = (auVar218._24_4_ * auVar218._24_4_ * (fVar243 + -5.0) + 2.0) * 0.5;
    fStack_844 = -fVar240 + fVar341;
    fVar368 = -auVar218._28_4_;
    fVar348 = -auVar218._0_4_ * fVar161 * fVar161 * 0.5;
    fVar356 = -auVar218._4_4_ * fVar163 * fVar163 * 0.5;
    fVar358 = -auVar218._8_4_ * fVar167 * fVar167 * 0.5;
    fVar360 = -auVar218._12_4_ * fVar210 * fVar210 * 0.5;
    fVar362 = -auVar218._16_4_ * fVar222 * fVar222 * 0.5;
    fVar364 = -auVar218._20_4_ * fVar223 * fVar223 * 0.5;
    fVar366 = -auVar218._24_4_ * fVar224 * fVar224 * 0.5;
    local_aa0 = fVar348 * (float)local_280._0_4_ +
                fVar369 * (float)local_2a0._0_4_ +
                auVar346._0_4_ * fVar325 + auVar374._0_4_ * fVar268;
    fStack_a9c = fVar356 * (float)local_280._4_4_ +
                 fVar375 * (float)local_2a0._4_4_ +
                 auVar346._4_4_ * fVar328 + auVar374._4_4_ * fVar280;
    fStack_a98 = fVar358 * fStack_278 +
                 fVar377 * fStack_298 + auVar346._8_4_ * fVar329 + auVar374._8_4_ * fVar281;
    fStack_a94 = fVar360 * fStack_274 +
                 fVar380 * fStack_294 + auVar346._12_4_ * fVar330 + auVar374._12_4_ * fVar283;
    fStack_a90 = fVar362 * fStack_270 +
                 fVar382 * fStack_290 + auVar346._16_4_ * fVar331 + auVar374._16_4_ * fVar285;
    fStack_a8c = fVar364 * fStack_26c +
                 fVar385 * fStack_28c + auVar346._20_4_ * fVar333 + auVar374._20_4_ * fVar287;
    fStack_a88 = fVar366 * fStack_268 +
                 fVar387 * fStack_288 + auVar346._24_4_ * fVar335 + auVar374._24_4_ * fVar289;
    fStack_a84 = fVar130 + 2.0 + fStack_844;
    fVar172 = (float)local_1a0._0_4_ * fVar348 +
              fVar369 * (float)local_2c0._0_4_ +
              auVar312._0_4_ * fVar325 + fVar268 * (float)local_300._0_4_;
    fVar198 = (float)local_1a0._4_4_ * fVar356 +
              fVar375 * (float)local_2c0._4_4_ +
              auVar312._4_4_ * fVar328 + fVar280 * (float)local_300._4_4_;
    fVar201 = fStack_198 * fVar358 +
              fVar377 * fStack_2b8 + auVar312._8_4_ * fVar329 + fVar281 * fStack_2f8;
    fVar204 = fStack_194 * fVar360 +
              fVar380 * fStack_2b4 + auVar312._12_4_ * fVar330 + fVar283 * fStack_2f4;
    fStack_ab0 = fStack_190 * fVar362 +
                 fVar382 * fStack_2b0 + auVar312._16_4_ * fVar331 + fVar285 * fStack_2f0;
    fStack_aac = fStack_18c * fVar364 +
                 fVar385 * fStack_2ac + auVar312._20_4_ * fVar333 + fVar287 * fStack_2ec;
    fStack_aa8 = fStack_188 * fVar366 +
                 fVar387 * fStack_2a8 + auVar312._24_4_ * fVar335 + fVar289 * fStack_2e8;
    fStack_aa4 = fStack_844 + fVar341 + fVar347;
    fVar173 = (float)local_1c0._0_4_ * fVar348 +
              fVar369 * (float)local_2e0._0_4_ +
              fVar325 * (float)local_360._0_4_ + fVar268 * (float)local_320._0_4_;
    fVar199 = (float)local_1c0._4_4_ * fVar356 +
              fVar375 * (float)local_2e0._4_4_ +
              fVar328 * (float)local_360._4_4_ + fVar280 * (float)local_320._4_4_;
    fVar202 = fStack_1b8 * fVar358 +
              fVar377 * fStack_2d8 + fVar329 * fStack_358 + fVar281 * fStack_318;
    fVar205 = fStack_1b4 * fVar360 +
              fVar380 * fStack_2d4 + fVar330 * fStack_354 + fVar283 * fStack_314;
    fStack_a70 = fStack_1b0 * fVar362 +
                 fVar382 * fStack_2d0 + fVar331 * fStack_350 + fVar285 * fStack_310;
    fStack_a6c = fStack_1ac * fVar364 +
                 fVar385 * fStack_2cc + fVar333 * fStack_34c + fVar287 * fStack_30c;
    fStack_a68 = fStack_1a8 * fVar366 +
                 fVar387 * fStack_2c8 + fVar335 * fStack_348 + fVar289 * fStack_308;
    fStack_a64 = fStack_844 + fVar347 + auVar312._28_4_ + fVar130;
    local_860._0_4_ =
         (float)local_1e0._0_4_ * fVar348 +
         (float)local_200._0_4_ * fVar369 +
         fVar325 * (float)local_240._0_4_ + fVar268 * (float)local_340._0_4_;
    local_860._4_4_ =
         (float)local_1e0._4_4_ * fVar356 +
         (float)local_200._4_4_ * fVar375 +
         fVar328 * (float)local_240._4_4_ + fVar280 * (float)local_340._4_4_;
    fStack_858 = fStack_1d8 * fVar358 +
                 fStack_1f8 * fVar377 + fVar329 * fStack_238 + fVar281 * fStack_338;
    fStack_854 = fStack_1d4 * fVar360 +
                 fStack_1f4 * fVar380 + fVar330 * fStack_234 + fVar283 * fStack_334;
    fStack_850 = fStack_1d0 * fVar362 +
                 fStack_1f0 * fVar382 + fVar331 * fStack_230 + fVar285 * fStack_330;
    fStack_84c = fStack_1cc * fVar364 +
                 fStack_1ec * fVar385 + fVar333 * fStack_22c + fVar287 * fStack_32c;
    fStack_848 = fStack_1c8 * fVar366 +
                 fStack_1e8 * fVar387 + fVar335 * fStack_228 + fVar289 * fStack_328;
    fStack_844 = fStack_844 + fVar130 + 2.0 + -fVar240 + -3.0;
    fVar360 = auVar218._28_4_ + auVar218._28_4_;
    auVar28._4_4_ = (fVar163 + fVar163) * auVar218._4_4_;
    auVar28._0_4_ = (fVar161 + fVar161) * auVar218._0_4_;
    auVar28._8_4_ = (fVar167 + fVar167) * auVar218._8_4_;
    auVar28._12_4_ = (fVar210 + fVar210) * auVar218._12_4_;
    auVar28._16_4_ = (fVar222 + fVar222) * auVar218._16_4_;
    auVar28._20_4_ = (fVar223 + fVar223) * auVar218._20_4_;
    auVar28._24_4_ = (fVar224 + fVar224) * auVar218._24_4_;
    auVar28._28_4_ = fVar360;
    auVar121 = vsubps_avx(auVar28,auVar304._0_32_);
    fVar283 = auVar239._28_4_ + 2.0;
    auVar25._4_4_ = (fVar163 + fVar163) * (fVar242 + 2.0);
    auVar25._0_4_ = (fVar161 + fVar161) * (fVar241 + 2.0);
    auVar25._8_4_ = (fVar167 + fVar167) * (fVar244 + 2.0);
    auVar25._12_4_ = (fVar210 + fVar210) * (fVar258 + 2.0);
    auVar25._16_4_ = (fVar222 + fVar222) * (fVar260 + 2.0);
    auVar25._20_4_ = (fVar223 + fVar223) * (fVar262 + 2.0);
    auVar25._24_4_ = (fVar224 + fVar224) * (fVar243 + 2.0);
    auVar25._28_4_ = fVar283;
    auVar26._4_4_ = fVar163 * fVar163 * 3.0;
    auVar26._0_4_ = fVar161 * fVar161 * 3.0;
    auVar26._8_4_ = fVar167 * fVar167 * 3.0;
    auVar26._12_4_ = fVar210 * fVar210 * 3.0;
    auVar26._16_4_ = fVar222 * fVar222 * 3.0;
    auVar26._20_4_ = fVar223 * fVar223 * 3.0;
    auVar26._24_4_ = fVar224 * fVar224 * 3.0;
    auVar26._28_4_ = fVar240;
    auVar116 = vsubps_avx(auVar25,auVar26);
    auVar28 = vsubps_avx(_local_8e0,auVar28);
    fVar331 = auVar121._0_4_ * 0.5;
    fVar333 = auVar121._4_4_ * 0.5;
    fVar335 = auVar121._8_4_ * 0.5;
    fVar341 = auVar121._12_4_ * 0.5;
    fVar347 = auVar121._16_4_ * 0.5;
    fVar348 = auVar121._20_4_ * 0.5;
    fVar356 = auVar121._24_4_ * 0.5;
    fVar285 = (auVar218._0_4_ * fVar241 + (auVar218._0_4_ + auVar218._0_4_) * (fVar241 + -5.0)) *
              0.5;
    fVar287 = (auVar218._4_4_ * fVar242 + (auVar218._4_4_ + auVar218._4_4_) * (fVar242 + -5.0)) *
              0.5;
    fVar289 = (auVar218._8_4_ * fVar244 + (auVar218._8_4_ + auVar218._8_4_) * (fVar244 + -5.0)) *
              0.5;
    fVar325 = (auVar218._12_4_ * fVar258 + (auVar218._12_4_ + auVar218._12_4_) * (fVar258 + -5.0)) *
              0.5;
    fVar328 = (auVar218._16_4_ * fVar260 + (auVar218._16_4_ + auVar218._16_4_) * (fVar260 + -5.0)) *
              0.5;
    fVar329 = (auVar218._20_4_ * fVar262 + (auVar218._20_4_ + auVar218._20_4_) * (fVar262 + -5.0)) *
              0.5;
    fVar330 = (auVar218._24_4_ * fVar243 + (auVar218._24_4_ + auVar218._24_4_) * (fVar243 + -5.0)) *
              0.5;
    fVar130 = auVar116._0_4_ * 0.5;
    fVar161 = auVar116._4_4_ * 0.5;
    fVar163 = auVar116._8_4_ * 0.5;
    fVar167 = auVar116._12_4_ * 0.5;
    fVar223 = auVar116._16_4_ * 0.5;
    fVar224 = auVar116._20_4_ * 0.5;
    fVar242 = auVar116._24_4_ * 0.5;
    fVar210 = auVar28._0_4_ * 0.5;
    fVar222 = auVar28._4_4_ * 0.5;
    fVar244 = auVar28._8_4_ * 0.5;
    fVar258 = auVar28._12_4_ * 0.5;
    fVar243 = auVar28._16_4_ * 0.5;
    fVar268 = auVar28._20_4_ * 0.5;
    fVar280 = auVar28._24_4_ * 0.5;
    fVar283 = fVar283 + auVar218._28_4_ + auVar239._28_4_ + -5.0 + auVar116._28_4_ + auVar28._28_4_;
    auVar141 = vpermilps_avx(ZEXT416((uint)(fVar225 * 0.04761905)),0);
    fVar260 = auVar141._0_4_;
    auVar117._0_4_ =
         fVar260 * (fVar331 * (float)local_280._0_4_ +
                   fVar285 * (float)local_2a0._0_4_ +
                   fVar130 * (float)local_a20._0_4_ + fVar210 * (float)local_8a0._0_4_);
    fVar262 = auVar141._4_4_;
    auVar117._4_4_ =
         fVar262 * (fVar333 * (float)local_280._4_4_ +
                   fVar287 * (float)local_2a0._4_4_ +
                   fVar161 * (float)local_a20._4_4_ + fVar222 * (float)local_8a0._4_4_);
    fVar281 = auVar141._8_4_;
    auVar117._8_4_ =
         fVar281 * (fVar335 * fStack_278 +
                   fVar289 * fStack_298 + fVar163 * fStack_a18 + fVar244 * fStack_898);
    fVar241 = auVar141._12_4_;
    auVar117._12_4_ =
         fVar241 * (fVar341 * fStack_274 +
                   fVar325 * fStack_294 + fVar167 * fStack_a14 + fVar258 * fStack_894);
    auVar117._16_4_ =
         fVar260 * (fVar347 * fStack_270 +
                   fVar328 * fStack_290 + fVar223 * fStack_a10 + fVar243 * fStack_890);
    auVar117._20_4_ =
         fVar262 * (fVar348 * fStack_26c +
                   fVar329 * fStack_28c + fVar224 * fStack_a0c + fVar268 * fStack_88c);
    auVar117._24_4_ =
         fVar281 * (fVar356 * fStack_268 +
                   fVar330 * fStack_288 + fVar242 * fStack_a08 + fVar280 * fStack_888);
    auVar117._28_4_ = 0;
    fVar305 = fVar260 * ((float)local_1a0._0_4_ * fVar331 +
                        fVar285 * (float)local_2c0._0_4_ +
                        fVar130 * (float)local_300._0_4_ + fVar210 * (float)local_780._0_4_);
    fVar313 = fVar262 * ((float)local_1a0._4_4_ * fVar333 +
                        fVar287 * (float)local_2c0._4_4_ +
                        fVar161 * (float)local_300._4_4_ + fVar222 * (float)local_780._4_4_);
    auVar34._4_4_ = fVar313;
    auVar34._0_4_ = fVar305;
    fVar315 = fVar281 * (fStack_198 * fVar335 +
                        fVar289 * fStack_2b8 + fVar163 * fStack_2f8 + fVar244 * fStack_778);
    auVar34._8_4_ = fVar315;
    fVar317 = fVar241 * (fStack_194 * fVar341 +
                        fVar325 * fStack_2b4 + fVar167 * fStack_2f4 + fVar258 * fStack_774);
    auVar34._12_4_ = fVar317;
    fVar319 = fVar260 * (fStack_190 * fVar347 +
                        fVar328 * fStack_2b0 + fVar223 * fStack_2f0 + fVar243 * fStack_770);
    auVar34._16_4_ = fVar319;
    fVar321 = fVar262 * (fStack_18c * fVar348 +
                        fVar329 * fStack_2ac + fVar224 * fStack_2ec + fVar268 * fStack_76c);
    auVar34._20_4_ = fVar321;
    fVar323 = fVar281 * (fStack_188 * fVar356 +
                        fVar330 * fStack_2a8 + fVar242 * fStack_2e8 + fVar280 * fStack_768);
    auVar34._24_4_ = fVar323;
    auVar34._28_4_ = fVar240 + fVar240 + auVar121._28_4_;
    fVar349 = fVar260 * ((float)local_1c0._0_4_ * fVar331 +
                        fVar130 * (float)local_320._0_4_ + fVar210 * (float)local_360._0_4_ +
                        fVar285 * (float)local_2e0._0_4_);
    fVar357 = fVar262 * ((float)local_1c0._4_4_ * fVar333 +
                        fVar161 * (float)local_320._4_4_ + fVar222 * (float)local_360._4_4_ +
                        fVar287 * (float)local_2e0._4_4_);
    local_9a0._4_4_ = fVar357;
    local_9a0._0_4_ = fVar349;
    fVar359 = fVar281 * (fStack_1b8 * fVar335 +
                        fVar163 * fStack_318 + fVar244 * fStack_358 + fVar289 * fStack_2d8);
    local_9a0._8_4_ = fVar359;
    fVar361 = fVar241 * (fStack_1b4 * fVar341 +
                        fVar167 * fStack_314 + fVar258 * fStack_354 + fVar325 * fStack_2d4);
    local_9a0._12_4_ = fVar361;
    fVar363 = fVar260 * (fStack_1b0 * fVar347 +
                        fVar223 * fStack_310 + fVar243 * fStack_350 + fVar328 * fStack_2d0);
    local_9a0._16_4_ = fVar363;
    fVar365 = fVar262 * (fStack_1ac * fVar348 +
                        fVar224 * fStack_30c + fVar268 * fStack_34c + fVar329 * fStack_2cc);
    local_9a0._20_4_ = fVar365;
    fVar367 = fVar281 * (fStack_1a8 * fVar356 +
                        fVar242 * fStack_308 + fVar280 * fStack_348 + fVar330 * fStack_2c8);
    local_9a0._24_4_ = fVar367;
    local_9a0._28_4_ = fVar368;
    fVar210 = fVar260 * ((float)local_1e0._0_4_ * fVar331 +
                        (float)local_200._0_4_ * fVar285 +
                        fVar130 * (float)local_340._0_4_ + (float)local_240._0_4_ * fVar210);
    fVar222 = fVar262 * ((float)local_1e0._4_4_ * fVar333 +
                        (float)local_200._4_4_ * fVar287 +
                        fVar161 * (float)local_340._4_4_ + (float)local_240._4_4_ * fVar222);
    auVar29._4_4_ = fVar222;
    auVar29._0_4_ = fVar210;
    fVar240 = fVar281 * (fStack_1d8 * fVar335 +
                        fStack_1f8 * fVar289 + fVar163 * fStack_338 + fStack_238 * fVar244);
    auVar29._8_4_ = fVar240;
    fVar241 = fVar241 * (fStack_1d4 * fVar341 +
                        fStack_1f4 * fVar325 + fVar167 * fStack_334 + fStack_234 * fVar258);
    auVar29._12_4_ = fVar241;
    fVar260 = fVar260 * (fStack_1d0 * fVar347 +
                        fStack_1f0 * fVar328 + fVar223 * fStack_330 + fStack_230 * fVar243);
    auVar29._16_4_ = fVar260;
    fVar262 = fVar262 * (fStack_1cc * fVar348 +
                        fStack_1ec * fVar329 + fVar224 * fStack_32c + fStack_22c * fVar268);
    auVar29._20_4_ = fVar262;
    fVar281 = fVar281 * (fStack_1c8 * fVar356 +
                        fStack_1e8 * fVar330 + fVar242 * fStack_328 + fStack_228 * fVar280);
    auVar29._24_4_ = fVar281;
    auVar29._28_4_ = fVar283;
    auVar84._4_4_ = fVar198;
    auVar84._0_4_ = fVar172;
    auVar84._8_4_ = fVar201;
    auVar84._12_4_ = fVar204;
    auVar84._16_4_ = fStack_ab0;
    auVar84._20_4_ = fStack_aac;
    auVar84._24_4_ = fStack_aa8;
    auVar84._28_4_ = fStack_aa4;
    auVar121 = vperm2f128_avx(auVar84,auVar84,1);
    auVar121 = vshufps_avx(auVar121,auVar84,0x30);
    auVar25 = vshufps_avx(auVar84,auVar121,0x29);
    auVar90._4_4_ = fVar199;
    auVar90._0_4_ = fVar173;
    auVar90._8_4_ = fVar202;
    auVar90._12_4_ = fVar205;
    auVar90._16_4_ = fStack_a70;
    auVar90._20_4_ = fStack_a6c;
    auVar90._24_4_ = fStack_a68;
    auVar90._28_4_ = fStack_a64;
    auVar121 = vperm2f128_avx(auVar90,auVar90,1);
    auVar121 = vshufps_avx(auVar121,auVar90,0x30);
    auVar26 = vshufps_avx(auVar90,auVar121,0x29);
    auVar116 = vsubps_avx(_local_860,auVar29);
    auVar121 = vperm2f128_avx(auVar116,auVar116,1);
    auVar121 = vshufps_avx(auVar121,auVar116,0x30);
    _local_800 = vshufps_avx(auVar116,auVar121,0x29);
    auVar29 = vsubps_avx(auVar25,auVar84);
    auVar300 = vsubps_avx(auVar26,auVar90);
    fVar161 = auVar29._0_4_;
    fVar223 = auVar29._4_4_;
    auVar30._4_4_ = fVar357 * fVar223;
    auVar30._0_4_ = fVar349 * fVar161;
    fVar242 = auVar29._8_4_;
    auVar30._8_4_ = fVar359 * fVar242;
    fVar243 = auVar29._12_4_;
    auVar30._12_4_ = fVar361 * fVar243;
    fVar285 = auVar29._16_4_;
    auVar30._16_4_ = fVar363 * fVar285;
    fVar329 = auVar29._20_4_;
    auVar30._20_4_ = fVar365 * fVar329;
    fVar341 = auVar29._24_4_;
    auVar30._24_4_ = fVar367 * fVar341;
    auVar30._28_4_ = auVar116._28_4_;
    fVar163 = auVar300._0_4_;
    fVar224 = auVar300._4_4_;
    auVar31._4_4_ = fVar313 * fVar224;
    auVar31._0_4_ = fVar305 * fVar163;
    fVar244 = auVar300._8_4_;
    auVar31._8_4_ = fVar315 * fVar244;
    fVar268 = auVar300._12_4_;
    auVar31._12_4_ = fVar317 * fVar268;
    fVar287 = auVar300._16_4_;
    auVar31._16_4_ = fVar319 * fVar287;
    fVar330 = auVar300._20_4_;
    auVar31._20_4_ = fVar321 * fVar330;
    fVar347 = auVar300._24_4_;
    auVar31._24_4_ = fVar323 * fVar347;
    auVar31._28_4_ = auVar121._28_4_;
    auVar28 = vsubps_avx(auVar31,auVar30);
    auVar88._4_4_ = fStack_a9c;
    auVar88._0_4_ = local_aa0;
    auVar88._8_4_ = fStack_a98;
    auVar88._12_4_ = fStack_a94;
    auVar88._16_4_ = fStack_a90;
    auVar88._20_4_ = fStack_a8c;
    auVar88._24_4_ = fStack_a88;
    auVar88._28_4_ = fStack_a84;
    auVar121 = vperm2f128_avx(auVar88,auVar88,1);
    auVar121 = vshufps_avx(auVar121,auVar88,0x30);
    local_9c0 = vshufps_avx(auVar88,auVar121,0x29);
    auVar121 = vsubps_avx(local_9c0,auVar88);
    auVar32._4_4_ = auVar117._4_4_ * fVar224;
    auVar32._0_4_ = auVar117._0_4_ * fVar163;
    auVar32._8_4_ = auVar117._8_4_ * fVar244;
    auVar32._12_4_ = auVar117._12_4_ * fVar268;
    auVar32._16_4_ = auVar117._16_4_ * fVar287;
    auVar32._20_4_ = auVar117._20_4_ * fVar330;
    auVar32._24_4_ = auVar117._24_4_ * fVar347;
    auVar32._28_4_ = local_9c0._28_4_;
    fVar167 = auVar121._0_4_;
    fVar225 = auVar121._4_4_;
    auVar33._4_4_ = fVar357 * fVar225;
    auVar33._0_4_ = fVar349 * fVar167;
    fVar258 = auVar121._8_4_;
    auVar33._8_4_ = fVar359 * fVar258;
    fVar280 = auVar121._12_4_;
    auVar33._12_4_ = fVar361 * fVar280;
    fVar289 = auVar121._16_4_;
    auVar33._16_4_ = fVar363 * fVar289;
    fVar331 = auVar121._20_4_;
    auVar33._20_4_ = fVar365 * fVar331;
    fVar348 = auVar121._24_4_;
    auVar33._24_4_ = fVar367 * fVar348;
    auVar33._28_4_ = fStack_a84;
    auVar30 = vsubps_avx(auVar33,auVar32);
    auVar299._4_4_ = fVar313 * fVar225;
    auVar299._0_4_ = fVar305 * fVar167;
    auVar299._8_4_ = fVar315 * fVar258;
    auVar299._12_4_ = fVar317 * fVar280;
    auVar299._16_4_ = fVar319 * fVar289;
    auVar299._20_4_ = fVar321 * fVar331;
    auVar299._24_4_ = fVar323 * fVar348;
    auVar299._28_4_ = fStack_a84;
    auVar27._4_4_ = auVar117._4_4_ * fVar223;
    auVar27._0_4_ = auVar117._0_4_ * fVar161;
    auVar27._8_4_ = auVar117._8_4_ * fVar242;
    auVar27._12_4_ = auVar117._12_4_ * fVar243;
    auVar27._16_4_ = auVar117._16_4_ * fVar285;
    auVar27._20_4_ = auVar117._20_4_ * fVar329;
    auVar27._24_4_ = auVar117._24_4_ * fVar341;
    auVar27._28_4_ = fVar360;
    auVar31 = vsubps_avx(auVar27,auVar299);
    fVar130 = auVar31._28_4_;
    fVar325 = auVar30._28_4_ + fVar130;
    auVar219._0_4_ = fVar167 * fVar167 + fVar161 * fVar161 + fVar163 * fVar163;
    auVar219._4_4_ = fVar225 * fVar225 + fVar223 * fVar223 + fVar224 * fVar224;
    auVar219._8_4_ = fVar258 * fVar258 + fVar242 * fVar242 + fVar244 * fVar244;
    auVar219._12_4_ = fVar280 * fVar280 + fVar243 * fVar243 + fVar268 * fVar268;
    auVar219._16_4_ = fVar289 * fVar289 + fVar285 * fVar285 + fVar287 * fVar287;
    auVar219._20_4_ = fVar331 * fVar331 + fVar329 * fVar329 + fVar330 * fVar330;
    auVar219._24_4_ = fVar348 * fVar348 + fVar341 * fVar341 + fVar347 * fVar347;
    auVar219._28_4_ = fVar130 + fVar130 + fVar325;
    auVar121 = vrcpps_avx(auVar219);
    fVar328 = auVar121._0_4_;
    fVar333 = auVar121._4_4_;
    auVar35._4_4_ = fVar333 * auVar219._4_4_;
    auVar35._0_4_ = fVar328 * auVar219._0_4_;
    fVar335 = auVar121._8_4_;
    auVar35._8_4_ = fVar335 * auVar219._8_4_;
    fVar356 = auVar121._12_4_;
    auVar35._12_4_ = fVar356 * auVar219._12_4_;
    fVar358 = auVar121._16_4_;
    auVar35._16_4_ = fVar358 * auVar219._16_4_;
    fVar362 = auVar121._20_4_;
    auVar35._20_4_ = fVar362 * auVar219._20_4_;
    fVar366 = auVar121._24_4_;
    auVar35._24_4_ = fVar366 * auVar219._24_4_;
    auVar35._28_4_ = fVar360;
    auVar344._8_4_ = 0x3f800000;
    auVar344._0_8_ = &DAT_3f8000003f800000;
    auVar344._12_4_ = 0x3f800000;
    auVar344._16_4_ = 0x3f800000;
    auVar344._20_4_ = 0x3f800000;
    auVar344._24_4_ = 0x3f800000;
    auVar344._28_4_ = 0x3f800000;
    auVar32 = vsubps_avx(auVar344,auVar35);
    fVar328 = auVar32._0_4_ * fVar328 + fVar328;
    fVar333 = auVar32._4_4_ * fVar333 + fVar333;
    fVar335 = auVar32._8_4_ * fVar335 + fVar335;
    fVar356 = auVar32._12_4_ * fVar356 + fVar356;
    fVar358 = auVar32._16_4_ * fVar358 + fVar358;
    fVar362 = auVar32._20_4_ * fVar362 + fVar362;
    fVar366 = auVar32._24_4_ * fVar366 + fVar366;
    auVar116 = vperm2f128_avx(auVar34,auVar34,1);
    auVar116 = vshufps_avx(auVar116,auVar34,0x30);
    local_9e0 = vshufps_avx(auVar34,auVar116,0x29);
    auVar116 = vperm2f128_avx(local_9a0,local_9a0,1);
    auVar116 = vshufps_avx(auVar116,local_9a0,0x30);
    local_7a0 = vshufps_avx(local_9a0,auVar116,0x29);
    fVar370 = local_7a0._0_4_;
    fVar376 = local_7a0._4_4_;
    auVar36._4_4_ = fVar376 * fVar223;
    auVar36._0_4_ = fVar370 * fVar161;
    fVar378 = local_7a0._8_4_;
    auVar36._8_4_ = fVar378 * fVar242;
    fVar381 = local_7a0._12_4_;
    auVar36._12_4_ = fVar381 * fVar243;
    fVar383 = local_7a0._16_4_;
    auVar36._16_4_ = fVar383 * fVar285;
    fVar386 = local_7a0._20_4_;
    auVar36._20_4_ = fVar386 * fVar329;
    fVar388 = local_7a0._24_4_;
    auVar36._24_4_ = fVar388 * fVar341;
    auVar36._28_4_ = auVar116._28_4_;
    fVar306 = local_9e0._0_4_;
    fVar314 = local_9e0._4_4_;
    auVar37._4_4_ = fVar314 * fVar224;
    auVar37._0_4_ = fVar306 * fVar163;
    fVar316 = local_9e0._8_4_;
    auVar37._8_4_ = fVar316 * fVar244;
    fVar318 = local_9e0._12_4_;
    auVar37._12_4_ = fVar318 * fVar268;
    fVar320 = local_9e0._16_4_;
    auVar37._16_4_ = fVar320 * fVar287;
    fVar322 = local_9e0._20_4_;
    auVar37._20_4_ = fVar322 * fVar330;
    fVar324 = local_9e0._24_4_;
    auVar37._24_4_ = fVar324 * fVar347;
    auVar37._28_4_ = fVar368;
    auVar33 = vsubps_avx(auVar37,auVar36);
    auVar116 = vperm2f128_avx(auVar117,auVar117,1);
    auVar116 = vshufps_avx(auVar116,auVar117,0x30);
    local_a00 = vshufps_avx(auVar117,auVar116,0x29);
    fVar360 = local_a00._0_4_;
    fVar364 = local_a00._4_4_;
    auVar38._4_4_ = fVar364 * fVar224;
    auVar38._0_4_ = fVar360 * fVar163;
    fVar369 = local_a00._8_4_;
    auVar38._8_4_ = fVar369 * fVar244;
    fVar377 = local_a00._12_4_;
    auVar38._12_4_ = fVar377 * fVar268;
    fVar382 = local_a00._16_4_;
    auVar38._16_4_ = fVar382 * fVar287;
    fVar387 = local_a00._20_4_;
    auVar38._20_4_ = fVar387 * fVar330;
    fVar126 = local_a00._24_4_;
    auVar38._24_4_ = fVar126 * fVar347;
    auVar38._28_4_ = auVar116._28_4_;
    auVar39._4_4_ = fVar376 * fVar225;
    auVar39._0_4_ = fVar370 * fVar167;
    auVar39._8_4_ = fVar378 * fVar258;
    auVar39._12_4_ = fVar381 * fVar280;
    auVar39._16_4_ = fVar383 * fVar289;
    auVar39._20_4_ = fVar386 * fVar331;
    uVar95 = local_7a0._28_4_;
    auVar39._24_4_ = fVar388 * fVar348;
    auVar39._28_4_ = uVar95;
    auVar116 = vsubps_avx(auVar39,auVar38);
    auVar40._4_4_ = fVar314 * fVar225;
    auVar40._0_4_ = fVar306 * fVar167;
    auVar40._8_4_ = fVar316 * fVar258;
    auVar40._12_4_ = fVar318 * fVar280;
    auVar40._16_4_ = fVar320 * fVar289;
    auVar40._20_4_ = fVar322 * fVar331;
    auVar40._24_4_ = fVar324 * fVar348;
    auVar40._28_4_ = uVar95;
    auVar41._4_4_ = fVar364 * fVar223;
    auVar41._0_4_ = fVar360 * fVar161;
    auVar41._8_4_ = fVar369 * fVar242;
    auVar41._12_4_ = fVar377 * fVar243;
    auVar41._16_4_ = fVar382 * fVar285;
    auVar41._20_4_ = fVar387 * fVar329;
    auVar41._24_4_ = fVar126 * fVar341;
    auVar41._28_4_ = uStack_1c4;
    auVar299 = vsubps_avx(auVar41,auVar40);
    fVar130 = auVar299._28_4_;
    fVar375 = auVar116._28_4_ + fVar130;
    auVar42._4_4_ =
         (auVar28._4_4_ * auVar28._4_4_ +
         auVar30._4_4_ * auVar30._4_4_ + auVar31._4_4_ * auVar31._4_4_) * fVar333;
    auVar42._0_4_ =
         (auVar28._0_4_ * auVar28._0_4_ +
         auVar30._0_4_ * auVar30._0_4_ + auVar31._0_4_ * auVar31._0_4_) * fVar328;
    auVar42._8_4_ =
         (auVar28._8_4_ * auVar28._8_4_ +
         auVar30._8_4_ * auVar30._8_4_ + auVar31._8_4_ * auVar31._8_4_) * fVar335;
    auVar42._12_4_ =
         (auVar28._12_4_ * auVar28._12_4_ +
         auVar30._12_4_ * auVar30._12_4_ + auVar31._12_4_ * auVar31._12_4_) * fVar356;
    auVar42._16_4_ =
         (auVar28._16_4_ * auVar28._16_4_ +
         auVar30._16_4_ * auVar30._16_4_ + auVar31._16_4_ * auVar31._16_4_) * fVar358;
    auVar42._20_4_ =
         (auVar28._20_4_ * auVar28._20_4_ +
         auVar30._20_4_ * auVar30._20_4_ + auVar31._20_4_ * auVar31._20_4_) * fVar362;
    auVar42._24_4_ =
         (auVar28._24_4_ * auVar28._24_4_ +
         auVar30._24_4_ * auVar30._24_4_ + auVar31._24_4_ * auVar31._24_4_) * fVar366;
    auVar42._28_4_ = auVar28._28_4_ + fVar325;
    auVar43._4_4_ =
         (auVar33._4_4_ * auVar33._4_4_ +
         auVar116._4_4_ * auVar116._4_4_ + auVar299._4_4_ * auVar299._4_4_) * fVar333;
    auVar43._0_4_ =
         (auVar33._0_4_ * auVar33._0_4_ +
         auVar116._0_4_ * auVar116._0_4_ + auVar299._0_4_ * auVar299._0_4_) * fVar328;
    auVar43._8_4_ =
         (auVar33._8_4_ * auVar33._8_4_ +
         auVar116._8_4_ * auVar116._8_4_ + auVar299._8_4_ * auVar299._8_4_) * fVar335;
    auVar43._12_4_ =
         (auVar33._12_4_ * auVar33._12_4_ +
         auVar116._12_4_ * auVar116._12_4_ + auVar299._12_4_ * auVar299._12_4_) * fVar356;
    auVar43._16_4_ =
         (auVar33._16_4_ * auVar33._16_4_ +
         auVar116._16_4_ * auVar116._16_4_ + auVar299._16_4_ * auVar299._16_4_) * fVar358;
    auVar43._20_4_ =
         (auVar33._20_4_ * auVar33._20_4_ +
         auVar116._20_4_ * auVar116._20_4_ + auVar299._20_4_ * auVar299._20_4_) * fVar362;
    auVar43._24_4_ =
         (auVar33._24_4_ * auVar33._24_4_ +
         auVar116._24_4_ * auVar116._24_4_ + auVar299._24_4_ * auVar299._24_4_) * fVar366;
    auVar43._28_4_ = auVar32._28_4_ + auVar121._28_4_;
    auVar121 = vmaxps_avx(auVar42,auVar43);
    auVar116 = vperm2f128_avx(_local_860,_local_860,1);
    auVar116 = vshufps_avx(auVar116,_local_860,0x30);
    local_7c0 = vshufps_avx(_local_860,auVar116,0x29);
    local_720._0_4_ = (float)local_860._0_4_ + fVar210;
    local_720._4_4_ = (float)local_860._4_4_ + fVar222;
    local_720._8_4_ = fStack_858 + fVar240;
    local_720._12_4_ = fStack_854 + fVar241;
    local_720._16_4_ = fStack_850 + fVar260;
    local_720._20_4_ = fStack_84c + fVar262;
    local_720._24_4_ = fStack_848 + fVar281;
    local_720._28_4_ = fStack_844 + fVar283;
    auVar116 = vmaxps_avx(_local_860,local_720);
    auVar28 = vmaxps_avx(_local_800,local_7c0);
    auVar116 = vmaxps_avx(auVar116,auVar28);
    auVar28 = vrsqrtps_avx(auVar219);
    fVar210 = auVar28._0_4_;
    fVar222 = auVar28._4_4_;
    fVar240 = auVar28._8_4_;
    fVar241 = auVar28._12_4_;
    fVar260 = auVar28._16_4_;
    fVar262 = auVar28._20_4_;
    fVar281 = auVar28._24_4_;
    auVar44._4_4_ = fVar222 * fVar222 * fVar222 * auVar219._4_4_ * 0.5;
    auVar44._0_4_ = fVar210 * fVar210 * fVar210 * auVar219._0_4_ * 0.5;
    auVar44._8_4_ = fVar240 * fVar240 * fVar240 * auVar219._8_4_ * 0.5;
    auVar44._12_4_ = fVar241 * fVar241 * fVar241 * auVar219._12_4_ * 0.5;
    auVar44._16_4_ = fVar260 * fVar260 * fVar260 * auVar219._16_4_ * 0.5;
    auVar44._20_4_ = fVar262 * fVar262 * fVar262 * auVar219._20_4_ * 0.5;
    auVar44._24_4_ = fVar281 * fVar281 * fVar281 * auVar219._24_4_ * 0.5;
    auVar44._28_4_ = auVar219._28_4_;
    auVar45._4_4_ = fVar222 * 1.5;
    auVar45._0_4_ = fVar210 * 1.5;
    auVar45._8_4_ = fVar240 * 1.5;
    auVar45._12_4_ = fVar241 * 1.5;
    auVar45._16_4_ = fVar260 * 1.5;
    auVar45._20_4_ = fVar262 * 1.5;
    auVar45._24_4_ = fVar281 * 1.5;
    auVar45._28_4_ = auVar28._28_4_;
    auVar28 = vsubps_avx(auVar45,auVar44);
    auVar85._4_4_ = fVar198;
    auVar85._0_4_ = fVar172;
    auVar85._8_4_ = fVar201;
    auVar85._12_4_ = fVar204;
    auVar85._16_4_ = fStack_ab0;
    auVar85._20_4_ = fStack_aac;
    auVar85._24_4_ = fStack_aa8;
    auVar85._28_4_ = fStack_aa4;
    auVar30 = vsubps_avx(ZEXT832(0) << 0x20,auVar85);
    auVar91._4_4_ = fVar199;
    auVar91._0_4_ = fVar173;
    auVar91._8_4_ = fVar202;
    auVar91._12_4_ = fVar205;
    auVar91._16_4_ = fStack_a70;
    auVar91._20_4_ = fStack_a6c;
    auVar91._24_4_ = fStack_a68;
    auVar91._28_4_ = fStack_a64;
    auVar31 = vsubps_avx(ZEXT832(0) << 0x20,auVar91);
    fVar210 = auVar31._0_4_;
    fVar240 = auVar31._4_4_;
    fVar260 = auVar31._8_4_;
    fVar281 = auVar31._12_4_;
    fVar325 = auVar31._16_4_;
    fVar333 = auVar31._20_4_;
    fVar356 = auVar31._24_4_;
    fVar222 = auVar30._0_4_;
    fVar241 = auVar30._4_4_;
    fVar262 = auVar30._8_4_;
    fVar283 = auVar30._12_4_;
    fVar328 = auVar30._16_4_;
    fVar335 = auVar30._20_4_;
    fVar358 = auVar30._24_4_;
    auVar89._4_4_ = fStack_a9c;
    auVar89._0_4_ = local_aa0;
    auVar89._8_4_ = fStack_a98;
    auVar89._12_4_ = fStack_a94;
    auVar89._16_4_ = fStack_a90;
    auVar89._20_4_ = fStack_a8c;
    auVar89._24_4_ = fStack_a88;
    auVar89._28_4_ = fStack_a84;
    auVar299 = ZEXT832(0) << 0x20;
    auVar32 = vsubps_avx(auVar299,auVar89);
    fVar393 = auVar32._0_4_;
    fVar395 = auVar32._4_4_;
    fVar396 = auVar32._8_4_;
    fVar397 = auVar32._12_4_;
    fVar398 = auVar32._16_4_;
    fVar399 = auVar32._20_4_;
    fVar400 = auVar32._24_4_;
    auVar338._0_4_ = fVar393 * local_380 + local_640 * fVar222 + local_660 * fVar210;
    auVar338._4_4_ = fVar395 * fStack_37c + fStack_63c * fVar241 + fStack_65c * fVar240;
    auVar338._8_4_ = fVar396 * fStack_378 + fStack_638 * fVar262 + fStack_658 * fVar260;
    auVar338._12_4_ = fVar397 * fStack_374 + fStack_634 * fVar283 + fStack_654 * fVar281;
    auVar338._16_4_ = fVar398 * fStack_370 + fStack_630 * fVar328 + fStack_650 * fVar325;
    auVar338._20_4_ = fVar399 * fStack_36c + fStack_62c * fVar335 + fStack_64c * fVar333;
    auVar338._24_4_ = fVar400 * fStack_368 + fStack_628 * fVar358 + fStack_648 * fVar356;
    auVar338._28_4_ = fVar375 + fVar375 + auVar33._28_4_ + fVar375;
    auVar352._0_4_ = fVar393 * fVar393 + fVar222 * fVar222 + fVar210 * fVar210;
    auVar352._4_4_ = fVar395 * fVar395 + fVar241 * fVar241 + fVar240 * fVar240;
    auVar352._8_4_ = fVar396 * fVar396 + fVar262 * fVar262 + fVar260 * fVar260;
    auVar352._12_4_ = fVar397 * fVar397 + fVar283 * fVar283 + fVar281 * fVar281;
    auVar352._16_4_ = fVar398 * fVar398 + fVar328 * fVar328 + fVar325 * fVar325;
    auVar352._20_4_ = fVar399 * fVar399 + fVar335 * fVar335 + fVar333 * fVar333;
    auVar352._24_4_ = fVar400 * fVar400 + fVar358 * fVar358 + fVar356 * fVar356;
    auVar352._28_4_ = fVar130 + fVar130 + fVar375;
    fVar245 = auVar28._0_4_;
    fVar259 = auVar28._4_4_;
    fVar261 = auVar28._8_4_;
    fVar263 = auVar28._12_4_;
    fVar264 = auVar28._16_4_;
    fVar265 = auVar28._20_4_;
    fVar266 = auVar28._24_4_;
    fVar130 = auVar300._28_4_;
    local_560 = local_380 * fVar167 * fVar245 +
                fVar245 * fVar161 * local_640 + fVar245 * fVar163 * local_660;
    fStack_55c = fStack_37c * fVar225 * fVar259 +
                 fVar259 * fVar223 * fStack_63c + fVar259 * fVar224 * fStack_65c;
    fStack_558 = fStack_378 * fVar258 * fVar261 +
                 fVar261 * fVar242 * fStack_638 + fVar261 * fVar244 * fStack_658;
    fStack_554 = fStack_374 * fVar280 * fVar263 +
                 fVar263 * fVar243 * fStack_634 + fVar263 * fVar268 * fStack_654;
    fStack_550 = fStack_370 * fVar289 * fVar264 +
                 fVar264 * fVar285 * fStack_630 + fVar264 * fVar287 * fStack_650;
    fStack_54c = fStack_36c * fVar331 * fVar265 +
                 fVar265 * fVar329 * fStack_62c + fVar265 * fVar330 * fStack_64c;
    fStack_548 = fStack_368 * fVar348 * fVar266 +
                 fVar266 * fVar341 * fStack_628 + fVar266 * fVar347 * fStack_648;
    fStack_544 = auVar29._28_4_ + fVar130 + fStack_644;
    fVar267 = auVar29._28_4_ + fVar130 + fStack_644;
    fVar362 = fVar393 * fVar167 * fVar245 +
              fVar245 * fVar161 * fVar222 + fVar245 * fVar163 * fVar210;
    fVar366 = fVar395 * fVar225 * fVar259 +
              fVar259 * fVar223 * fVar241 + fVar259 * fVar224 * fVar240;
    fVar375 = fVar396 * fVar258 * fVar261 +
              fVar261 * fVar242 * fVar262 + fVar261 * fVar244 * fVar260;
    fVar380 = fVar397 * fVar280 * fVar263 +
              fVar263 * fVar243 * fVar283 + fVar263 * fVar268 * fVar281;
    fVar385 = fVar398 * fVar289 * fVar264 +
              fVar264 * fVar285 * fVar328 + fVar264 * fVar287 * fVar325;
    fVar125 = fVar399 * fVar331 * fVar265 +
              fVar265 * fVar329 * fVar335 + fVar265 * fVar330 * fVar333;
    fVar127 = fVar400 * fVar348 * fVar266 +
              fVar266 * fVar341 * fVar358 + fVar266 * fVar347 * fVar356;
    fVar128 = fVar130 + fVar267;
    auVar300._4_4_ = fStack_55c * fVar366;
    auVar300._0_4_ = local_560 * fVar362;
    auVar300._8_4_ = fStack_558 * fVar375;
    auVar300._12_4_ = fStack_554 * fVar380;
    auVar300._16_4_ = fStack_550 * fVar385;
    auVar300._20_4_ = fStack_54c * fVar125;
    auVar300._24_4_ = fStack_548 * fVar127;
    auVar300._28_4_ = fVar267;
    auVar29 = vsubps_avx(auVar338,auVar300);
    auVar46._4_4_ = fVar366 * fVar366;
    auVar46._0_4_ = fVar362 * fVar362;
    auVar46._8_4_ = fVar375 * fVar375;
    auVar46._12_4_ = fVar380 * fVar380;
    auVar46._16_4_ = fVar385 * fVar385;
    auVar46._20_4_ = fVar125 * fVar125;
    auVar46._24_4_ = fVar127 * fVar127;
    auVar46._28_4_ = fVar130;
    _local_740 = vsubps_avx(auVar352,auVar46);
    auVar28 = vsqrtps_avx(auVar121);
    fVar130 = (auVar28._0_4_ + auVar116._0_4_) * 1.0000002;
    fVar267 = (auVar28._4_4_ + auVar116._4_4_) * 1.0000002;
    fVar164 = (auVar28._8_4_ + auVar116._8_4_) * 1.0000002;
    fVar168 = (auVar28._12_4_ + auVar116._12_4_) * 1.0000002;
    fVar169 = (auVar28._16_4_ + auVar116._16_4_) * 1.0000002;
    fVar170 = (auVar28._20_4_ + auVar116._20_4_) * 1.0000002;
    fVar171 = (auVar28._24_4_ + auVar116._24_4_) * 1.0000002;
    auVar47._4_4_ = fVar267 * fVar267;
    auVar47._0_4_ = fVar130 * fVar130;
    auVar47._8_4_ = fVar164 * fVar164;
    auVar47._12_4_ = fVar168 * fVar168;
    auVar47._16_4_ = fVar169 * fVar169;
    auVar47._20_4_ = fVar170 * fVar170;
    auVar47._24_4_ = fVar171 * fVar171;
    auVar47._28_4_ = auVar28._28_4_ + auVar116._28_4_;
    fVar267 = auVar29._0_4_ + auVar29._0_4_;
    fVar164 = auVar29._4_4_ + auVar29._4_4_;
    auVar275._0_8_ = CONCAT44(fVar164,fVar267);
    auVar275._8_4_ = auVar29._8_4_ + auVar29._8_4_;
    auVar275._12_4_ = auVar29._12_4_ + auVar29._12_4_;
    auVar275._16_4_ = auVar29._16_4_ + auVar29._16_4_;
    auVar275._20_4_ = auVar29._20_4_ + auVar29._20_4_;
    auVar275._24_4_ = auVar29._24_4_ + auVar29._24_4_;
    auVar275._28_4_ = auVar29._28_4_ + auVar29._28_4_;
    auVar116 = vsubps_avx(_local_740,auVar47);
    auVar48._4_4_ = fStack_55c * fStack_55c;
    auVar48._0_4_ = local_560 * local_560;
    auVar48._8_4_ = fStack_558 * fStack_558;
    auVar48._12_4_ = fStack_554 * fStack_554;
    auVar48._16_4_ = fStack_550 * fStack_550;
    auVar48._20_4_ = fStack_54c * fStack_54c;
    auVar48._24_4_ = fStack_548 * fStack_548;
    auVar48._28_4_ = auVar338._28_4_;
    auVar29 = vsubps_avx(local_220,auVar48);
    local_760._4_4_ = fVar164 * fVar164;
    local_760._0_4_ = fVar267 * fVar267;
    local_760._8_4_ = auVar275._8_4_ * auVar275._8_4_;
    local_760._12_4_ = auVar275._12_4_ * auVar275._12_4_;
    local_760._16_4_ = auVar275._16_4_ * auVar275._16_4_;
    local_760._20_4_ = auVar275._20_4_ * auVar275._20_4_;
    local_760._24_4_ = auVar275._24_4_ * auVar275._24_4_;
    local_760._28_4_ = 0x3f800002;
    fVar168 = auVar29._0_4_;
    local_620._0_4_ = fVar168 * 4.0;
    fVar169 = auVar29._4_4_;
    local_620._4_4_ = fVar169 * 4.0;
    fVar170 = auVar29._8_4_;
    fStack_618 = fVar170 * 4.0;
    fVar171 = auVar29._12_4_;
    fStack_614 = fVar171 * 4.0;
    fVar332 = auVar29._16_4_;
    fStack_610 = fVar332 * 4.0;
    fVar334 = auVar29._20_4_;
    fStack_60c = fVar334 * 4.0;
    fVar336 = auVar29._24_4_;
    fStack_608 = fVar336 * 4.0;
    uStack_604 = 0x40800000;
    auVar49._4_4_ = auVar116._4_4_ * (float)local_620._4_4_;
    auVar49._0_4_ = auVar116._0_4_ * (float)local_620._0_4_;
    auVar49._8_4_ = auVar116._8_4_ * fStack_618;
    auVar49._12_4_ = auVar116._12_4_ * fStack_614;
    auVar49._16_4_ = auVar116._16_4_ * fStack_610;
    auVar49._20_4_ = auVar116._20_4_ * fStack_60c;
    auVar49._24_4_ = auVar116._24_4_ * fStack_608;
    auVar49._28_4_ = 0x40800000;
    auVar300 = vsubps_avx(local_760,auVar49);
    auVar121 = vcmpps_avx(auVar300,auVar299,5);
    fVar130 = auVar29._28_4_;
    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar121 >> 0x7f,0) == '\0') &&
          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar121 >> 0xbf,0) == '\0') &&
        (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar121[0x1f])
    {
      auVar190._8_4_ = 0x7f800000;
      auVar190._0_8_ = 0x7f8000007f800000;
      auVar190._12_4_ = 0x7f800000;
      auVar190._16_4_ = 0x7f800000;
      auVar190._20_4_ = 0x7f800000;
      auVar190._24_4_ = 0x7f800000;
      auVar190._28_4_ = 0x7f800000;
      auVar353._8_4_ = 0xff800000;
      auVar353._0_8_ = 0xff800000ff800000;
      auVar353._12_4_ = 0xff800000;
      auVar353._16_4_ = 0xff800000;
      auVar353._20_4_ = 0xff800000;
      auVar353._24_4_ = 0xff800000;
      auVar353._28_4_ = 0xff800000;
      auVar389._4_4_ = fStack_63c;
      auVar389._0_4_ = local_640;
      auVar389._8_4_ = fStack_638;
      auVar389._12_4_ = fStack_634;
      auVar389._16_4_ = fStack_630;
      auVar389._20_4_ = fStack_62c;
      auVar389._24_4_ = fStack_628;
      auVar339 = ZEXT3264(CONCAT428(fStack_644,
                                    CONCAT424(fStack_648,
                                              CONCAT420(fStack_64c,
                                                        CONCAT416(fStack_650,
                                                                  CONCAT412(fStack_654,
                                                                            CONCAT48(fStack_658,
                                                                                     CONCAT44(
                                                  fStack_65c,local_660))))))));
    }
    else {
      auVar27 = vsqrtps_avx(auVar300);
      auVar276._0_4_ = fVar168 + fVar168;
      auVar276._4_4_ = fVar169 + fVar169;
      auVar276._8_4_ = fVar170 + fVar170;
      auVar276._12_4_ = fVar171 + fVar171;
      auVar276._16_4_ = fVar332 + fVar332;
      auVar276._20_4_ = fVar334 + fVar334;
      auVar276._24_4_ = fVar336 + fVar336;
      auVar276._28_4_ = fVar130 + fVar130;
      auVar33 = vrcpps_avx(auVar276);
      auVar32 = vcmpps_avx(auVar300,auVar299,5);
      fVar174 = auVar33._0_4_;
      fVar200 = auVar33._4_4_;
      auVar50._4_4_ = auVar276._4_4_ * fVar200;
      auVar50._0_4_ = auVar276._0_4_ * fVar174;
      fVar203 = auVar33._8_4_;
      auVar50._8_4_ = auVar276._8_4_ * fVar203;
      fVar206 = auVar33._12_4_;
      auVar50._12_4_ = auVar276._12_4_ * fVar206;
      fVar207 = auVar33._16_4_;
      auVar50._16_4_ = auVar276._16_4_ * fVar207;
      fVar208 = auVar33._20_4_;
      auVar50._20_4_ = auVar276._20_4_ * fVar208;
      fVar209 = auVar33._24_4_;
      auVar50._24_4_ = auVar276._24_4_ * fVar209;
      auVar50._28_4_ = auVar300._28_4_;
      auVar277._8_4_ = 0x3f800000;
      auVar277._0_8_ = &DAT_3f8000003f800000;
      auVar277._12_4_ = 0x3f800000;
      auVar277._16_4_ = 0x3f800000;
      auVar277._20_4_ = 0x3f800000;
      auVar277._24_4_ = 0x3f800000;
      auVar277._28_4_ = 0x3f800000;
      auVar300 = vsubps_avx(auVar277,auVar50);
      fVar174 = fVar174 + fVar174 * auVar300._0_4_;
      fVar200 = fVar200 + fVar200 * auVar300._4_4_;
      fVar203 = fVar203 + fVar203 * auVar300._8_4_;
      fVar206 = fVar206 + fVar206 * auVar300._12_4_;
      fVar207 = fVar207 + fVar207 * auVar300._16_4_;
      fVar208 = fVar208 + fVar208 * auVar300._20_4_;
      fVar209 = fVar209 + fVar209 * auVar300._24_4_;
      auVar278._0_8_ = CONCAT44(fVar164,fVar267) ^ 0x8000000080000000;
      auVar278._8_4_ = -auVar275._8_4_;
      auVar278._12_4_ = -auVar275._12_4_;
      auVar278._16_4_ = -auVar275._16_4_;
      auVar278._20_4_ = -auVar275._20_4_;
      auVar278._24_4_ = -auVar275._24_4_;
      auVar278._28_4_ = -auVar275._28_4_;
      auVar299 = vsubps_avx(auVar278,auVar27);
      fVar267 = auVar299._0_4_ * fVar174;
      fVar164 = auVar299._4_4_ * fVar200;
      auVar51._4_4_ = fVar164;
      auVar51._0_4_ = fVar267;
      fVar282 = auVar299._8_4_ * fVar203;
      auVar51._8_4_ = fVar282;
      fVar284 = auVar299._12_4_ * fVar206;
      auVar51._12_4_ = fVar284;
      fVar286 = auVar299._16_4_ * fVar207;
      auVar51._16_4_ = fVar286;
      fVar288 = auVar299._20_4_ * fVar208;
      auVar51._20_4_ = fVar288;
      fVar290 = auVar299._24_4_ * fVar209;
      auVar51._24_4_ = fVar290;
      auVar51._28_4_ = auVar299._28_4_;
      auVar299 = vsubps_avx(auVar27,auVar275);
      fVar174 = auVar299._0_4_ * fVar174;
      fVar200 = auVar299._4_4_ * fVar200;
      auVar52._4_4_ = fVar200;
      auVar52._0_4_ = fVar174;
      fVar203 = auVar299._8_4_ * fVar203;
      auVar52._8_4_ = fVar203;
      fVar206 = auVar299._12_4_ * fVar206;
      auVar52._12_4_ = fVar206;
      fVar207 = auVar299._16_4_ * fVar207;
      auVar52._16_4_ = fVar207;
      fVar208 = auVar299._20_4_ * fVar208;
      auVar52._20_4_ = fVar208;
      fVar209 = auVar299._24_4_ * fVar209;
      auVar52._24_4_ = fVar209;
      auVar52._28_4_ = auVar299._28_4_;
      fStack_464 = fVar128 + auVar33._28_4_ + auVar300._28_4_;
      local_480[0] = fVar245 * (fVar362 + local_560 * fVar267);
      local_480[1] = fVar259 * (fVar366 + fStack_55c * fVar164);
      local_480[2] = fVar261 * (fVar375 + fStack_558 * fVar282);
      local_480[3] = fVar263 * (fVar380 + fStack_554 * fVar284);
      fStack_470 = fVar264 * (fVar385 + fStack_550 * fVar286);
      fStack_46c = fVar265 * (fVar125 + fStack_54c * fVar288);
      fStack_468 = fVar266 * (fVar127 + fStack_548 * fVar290);
      local_4a0[0] = fVar245 * (fVar362 + local_560 * fVar174);
      local_4a0[1] = fVar259 * (fVar366 + fStack_55c * fVar200);
      local_4a0[2] = fVar261 * (fVar375 + fStack_558 * fVar203);
      local_4a0[3] = fVar263 * (fVar380 + fStack_554 * fVar206);
      fStack_490 = fVar264 * (fVar385 + fStack_550 * fVar207);
      fStack_48c = fVar265 * (fVar125 + fStack_54c * fVar208);
      fStack_488 = fVar266 * (fVar127 + fStack_548 * fVar209);
      fStack_484 = fVar128 + fStack_464;
      auVar191._8_4_ = 0x7f800000;
      auVar191._0_8_ = 0x7f8000007f800000;
      auVar191._12_4_ = 0x7f800000;
      auVar191._16_4_ = 0x7f800000;
      auVar191._20_4_ = 0x7f800000;
      auVar191._24_4_ = 0x7f800000;
      auVar191._28_4_ = 0x7f800000;
      auVar190 = vblendvps_avx(auVar191,auVar51,auVar32);
      auVar298._8_4_ = 0x7fffffff;
      auVar298._0_8_ = 0x7fffffff7fffffff;
      auVar298._12_4_ = 0x7fffffff;
      auVar298._16_4_ = 0x7fffffff;
      auVar298._20_4_ = 0x7fffffff;
      auVar298._24_4_ = 0x7fffffff;
      auVar298._28_4_ = 0x7fffffff;
      auVar300 = vandps_avx(auVar48,auVar298);
      auVar300 = vmaxps_avx(local_3c0,auVar300);
      auVar53._4_4_ = auVar300._4_4_ * 1.9073486e-06;
      auVar53._0_4_ = auVar300._0_4_ * 1.9073486e-06;
      auVar53._8_4_ = auVar300._8_4_ * 1.9073486e-06;
      auVar53._12_4_ = auVar300._12_4_ * 1.9073486e-06;
      auVar53._16_4_ = auVar300._16_4_ * 1.9073486e-06;
      auVar53._20_4_ = auVar300._20_4_ * 1.9073486e-06;
      auVar53._24_4_ = auVar300._24_4_ * 1.9073486e-06;
      auVar53._28_4_ = auVar300._28_4_;
      auVar300 = vandps_avx(auVar29,auVar298);
      auVar300 = vcmpps_avx(auVar300,auVar53,1);
      auVar279._8_4_ = 0xff800000;
      auVar279._0_8_ = 0xff800000ff800000;
      auVar279._12_4_ = 0xff800000;
      auVar279._16_4_ = 0xff800000;
      auVar279._20_4_ = 0xff800000;
      auVar279._24_4_ = 0xff800000;
      auVar279._28_4_ = 0xff800000;
      auVar353 = vblendvps_avx(auVar279,auVar52,auVar32);
      auVar33 = auVar32 & auVar300;
      local_680 = auVar121;
      if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar33 >> 0x7f,0) == '\0') &&
            (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar33 >> 0xbf,0) == '\0') &&
          (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar33[0x1f])
      {
        auVar389._4_4_ = fStack_63c;
        auVar389._0_4_ = local_640;
        auVar389._8_4_ = fStack_638;
        auVar389._12_4_ = fStack_634;
        auVar389._16_4_ = fStack_630;
        auVar389._20_4_ = fStack_62c;
        auVar389._24_4_ = fStack_628;
        auVar339 = ZEXT3264(CONCAT428(fStack_644,
                                      CONCAT424(fStack_648,
                                                CONCAT420(fStack_64c,
                                                          CONCAT416(fStack_650,
                                                                    CONCAT412(fStack_654,
                                                                              CONCAT48(fStack_658,
                                                                                       CONCAT44(
                                                  fStack_65c,local_660))))))));
      }
      else {
        auVar121 = vandps_avx(auVar300,auVar32);
        auVar141 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
        auVar300 = vcmpps_avx(auVar116,ZEXT832(0) << 0x20,2);
        auVar391._8_4_ = 0xff800000;
        auVar391._0_8_ = 0xff800000ff800000;
        auVar391._12_4_ = 0xff800000;
        auVar391._16_4_ = 0xff800000;
        auVar391._20_4_ = 0xff800000;
        auVar391._24_4_ = 0xff800000;
        auVar391._28_4_ = 0xff800000;
        auVar310._8_4_ = 0x7f800000;
        auVar310._0_8_ = 0x7f8000007f800000;
        auVar310._12_4_ = 0x7f800000;
        auVar310._16_4_ = 0x7f800000;
        auVar310._20_4_ = 0x7f800000;
        auVar310._24_4_ = 0x7f800000;
        auVar310._28_4_ = 0x7f800000;
        auVar116 = vblendvps_avx(auVar310,auVar391,auVar300);
        auVar111 = vpmovsxwd_avx(auVar141);
        auVar141 = vpunpckhwd_avx(auVar141,auVar141);
        auVar257._16_16_ = auVar141;
        auVar257._0_16_ = auVar111;
        auVar190 = vblendvps_avx(auVar190,auVar116,auVar257);
        auVar116 = vblendvps_avx(auVar391,auVar310,auVar300);
        auVar353 = vblendvps_avx(auVar353,auVar116,auVar257);
        auVar116 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar158._0_4_ = auVar121._0_4_ ^ auVar116._0_4_;
        auVar158._4_4_ = auVar121._4_4_ ^ auVar116._4_4_;
        auVar158._8_4_ = auVar121._8_4_ ^ auVar116._8_4_;
        auVar158._12_4_ = auVar121._12_4_ ^ auVar116._12_4_;
        auVar158._16_4_ = auVar121._16_4_ ^ auVar116._16_4_;
        auVar158._20_4_ = auVar121._20_4_ ^ auVar116._20_4_;
        auVar158._24_4_ = auVar121._24_4_ ^ auVar116._24_4_;
        auVar158._28_4_ = auVar121._28_4_ ^ auVar116._28_4_;
        auVar121 = vorps_avx(auVar300,auVar158);
        auVar121 = vandps_avx(auVar32,auVar121);
        auVar389._4_4_ = fStack_63c;
        auVar389._0_4_ = local_640;
        auVar389._8_4_ = fStack_638;
        auVar389._12_4_ = fStack_634;
        auVar389._16_4_ = fStack_630;
        auVar389._20_4_ = fStack_62c;
        auVar389._24_4_ = fStack_628;
        auVar339 = ZEXT3264(CONCAT428(fStack_644,
                                      CONCAT424(fStack_648,
                                                CONCAT420(fStack_64c,
                                                          CONCAT416(fStack_650,
                                                                    CONCAT412(fStack_654,
                                                                              CONCAT48(fStack_658,
                                                                                       CONCAT44(
                                                  fStack_65c,local_660))))))));
      }
    }
    auVar116 = local_3a0 & auVar121;
    if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar116 >> 0x7f,0) == '\0') &&
          (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar116 >> 0xbf,0) == '\0') &&
        (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar116[0x1f])
    {
      auVar141 = ZEXT816(0);
LAB_0106a8ae:
      auVar374 = ZEXT3264(_local_a20);
      auVar304 = ZEXT1664(auVar141);
      auVar346 = ZEXT3264(_local_8a0);
      auVar312 = ZEXT3264(_local_780);
    }
    else {
      auVar141 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_6b0._0_4_));
      auVar141 = vshufps_avx(auVar141,auVar141,0);
      auVar249._16_16_ = auVar141;
      auVar249._0_16_ = auVar141;
      auVar32 = vmaxps_avx(auVar249,auVar190);
      auVar141 = ZEXT416((uint)(ray->tfar - (float)local_6b0._0_4_));
      auVar141 = vshufps_avx(auVar141,auVar141,0);
      auVar250._16_16_ = auVar141;
      auVar250._0_16_ = auVar141;
      auVar33 = vminps_avx(auVar250,auVar353);
      fVar208 = auVar31._28_4_;
      fVar209 = auVar339._0_4_;
      fVar282 = auVar339._4_4_;
      fVar284 = auVar339._8_4_;
      fVar286 = auVar339._12_4_;
      fVar288 = auVar339._16_4_;
      fVar290 = auVar339._20_4_;
      fVar340 = auVar339._24_4_;
      auVar118._0_4_ = local_380 * auVar117._0_4_ + auVar389._0_4_ * fVar305 + fVar209 * fVar349;
      auVar118._4_4_ = fStack_37c * auVar117._4_4_ + auVar389._4_4_ * fVar313 + fVar282 * fVar357;
      auVar118._8_4_ = fStack_378 * auVar117._8_4_ + auVar389._8_4_ * fVar315 + fVar284 * fVar359;
      auVar118._12_4_ = fStack_374 * auVar117._12_4_ + auVar389._12_4_ * fVar317 + fVar286 * fVar361
      ;
      auVar118._16_4_ = fStack_370 * auVar117._16_4_ + auVar389._16_4_ * fVar319 + fVar288 * fVar363
      ;
      auVar118._20_4_ = fStack_36c * auVar117._20_4_ + auVar389._20_4_ * fVar321 + fVar290 * fVar365
      ;
      auVar118._24_4_ = fStack_368 * auVar117._24_4_ + auVar389._24_4_ * fVar323 + fVar340 * fVar367
      ;
      auVar118._28_4_ = fVar368 + fVar208 + 0.0;
      auVar116 = vrcpps_avx(auVar118);
      fVar267 = auVar116._0_4_;
      fVar164 = auVar116._4_4_;
      auVar54._4_4_ = auVar118._4_4_ * fVar164;
      auVar54._0_4_ = auVar118._0_4_ * fVar267;
      fVar174 = auVar116._8_4_;
      auVar54._8_4_ = auVar118._8_4_ * fVar174;
      fVar200 = auVar116._12_4_;
      auVar54._12_4_ = auVar118._12_4_ * fVar200;
      fVar203 = auVar116._16_4_;
      auVar54._16_4_ = auVar118._16_4_ * fVar203;
      fVar206 = auVar116._20_4_;
      auVar54._20_4_ = auVar118._20_4_ * fVar206;
      fVar207 = auVar116._24_4_;
      auVar54._24_4_ = auVar118._24_4_ * fVar207;
      auVar54._28_4_ = fVar368;
      auVar354._8_4_ = 0x3f800000;
      auVar354._0_8_ = &DAT_3f8000003f800000;
      auVar354._12_4_ = 0x3f800000;
      auVar354._16_4_ = 0x3f800000;
      auVar354._20_4_ = 0x3f800000;
      auVar354._24_4_ = 0x3f800000;
      auVar354._28_4_ = 0x3f800000;
      auVar300 = vsubps_avx(auVar354,auVar54);
      auVar327._8_4_ = 0x7fffffff;
      auVar327._0_8_ = 0x7fffffff7fffffff;
      auVar327._12_4_ = 0x7fffffff;
      auVar327._16_4_ = 0x7fffffff;
      auVar327._20_4_ = 0x7fffffff;
      auVar327._24_4_ = 0x7fffffff;
      auVar327._28_4_ = 0x7fffffff;
      auVar116 = vandps_avx(auVar327,auVar118);
      auVar390._8_4_ = 0x219392ef;
      auVar390._0_8_ = 0x219392ef219392ef;
      auVar390._12_4_ = 0x219392ef;
      auVar390._16_4_ = 0x219392ef;
      auVar390._20_4_ = 0x219392ef;
      auVar390._24_4_ = 0x219392ef;
      auVar390._28_4_ = 0x219392ef;
      auVar116 = vcmpps_avx(auVar116,auVar390,1);
      auVar339 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar55._4_4_ =
           (fVar164 + fVar164 * auVar300._4_4_) *
           -(fVar395 * auVar117._4_4_ + fVar313 * fVar241 + fVar357 * fVar240);
      auVar55._0_4_ =
           (fVar267 + fVar267 * auVar300._0_4_) *
           -(fVar393 * auVar117._0_4_ + fVar305 * fVar222 + fVar349 * fVar210);
      auVar55._8_4_ =
           (fVar174 + fVar174 * auVar300._8_4_) *
           -(fVar396 * auVar117._8_4_ + fVar315 * fVar262 + fVar359 * fVar260);
      auVar55._12_4_ =
           (fVar200 + fVar200 * auVar300._12_4_) *
           -(fVar397 * auVar117._12_4_ + fVar317 * fVar283 + fVar361 * fVar281);
      auVar55._16_4_ =
           (fVar203 + fVar203 * auVar300._16_4_) *
           -(fVar398 * auVar117._16_4_ + fVar319 * fVar328 + fVar363 * fVar325);
      auVar55._20_4_ =
           (fVar206 + fVar206 * auVar300._20_4_) *
           -(fVar399 * auVar117._20_4_ + fVar321 * fVar335 + fVar365 * fVar333);
      auVar55._24_4_ =
           (fVar207 + fVar207 * auVar300._24_4_) *
           -(fVar400 * auVar117._24_4_ + fVar323 * fVar358 + fVar367 * fVar356);
      auVar55._28_4_ = -(fVar208 + auVar30._28_4_ + fVar208);
      auVar297._0_12_ = ZEXT812(0);
      auVar297._12_4_ = 0;
      auVar300 = vcmpps_avx(auVar118,ZEXT1632(auVar297),1);
      auVar30 = vorps_avx(auVar116,auVar300);
      auVar300 = vcmpps_avx(auVar118,ZEXT1632(auVar297),6);
      auVar300 = vorps_avx(auVar116,auVar300);
      auVar345._8_4_ = 0xff800000;
      auVar345._0_8_ = 0xff800000ff800000;
      auVar345._12_4_ = 0xff800000;
      auVar345._16_4_ = 0xff800000;
      auVar345._20_4_ = 0xff800000;
      auVar345._24_4_ = 0xff800000;
      auVar345._28_4_ = 0xff800000;
      auVar116 = vblendvps_avx(auVar55,auVar345,auVar30);
      auVar373._8_4_ = 0x7f800000;
      auVar373._0_8_ = 0x7f8000007f800000;
      auVar373._12_4_ = 0x7f800000;
      auVar373._16_4_ = 0x7f800000;
      auVar373._20_4_ = 0x7f800000;
      auVar373._24_4_ = 0x7f800000;
      auVar373._28_4_ = 0x7f800000;
      auVar300 = vblendvps_avx(auVar55,auVar373,auVar300);
      auVar30 = vmaxps_avx(auVar32,auVar116);
      auVar300 = vminps_avx(auVar33,auVar300);
      auVar299 = ZEXT1632(auVar297);
      auVar116 = vsubps_avx(auVar299,auVar25);
      auVar25 = vsubps_avx(auVar299,auVar26);
      auVar56._4_4_ = auVar25._4_4_ * -fVar376;
      auVar56._0_4_ = auVar25._0_4_ * -fVar370;
      auVar56._8_4_ = auVar25._8_4_ * -fVar378;
      auVar56._12_4_ = auVar25._12_4_ * -fVar381;
      auVar56._16_4_ = auVar25._16_4_ * -fVar383;
      auVar56._20_4_ = auVar25._20_4_ * -fVar386;
      auVar56._24_4_ = auVar25._24_4_ * -fVar388;
      auVar56._28_4_ = auVar25._28_4_;
      auVar57._4_4_ = fVar314 * auVar116._4_4_;
      auVar57._0_4_ = fVar306 * auVar116._0_4_;
      auVar57._8_4_ = fVar316 * auVar116._8_4_;
      auVar57._12_4_ = fVar318 * auVar116._12_4_;
      auVar57._16_4_ = fVar320 * auVar116._16_4_;
      auVar57._20_4_ = fVar322 * auVar116._20_4_;
      auVar57._24_4_ = fVar324 * auVar116._24_4_;
      auVar57._28_4_ = auVar116._28_4_;
      auVar116 = vsubps_avx(auVar56,auVar57);
      auVar25 = vsubps_avx(auVar299,local_9c0);
      auVar58._4_4_ = fVar364 * auVar25._4_4_;
      auVar58._0_4_ = fVar360 * auVar25._0_4_;
      auVar58._8_4_ = fVar369 * auVar25._8_4_;
      auVar58._12_4_ = fVar377 * auVar25._12_4_;
      auVar58._16_4_ = fVar382 * auVar25._16_4_;
      auVar58._20_4_ = fVar387 * auVar25._20_4_;
      uVar7 = auVar25._28_4_;
      auVar58._24_4_ = fVar126 * auVar25._24_4_;
      auVar58._28_4_ = uVar7;
      auVar31 = vsubps_avx(auVar116,auVar58);
      auVar59._4_4_ = fVar282 * -fVar376;
      auVar59._0_4_ = fVar209 * -fVar370;
      auVar59._8_4_ = fVar284 * -fVar378;
      auVar59._12_4_ = fVar286 * -fVar381;
      auVar59._16_4_ = fVar288 * -fVar383;
      auVar59._20_4_ = fVar290 * -fVar386;
      auVar59._24_4_ = fVar340 * -fVar388;
      auVar59._28_4_ = uVar95 ^ 0x80000000;
      auVar60._4_4_ = auVar389._4_4_ * fVar314;
      auVar60._0_4_ = auVar389._0_4_ * fVar306;
      auVar60._8_4_ = auVar389._8_4_ * fVar316;
      auVar60._12_4_ = auVar389._12_4_ * fVar318;
      auVar60._16_4_ = auVar389._16_4_ * fVar320;
      auVar60._20_4_ = auVar389._20_4_ * fVar322;
      auVar60._24_4_ = auVar389._24_4_ * fVar324;
      auVar60._28_4_ = uVar7;
      auVar355._8_4_ = 0x3f800000;
      auVar355._0_8_ = &DAT_3f8000003f800000;
      auVar355._12_4_ = 0x3f800000;
      auVar355._16_4_ = 0x3f800000;
      auVar355._20_4_ = 0x3f800000;
      auVar355._24_4_ = 0x3f800000;
      auVar355._28_4_ = 0x3f800000;
      auVar116 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fStack_37c * fVar364;
      auVar61._0_4_ = local_380 * fVar360;
      auVar61._8_4_ = fStack_378 * fVar369;
      auVar61._12_4_ = fStack_374 * fVar377;
      auVar61._16_4_ = fStack_370 * fVar382;
      auVar61._20_4_ = fStack_36c * fVar387;
      auVar61._24_4_ = fStack_368 * fVar126;
      auVar61._28_4_ = uVar7;
      auVar32 = vsubps_avx(auVar116,auVar61);
      auVar116 = vrcpps_avx(auVar32);
      fVar210 = auVar116._0_4_;
      fVar222 = auVar116._4_4_;
      auVar62._4_4_ = auVar32._4_4_ * fVar222;
      auVar62._0_4_ = auVar32._0_4_ * fVar210;
      fVar240 = auVar116._8_4_;
      auVar62._8_4_ = auVar32._8_4_ * fVar240;
      fVar241 = auVar116._12_4_;
      auVar62._12_4_ = auVar32._12_4_ * fVar241;
      fVar260 = auVar116._16_4_;
      auVar62._16_4_ = auVar32._16_4_ * fVar260;
      fVar262 = auVar116._20_4_;
      auVar62._20_4_ = auVar32._20_4_ * fVar262;
      fVar281 = auVar116._24_4_;
      auVar62._24_4_ = auVar32._24_4_ * fVar281;
      auVar62._28_4_ = local_9e0._28_4_;
      auVar33 = vsubps_avx(auVar355,auVar62);
      auVar145._8_4_ = 0x7fffffff;
      auVar145._0_8_ = 0x7fffffff7fffffff;
      auVar145._12_4_ = 0x7fffffff;
      auVar145._16_4_ = 0x7fffffff;
      auVar145._20_4_ = 0x7fffffff;
      auVar145._24_4_ = 0x7fffffff;
      auVar145._28_4_ = 0x7fffffff;
      auVar116 = vandps_avx(auVar32,auVar145);
      auVar25 = vcmpps_avx(auVar116,auVar390,1);
      auVar63._4_4_ = (fVar222 + fVar222 * auVar33._4_4_) * -auVar31._4_4_;
      auVar63._0_4_ = (fVar210 + fVar210 * auVar33._0_4_) * -auVar31._0_4_;
      auVar63._8_4_ = (fVar240 + fVar240 * auVar33._8_4_) * -auVar31._8_4_;
      auVar63._12_4_ = (fVar241 + fVar241 * auVar33._12_4_) * -auVar31._12_4_;
      auVar63._16_4_ = (fVar260 + fVar260 * auVar33._16_4_) * -auVar31._16_4_;
      auVar63._20_4_ = (fVar262 + fVar262 * auVar33._20_4_) * -auVar31._20_4_;
      auVar63._24_4_ = (fVar281 + fVar281 * auVar33._24_4_) * -auVar31._24_4_;
      auVar63._28_4_ = auVar31._28_4_ ^ 0x80000000;
      auVar116 = vcmpps_avx(auVar32,auVar299,1);
      auVar116 = vorps_avx(auVar25,auVar116);
      auVar116 = vblendvps_avx(auVar63,auVar345,auVar116);
      local_400 = vmaxps_avx(auVar30,auVar116);
      auVar116 = vcmpps_avx(auVar32,ZEXT832(0) << 0x20,6);
      auVar116 = vorps_avx(auVar25,auVar116);
      auVar116 = vblendvps_avx(auVar63,auVar373,auVar116);
      auVar121 = vandps_avx(auVar121,local_3a0);
      local_420 = vminps_avx(auVar300,auVar116);
      auVar116 = vcmpps_avx(local_400,local_420,2);
      auVar25 = auVar121 & auVar116;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar25 >> 0x7f,0) == '\0') &&
            (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar25 >> 0xbf,0) == '\0') &&
          (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar25[0x1f])
      {
        auVar141 = ZEXT816(0) << 0x20;
        goto LAB_0106a8ae;
      }
      auVar25 = vminps_avx(_local_860,local_720);
      auVar300 = vminps_avx(_local_800,local_7c0);
      auVar25 = vminps_avx(auVar25,auVar300);
      auVar25 = vsubps_avx(auVar25,auVar28);
      auVar121 = vandps_avx(auVar116,auVar121);
      auVar94._4_4_ = local_480[1];
      auVar94._0_4_ = local_480[0];
      auVar94._8_4_ = local_480[2];
      auVar94._12_4_ = local_480[3];
      auVar94._16_4_ = fStack_470;
      auVar94._20_4_ = fStack_46c;
      auVar94._24_4_ = fStack_468;
      auVar94._28_4_ = fStack_464;
      auVar116 = vminps_avx(auVar94,auVar355);
      auVar300 = ZEXT1632(auVar297);
      auVar116 = vmaxps_avx(auVar116,auVar300);
      local_480[0] = fVar371 + fVar129 * (auVar116._0_4_ + 0.0) * 0.125;
      local_480[1] = fVar379 + fVar160 * (auVar116._4_4_ + 1.0) * 0.125;
      local_480[2] = fVar384 + fVar162 * (auVar116._8_4_ + 2.0) * 0.125;
      local_480[3] = fStack_8c4 + fVar166 * (auVar116._12_4_ + 3.0) * 0.125;
      fStack_470 = fVar371 + fVar129 * (auVar116._16_4_ + 4.0) * 0.125;
      fStack_46c = fVar379 + fVar160 * (auVar116._20_4_ + 5.0) * 0.125;
      fStack_468 = fVar384 + fVar162 * (auVar116._24_4_ + 6.0) * 0.125;
      fStack_464 = fStack_8c4 + auVar116._28_4_ + 7.0;
      auVar93._4_4_ = local_4a0[1];
      auVar93._0_4_ = local_4a0[0];
      auVar93._8_4_ = local_4a0[2];
      auVar93._12_4_ = local_4a0[3];
      auVar93._16_4_ = fStack_490;
      auVar93._20_4_ = fStack_48c;
      auVar93._24_4_ = fStack_488;
      auVar93._28_4_ = fStack_484;
      auVar116 = vminps_avx(auVar93,auVar355);
      auVar116 = vmaxps_avx(auVar116,auVar300);
      local_4a0[0] = fVar371 + fVar129 * (auVar116._0_4_ + 0.0) * 0.125;
      local_4a0[1] = fVar379 + fVar160 * (auVar116._4_4_ + 1.0) * 0.125;
      local_4a0[2] = fVar384 + fVar162 * (auVar116._8_4_ + 2.0) * 0.125;
      local_4a0[3] = fStack_8c4 + fVar166 * (auVar116._12_4_ + 3.0) * 0.125;
      fStack_490 = fVar371 + fVar129 * (auVar116._16_4_ + 4.0) * 0.125;
      fStack_48c = fVar379 + fVar160 * (auVar116._20_4_ + 5.0) * 0.125;
      fStack_488 = fVar384 + fVar162 * (auVar116._24_4_ + 6.0) * 0.125;
      fStack_484 = fStack_8c4 + auVar116._28_4_ + 7.0;
      auVar65._4_4_ = auVar25._4_4_ * 0.99999976;
      auVar65._0_4_ = auVar25._0_4_ * 0.99999976;
      auVar65._8_4_ = auVar25._8_4_ * 0.99999976;
      auVar65._12_4_ = auVar25._12_4_ * 0.99999976;
      auVar65._16_4_ = auVar25._16_4_ * 0.99999976;
      auVar65._20_4_ = auVar25._20_4_ * 0.99999976;
      auVar65._24_4_ = auVar25._24_4_ * 0.99999976;
      auVar65._28_4_ = 0x3f7ffffc;
      auVar116 = vmaxps_avx(ZEXT832(0) << 0x20,auVar65);
      auVar66._4_4_ = auVar116._4_4_ * auVar116._4_4_;
      auVar66._0_4_ = auVar116._0_4_ * auVar116._0_4_;
      auVar66._8_4_ = auVar116._8_4_ * auVar116._8_4_;
      auVar66._12_4_ = auVar116._12_4_ * auVar116._12_4_;
      auVar66._16_4_ = auVar116._16_4_ * auVar116._16_4_;
      auVar66._20_4_ = auVar116._20_4_ * auVar116._20_4_;
      auVar66._24_4_ = auVar116._24_4_ * auVar116._24_4_;
      auVar66._28_4_ = auVar116._28_4_;
      local_6e0 = vsubps_avx(_local_740,auVar66);
      auVar67._4_4_ = local_6e0._4_4_ * (float)local_620._4_4_;
      auVar67._0_4_ = local_6e0._0_4_ * (float)local_620._0_4_;
      auVar67._8_4_ = local_6e0._8_4_ * fStack_618;
      auVar67._12_4_ = local_6e0._12_4_ * fStack_614;
      auVar67._16_4_ = local_6e0._16_4_ * fStack_610;
      auVar67._20_4_ = local_6e0._20_4_ * fStack_60c;
      auVar67._24_4_ = local_6e0._24_4_ * fStack_608;
      auVar67._28_4_ = auVar116._28_4_;
      auVar25 = vsubps_avx(local_760,auVar67);
      local_980 = vcmpps_avx(auVar25,auVar300,5);
      auVar116 = local_980;
      if ((((((((local_980 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_980 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_980 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_980 >> 0x7f,0) == '\0') &&
            (local_980 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_980 >> 0xbf,0) == '\0') &&
          (local_980 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_980[0x1f]) {
        _local_5c0 = ZEXT832(0) << 0x20;
        _local_a40 = ZEXT832(0) << 0x20;
        auVar192._8_4_ = 0x7f800000;
        auVar192._0_8_ = 0x7f8000007f800000;
        auVar192._12_4_ = 0x7f800000;
        auVar192._16_4_ = 0x7f800000;
        auVar192._20_4_ = 0x7f800000;
        auVar192._24_4_ = 0x7f800000;
        auVar192._28_4_ = 0x7f800000;
        auVar251._8_4_ = 0xff800000;
        auVar251._0_8_ = 0xff800000ff800000;
        auVar251._12_4_ = 0xff800000;
        auVar251._16_4_ = 0xff800000;
        auVar251._20_4_ = 0xff800000;
        auVar251._24_4_ = 0xff800000;
        auVar251._28_4_ = 0xff800000;
        local_980 = auVar117;
        _local_8e0 = auVar26;
        _local_8c0 = _local_a40;
        _local_860 = _local_a40;
        local_6e0 = auVar34;
        _local_5a0 = _local_5c0;
        _local_580 = _local_a40;
      }
      else {
        auVar300 = vsqrtps_avx(auVar25);
        auVar236._0_4_ = fVar168 + fVar168;
        auVar236._4_4_ = fVar169 + fVar169;
        auVar236._8_4_ = fVar170 + fVar170;
        auVar236._12_4_ = fVar171 + fVar171;
        auVar236._16_4_ = fVar332 + fVar332;
        auVar236._20_4_ = fVar334 + fVar334;
        auVar236._24_4_ = fVar336 + fVar336;
        auVar236._28_4_ = fVar130 + fVar130;
        auVar26 = vrcpps_avx(auVar236);
        fVar130 = auVar26._0_4_;
        fVar210 = auVar26._4_4_;
        auVar68._4_4_ = auVar236._4_4_ * fVar210;
        auVar68._0_4_ = auVar236._0_4_ * fVar130;
        fVar222 = auVar26._8_4_;
        auVar68._8_4_ = auVar236._8_4_ * fVar222;
        fVar240 = auVar26._12_4_;
        auVar68._12_4_ = auVar236._12_4_ * fVar240;
        fVar241 = auVar26._16_4_;
        auVar68._16_4_ = auVar236._16_4_ * fVar241;
        fVar260 = auVar26._20_4_;
        auVar68._20_4_ = auVar236._20_4_ * fVar260;
        fVar262 = auVar26._24_4_;
        auVar68._24_4_ = auVar236._24_4_ * fVar262;
        auVar68._28_4_ = auVar236._28_4_;
        auVar30 = vsubps_avx(auVar355,auVar68);
        fVar130 = fVar130 + fVar130 * auVar30._0_4_;
        fVar210 = fVar210 + fVar210 * auVar30._4_4_;
        fVar222 = fVar222 + fVar222 * auVar30._8_4_;
        fVar240 = fVar240 + fVar240 * auVar30._12_4_;
        fVar241 = fVar241 + fVar241 * auVar30._16_4_;
        fVar260 = fVar260 + fVar260 * auVar30._20_4_;
        fVar262 = fVar262 + fVar262 * auVar30._24_4_;
        fVar281 = auVar26._28_4_ + auVar30._28_4_;
        auVar252._0_8_ = auVar275._0_8_ ^ 0x8000000080000000;
        auVar252._8_4_ = -auVar275._8_4_;
        auVar252._12_4_ = -auVar275._12_4_;
        auVar252._16_4_ = -auVar275._16_4_;
        auVar252._20_4_ = -auVar275._20_4_;
        auVar252._24_4_ = -auVar275._24_4_;
        auVar252._28_4_ = -auVar275._28_4_;
        auVar26 = vsubps_avx(auVar252,auVar300);
        fVar371 = auVar26._0_4_ * fVar130;
        fVar360 = auVar26._4_4_ * fVar210;
        auVar69._4_4_ = fVar360;
        auVar69._0_4_ = fVar371;
        fVar379 = auVar26._8_4_ * fVar222;
        auVar69._8_4_ = fVar379;
        fVar364 = auVar26._12_4_ * fVar240;
        auVar69._12_4_ = fVar364;
        fVar384 = auVar26._16_4_ * fVar241;
        auVar69._16_4_ = fVar384;
        fVar369 = auVar26._20_4_ * fVar260;
        auVar69._20_4_ = fVar369;
        fVar377 = auVar26._24_4_ * fVar262;
        auVar69._24_4_ = fVar377;
        auVar69._28_4_ = local_a20._28_4_;
        auVar300 = vsubps_avx(auVar300,auVar275);
        fVar130 = auVar300._0_4_ * fVar130;
        fVar210 = auVar300._4_4_ * fVar210;
        auVar70._4_4_ = fVar210;
        auVar70._0_4_ = fVar130;
        fVar222 = auVar300._8_4_ * fVar222;
        auVar70._8_4_ = fVar222;
        fVar240 = auVar300._12_4_ * fVar240;
        auVar70._12_4_ = fVar240;
        fVar241 = auVar300._16_4_ * fVar241;
        auVar70._16_4_ = fVar241;
        fVar260 = auVar300._20_4_ * fVar260;
        auVar70._20_4_ = fVar260;
        fVar262 = auVar300._24_4_ * fVar262;
        auVar70._24_4_ = fVar262;
        auVar70._28_4_ = 0x3f800000;
        fVar283 = fVar245 * (fVar371 * local_560 + fVar362);
        fVar325 = fVar259 * (fVar360 * fStack_55c + fVar366);
        fVar328 = fVar261 * (fVar379 * fStack_558 + fVar375);
        fVar333 = fVar263 * (fVar364 * fStack_554 + fVar380);
        fVar335 = fVar264 * (fVar384 * fStack_550 + fVar385);
        fVar356 = fVar265 * (fVar369 * fStack_54c + fVar125);
        fVar358 = fVar266 * (fVar377 * fStack_548 + fVar127);
        auVar221._0_4_ = local_aa0 + fVar167 * fVar283;
        auVar221._4_4_ = fStack_a9c + fVar225 * fVar325;
        auVar221._8_4_ = fStack_a98 + fVar258 * fVar328;
        auVar221._12_4_ = fStack_a94 + fVar280 * fVar333;
        auVar221._16_4_ = fStack_a90 + fVar289 * fVar335;
        auVar221._20_4_ = fStack_a8c + fVar331 * fVar356;
        auVar221._24_4_ = fStack_a88 + fVar348 * fVar358;
        auVar221._28_4_ = fStack_a84 + auVar300._28_4_ + fVar128;
        auVar71._4_4_ = fStack_37c * fVar360;
        auVar71._0_4_ = local_380 * fVar371;
        auVar71._8_4_ = fStack_378 * fVar379;
        auVar71._12_4_ = fStack_374 * fVar364;
        auVar71._16_4_ = fStack_370 * fVar384;
        auVar71._20_4_ = fStack_36c * fVar369;
        auVar71._24_4_ = fStack_368 * fVar377;
        auVar71._28_4_ = fVar281;
        _local_860 = vsubps_avx(auVar71,auVar221);
        auVar237._0_4_ = fVar172 + fVar161 * fVar283;
        auVar237._4_4_ = fVar198 + fVar223 * fVar325;
        auVar237._8_4_ = fVar201 + fVar242 * fVar328;
        auVar237._12_4_ = fVar204 + fVar243 * fVar333;
        auVar237._16_4_ = fStack_ab0 + fVar285 * fVar335;
        auVar237._20_4_ = fStack_aac + fVar329 * fVar356;
        auVar237._24_4_ = fStack_aa8 + fVar341 * fVar358;
        auVar237._28_4_ = fStack_aa4 + fVar281;
        auVar301._0_4_ = local_640 * fVar371;
        auVar301._4_4_ = fStack_63c * fVar360;
        auVar301._8_4_ = fStack_638 * fVar379;
        auVar301._12_4_ = fStack_634 * fVar364;
        auVar301._16_4_ = fStack_630 * fVar384;
        auVar301._20_4_ = fStack_62c * fVar369;
        auVar301._24_4_ = fStack_628 * fVar377;
        auVar301._28_4_ = 0;
        _local_a40 = vsubps_avx(auVar301,auVar237);
        auVar253._0_4_ = fVar173 + fVar163 * fVar283;
        auVar253._4_4_ = fVar199 + fVar224 * fVar325;
        auVar253._8_4_ = fVar202 + fVar244 * fVar328;
        auVar253._12_4_ = fVar205 + fVar268 * fVar333;
        auVar253._16_4_ = fStack_a70 + fVar287 * fVar335;
        auVar253._20_4_ = fStack_a6c + fVar330 * fVar356;
        auVar253._24_4_ = fStack_a68 + fVar347 * fVar358;
        auVar253._28_4_ = fStack_a64 + auVar26._28_4_;
        auVar72._4_4_ = fStack_65c * fVar360;
        auVar72._0_4_ = local_660 * fVar371;
        auVar72._8_4_ = fStack_658 * fVar379;
        auVar72._12_4_ = fStack_654 * fVar364;
        auVar72._16_4_ = fStack_650 * fVar384;
        auVar72._20_4_ = fStack_64c * fVar369;
        auVar72._24_4_ = fStack_648 * fVar377;
        auVar72._28_4_ = 0;
        _local_8c0 = vsubps_avx(auVar72,auVar253);
        fVar245 = fVar245 * (fVar130 * local_560 + fVar362);
        fVar259 = fVar259 * (fVar210 * fStack_55c + fVar366);
        fVar261 = fVar261 * (fVar222 * fStack_558 + fVar375);
        fVar263 = fVar263 * (fVar240 * fStack_554 + fVar380);
        fVar264 = fVar264 * (fVar241 * fStack_550 + fVar385);
        fVar265 = fVar265 * (fVar260 * fStack_54c + fVar125);
        fVar266 = fVar266 * (fVar262 * fStack_548 + fVar127);
        auVar302._0_4_ = local_aa0 + fVar167 * fVar245;
        auVar302._4_4_ = fStack_a9c + fVar225 * fVar259;
        auVar302._8_4_ = fStack_a98 + fVar258 * fVar261;
        auVar302._12_4_ = fStack_a94 + fVar280 * fVar263;
        auVar302._16_4_ = fStack_a90 + fVar289 * fVar264;
        auVar302._20_4_ = fStack_a8c + fVar331 * fVar265;
        auVar302._24_4_ = fStack_a88 + fVar348 * fVar266;
        auVar302._28_4_ = fStack_a84 + 0.0;
        auVar73._4_4_ = fStack_37c * fVar210;
        auVar73._0_4_ = local_380 * fVar130;
        auVar73._8_4_ = fStack_378 * fVar222;
        auVar73._12_4_ = fStack_374 * fVar240;
        auVar73._16_4_ = fStack_370 * fVar241;
        auVar73._20_4_ = fStack_36c * fVar260;
        auVar73._24_4_ = fStack_368 * fVar262;
        auVar73._28_4_ = fStack_a84;
        _local_5c0 = vsubps_avx(auVar73,auVar302);
        auVar303._0_4_ = fVar172 + fVar161 * fVar245;
        auVar303._4_4_ = fVar198 + fVar223 * fVar259;
        auVar303._8_4_ = fVar201 + fVar242 * fVar261;
        auVar303._12_4_ = fVar204 + fVar243 * fVar263;
        auVar303._16_4_ = fStack_ab0 + fVar285 * fVar264;
        auVar303._20_4_ = fStack_aac + fVar329 * fVar265;
        auVar303._24_4_ = fStack_aa8 + fVar341 * fVar266;
        auVar303._28_4_ = fStack_aa4 + local_5c0._28_4_;
        auVar74._4_4_ = fStack_63c * fVar210;
        auVar74._0_4_ = local_640 * fVar130;
        auVar74._8_4_ = fStack_638 * fVar222;
        auVar74._12_4_ = fStack_634 * fVar240;
        auVar74._16_4_ = fStack_630 * fVar241;
        auVar74._20_4_ = fStack_62c * fVar260;
        auVar74._24_4_ = fStack_628 * fVar262;
        auVar74._28_4_ = fStack_a84;
        _local_5a0 = vsubps_avx(auVar74,auVar303);
        auVar254._0_4_ = fVar173 + fVar163 * fVar245;
        auVar254._4_4_ = fVar199 + fVar224 * fVar259;
        auVar254._8_4_ = fVar202 + fVar244 * fVar261;
        auVar254._12_4_ = fVar205 + fVar268 * fVar263;
        auVar254._16_4_ = fStack_a70 + fVar287 * fVar264;
        auVar254._20_4_ = fStack_a6c + fVar330 * fVar265;
        auVar254._24_4_ = fStack_a68 + fVar347 * fVar266;
        auVar254._28_4_ = fStack_a64 + local_8c0._28_4_ + fVar128;
        auVar75._4_4_ = fStack_65c * fVar210;
        auVar75._0_4_ = local_660 * fVar130;
        auVar75._8_4_ = fStack_658 * fVar222;
        auVar75._12_4_ = fStack_654 * fVar240;
        auVar75._16_4_ = fStack_650 * fVar241;
        auVar75._20_4_ = fStack_64c * fVar260;
        auVar75._24_4_ = fStack_648 * fVar262;
        auVar75._28_4_ = local_5a0._28_4_;
        _local_580 = vsubps_avx(auVar75,auVar254);
        auVar26 = vcmpps_avx(auVar25,_DAT_02020f00,5);
        auVar193._8_4_ = 0x7f800000;
        auVar193._0_8_ = 0x7f8000007f800000;
        auVar193._12_4_ = 0x7f800000;
        auVar193._16_4_ = 0x7f800000;
        auVar193._20_4_ = 0x7f800000;
        auVar193._24_4_ = 0x7f800000;
        auVar193._28_4_ = 0x7f800000;
        auVar192 = vblendvps_avx(auVar193,auVar69,auVar26);
        auVar309._8_4_ = 0x7fffffff;
        auVar309._0_8_ = 0x7fffffff7fffffff;
        auVar309._12_4_ = 0x7fffffff;
        auVar309._16_4_ = 0x7fffffff;
        auVar309._20_4_ = 0x7fffffff;
        auVar309._24_4_ = 0x7fffffff;
        auVar309._28_4_ = 0x7fffffff;
        auVar25 = vandps_avx(auVar309,auVar48);
        auVar25 = vmaxps_avx(local_3c0,auVar25);
        auVar76._4_4_ = auVar25._4_4_ * 1.9073486e-06;
        auVar76._0_4_ = auVar25._0_4_ * 1.9073486e-06;
        auVar76._8_4_ = auVar25._8_4_ * 1.9073486e-06;
        auVar76._12_4_ = auVar25._12_4_ * 1.9073486e-06;
        auVar76._16_4_ = auVar25._16_4_ * 1.9073486e-06;
        auVar76._20_4_ = auVar25._20_4_ * 1.9073486e-06;
        auVar76._24_4_ = auVar25._24_4_ * 1.9073486e-06;
        auVar76._28_4_ = auVar25._28_4_;
        auVar25 = vandps_avx(auVar309,auVar29);
        auVar25 = vcmpps_avx(auVar25,auVar76,1);
        auVar255._8_4_ = 0xff800000;
        auVar255._0_8_ = 0xff800000ff800000;
        auVar255._12_4_ = 0xff800000;
        auVar255._16_4_ = 0xff800000;
        auVar255._20_4_ = 0xff800000;
        auVar255._24_4_ = 0xff800000;
        auVar255._28_4_ = 0xff800000;
        auVar251 = vblendvps_avx(auVar255,auVar70,auVar26);
        auVar29 = auVar26 & auVar25;
        _local_8e0 = auVar121;
        local_680 = local_400;
        if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar29 >> 0x7f,0) != '\0') ||
              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar29 >> 0xbf,0) != '\0') ||
            (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar29[0x1f] < '\0') {
          auVar116 = vandps_avx(auVar25,auVar26);
          auVar141 = vpackssdw_avx(auVar116._0_16_,auVar116._16_16_);
          auVar300 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar29 = vcmpps_avx(local_6e0,auVar300,2);
          auVar392._8_4_ = 0xff800000;
          auVar392._0_8_ = 0xff800000ff800000;
          auVar392._12_4_ = 0xff800000;
          auVar392._16_4_ = 0xff800000;
          auVar392._20_4_ = 0xff800000;
          auVar392._24_4_ = 0xff800000;
          auVar392._28_4_ = 0xff800000;
          auVar394._8_4_ = 0x7f800000;
          auVar394._0_8_ = 0x7f8000007f800000;
          auVar394._12_4_ = 0x7f800000;
          auVar394._16_4_ = 0x7f800000;
          auVar394._20_4_ = 0x7f800000;
          auVar394._24_4_ = 0x7f800000;
          auVar394._28_4_ = 0x7f800000;
          auVar25 = vblendvps_avx(auVar394,auVar392,auVar29);
          auVar111 = vpmovsxwd_avx(auVar141);
          auVar141 = vpunpckhwd_avx(auVar141,auVar141);
          auVar311._16_16_ = auVar141;
          auVar311._0_16_ = auVar111;
          auVar192 = vblendvps_avx(auVar192,auVar25,auVar311);
          auVar25 = vblendvps_avx(auVar392,auVar394,auVar29);
          auVar251 = vblendvps_avx(auVar251,auVar25,auVar311);
          auVar25 = vcmpps_avx(auVar300,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
          auVar159._0_4_ = auVar25._0_4_ ^ auVar116._0_4_;
          auVar159._4_4_ = auVar25._4_4_ ^ auVar116._4_4_;
          auVar159._8_4_ = auVar25._8_4_ ^ auVar116._8_4_;
          auVar159._12_4_ = auVar25._12_4_ ^ auVar116._12_4_;
          auVar159._16_4_ = auVar25._16_4_ ^ auVar116._16_4_;
          auVar159._20_4_ = auVar25._20_4_ ^ auVar116._20_4_;
          auVar159._24_4_ = auVar25._24_4_ ^ auVar116._24_4_;
          auVar159._28_4_ = auVar25._28_4_ ^ auVar116._28_4_;
          auVar116 = vorps_avx(auVar29,auVar159);
          auVar116 = vandps_avx(auVar26,auVar116);
        }
      }
      auVar374 = ZEXT3264(_local_a20);
      fVar130 = (ray->dir).field_0.m128[0];
      fVar161 = (ray->dir).field_0.m128[1];
      fVar163 = (ray->dir).field_0.m128[2];
      local_3e0 = vminps_avx(local_420,auVar192);
      _local_600 = vmaxps_avx(local_400,auVar251);
      auVar339 = ZEXT3264(_local_600);
      _local_440 = _local_600;
      auVar25 = vcmpps_avx(local_400,local_3e0,2);
      local_4c0 = vandps_avx(auVar25,auVar121);
      auVar26 = vcmpps_avx(_local_600,local_420,2);
      local_520 = vandps_avx(auVar26,auVar121);
      auVar121 = vorps_avx(local_520,local_4c0);
      auVar346 = ZEXT3264(_local_8a0);
      if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar121 >> 0x7f,0) == '\0') &&
            (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar121 >> 0xbf,0) == '\0') &&
          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar121[0x1f]) {
        auVar304 = ZEXT464(0) << 0x20;
        auVar312 = ZEXT3264(_local_780);
      }
      else {
        auVar121 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        local_260._0_4_ = auVar116._0_4_ ^ auVar121._0_4_;
        local_260._4_4_ = auVar116._4_4_ ^ auVar121._4_4_;
        local_260._8_4_ = auVar116._8_4_ ^ auVar121._8_4_;
        local_260._12_4_ = auVar116._12_4_ ^ auVar121._12_4_;
        local_260._16_4_ = auVar116._16_4_ ^ auVar121._16_4_;
        local_260._20_4_ = auVar116._20_4_ ^ auVar121._20_4_;
        local_260._24_4_ = auVar116._24_4_ ^ auVar121._24_4_;
        local_260._28_4_ = (uint)auVar116._28_4_ ^ (uint)auVar121._28_4_;
        auVar120._0_4_ =
             fVar130 * (float)local_860._0_4_ +
             fVar161 * (float)local_a40._0_4_ + fVar163 * (float)local_8c0._0_4_;
        auVar120._4_4_ =
             fVar130 * (float)local_860._4_4_ +
             fVar161 * (float)local_a40._4_4_ + fVar163 * (float)local_8c0._4_4_;
        auVar120._8_4_ = fVar130 * fStack_858 + fVar161 * fStack_a38 + fVar163 * fStack_8b8;
        auVar120._12_4_ = fVar130 * fStack_854 + fVar161 * fStack_a34 + fVar163 * fStack_8b4;
        auVar120._16_4_ = fVar130 * fStack_850 + fVar161 * fStack_a30 + fVar163 * fStack_8b0;
        auVar120._20_4_ = fVar130 * fStack_84c + fVar161 * fStack_a2c + fVar163 * fStack_8ac;
        auVar120._24_4_ = fVar130 * fStack_848 + fVar161 * fStack_a28 + fVar163 * fStack_8a8;
        auVar120._28_4_ = auVar121._28_4_ + auVar116._28_4_ + auVar25._28_4_;
        auVar147._8_4_ = 0x7fffffff;
        auVar147._0_8_ = 0x7fffffff7fffffff;
        auVar147._12_4_ = 0x7fffffff;
        auVar147._16_4_ = 0x7fffffff;
        auVar147._20_4_ = 0x7fffffff;
        auVar147._24_4_ = 0x7fffffff;
        auVar147._28_4_ = 0x7fffffff;
        auVar121 = vandps_avx(auVar120,auVar147);
        auVar148._8_4_ = 0x3e99999a;
        auVar148._0_8_ = 0x3e99999a3e99999a;
        auVar148._12_4_ = 0x3e99999a;
        auVar148._16_4_ = 0x3e99999a;
        auVar148._20_4_ = 0x3e99999a;
        auVar148._24_4_ = 0x3e99999a;
        auVar148._28_4_ = 0x3e99999a;
        auVar121 = vcmpps_avx(auVar121,auVar148,1);
        auVar121 = vorps_avx(auVar121,local_260);
        auVar149._8_4_ = 3;
        auVar149._0_8_ = 0x300000003;
        auVar149._12_4_ = 3;
        auVar149._16_4_ = 3;
        auVar149._20_4_ = 3;
        auVar149._24_4_ = 3;
        auVar149._28_4_ = 3;
        auVar194._8_4_ = 2;
        auVar194._0_8_ = 0x200000002;
        auVar194._12_4_ = 2;
        auVar194._16_4_ = 2;
        auVar194._20_4_ = 2;
        auVar194._24_4_ = 2;
        auVar194._28_4_ = 2;
        auVar121 = vblendvps_avx(auVar194,auVar149,auVar121);
        local_4e0 = ZEXT432((uint)local_540);
        local_460 = vpshufd_avx(ZEXT416((uint)local_540),0);
        auVar141 = vpcmpgtd_avx(auVar121._16_16_,local_460);
        auVar111 = vpcmpgtd_avx(auVar121._0_16_,local_460);
        auVar150._16_16_ = auVar141;
        auVar150._0_16_ = auVar111;
        auVar121 = vblendps_avx(ZEXT1632(auVar111),auVar150,0xf0);
        local_500 = vandnps_avx(auVar121,local_4c0);
        auVar304 = ZEXT3264(local_500);
        auVar116 = local_4c0 & ~auVar121;
        auStack_538 = auVar28._8_24_;
        local_5e0 = auVar121;
        if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar116 >> 0x7f,0) == '\0') &&
              (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar116 >> 0xbf,0) == '\0') &&
            (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar116[0x1f]) {
          auVar239 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar312 = ZEXT3264(_local_780);
          uVar97 = local_540;
          auVar25 = local_520;
          fVar167 = fVar161;
          fVar210 = fVar161;
          fVar222 = fVar161;
          fVar223 = fVar161;
          fVar224 = fVar161;
          fVar225 = fVar161;
          fVar240 = fVar130;
          fVar241 = fVar130;
          fVar242 = fVar130;
          fVar244 = fVar130;
          fVar258 = fVar130;
          fVar260 = fVar130;
          fVar262 = fVar163;
          fVar243 = fVar163;
          fVar268 = fVar163;
          fVar280 = fVar163;
          fVar281 = fVar163;
          fVar283 = fVar163;
        }
        else {
          local_560 = local_400._0_4_ + (float)local_700._0_4_;
          fStack_55c = local_400._4_4_ + (float)local_700._4_4_;
          fStack_558 = local_400._8_4_ + fStack_6f8;
          fStack_554 = local_400._12_4_ + fStack_6f4;
          fStack_550 = local_400._16_4_ + fStack_6f0;
          fStack_54c = local_400._20_4_ + fStack_6ec;
          fStack_548 = local_400._24_4_ + fStack_6e8;
          fStack_544 = local_400._28_4_ + fStack_6e4;
          auVar239 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_7e0._4_4_ = fVar130;
          local_7e0._0_4_ = fVar130;
          fStack_7d8 = fVar130;
          fStack_7d4 = fVar130;
          fStack_7d0 = fVar130;
          fStack_7cc = fVar130;
          fStack_7c8 = fVar130;
          fStack_7c4 = fVar130;
          local_800._4_4_ = fVar163;
          local_800._0_4_ = fVar163;
          fStack_7f8 = fVar163;
          fStack_7f4 = fVar163;
          fStack_7f0 = fVar163;
          fStack_7ec = fVar163;
          fStack_7e8 = fVar163;
          fStack_7e4 = fVar163;
          local_880._4_4_ = fVar161;
          local_880._0_4_ = fVar161;
          fStack_878 = fVar161;
          fStack_874 = fVar161;
          fStack_870 = fVar161;
          fStack_86c = fVar161;
          fStack_868 = fVar161;
          fStack_864 = fVar161;
          local_a00 = local_520;
          local_680 = local_400;
          do {
            auVar228 = auVar239._0_16_;
            auVar151._8_4_ = 0x7f800000;
            auVar151._0_8_ = 0x7f8000007f800000;
            auVar151._12_4_ = 0x7f800000;
            auVar151._16_4_ = 0x7f800000;
            auVar151._20_4_ = 0x7f800000;
            auVar151._24_4_ = 0x7f800000;
            auVar151._28_4_ = 0x7f800000;
            auVar121 = auVar304._0_32_;
            auVar116 = vblendvps_avx(auVar151,local_680,auVar121);
            auVar28 = vshufps_avx(auVar116,auVar116,0xb1);
            auVar28 = vminps_avx(auVar116,auVar28);
            auVar25 = vshufpd_avx(auVar28,auVar28,5);
            auVar28 = vminps_avx(auVar28,auVar25);
            auVar25 = vperm2f128_avx(auVar28,auVar28,1);
            auVar28 = vminps_avx(auVar28,auVar25);
            auVar116 = vcmpps_avx(auVar116,auVar28,0);
            auVar28 = auVar121 & auVar116;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0x7f,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0xbf,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar28[0x1f] < '\0') {
              auVar121 = vandps_avx(auVar116,auVar121);
            }
            uVar101 = vmovmskps_avx(auVar121);
            uVar95 = 0;
            if (uVar101 != 0) {
              for (; (uVar101 >> uVar95 & 1) == 0; uVar95 = uVar95 + 1) {
              }
            }
            uVar97 = (ulong)uVar95;
            *(undefined4 *)(local_500 + uVar97 * 4) = 0;
            aVar11 = (ray->dir).field_0;
            _local_a40 = (undefined1  [16])aVar11;
            auVar141 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
            local_a80 = local_480[uVar97];
            uStack_a7c = 0;
            uStack_a78 = 0;
            uStack_a74 = 0;
            local_ac0 = *(float *)(local_400 + uVar97 * 4);
            uStack_abc = 0;
            uStack_ab8 = 0;
            uStack_ab4 = 0;
            if (auVar141._0_4_ < 0.0) {
              fVar130 = sqrtf(auVar141._0_4_);
              auVar228._8_4_ = 0x7fffffff;
              auVar228._0_8_ = 0x7fffffff7fffffff;
              auVar228._12_4_ = 0x7fffffff;
            }
            else {
              auVar141 = vsqrtss_avx(auVar141,auVar141);
              fVar130 = auVar141._0_4_;
            }
            auVar111 = vminps_avx(_local_920,_local_940);
            auVar141 = vmaxps_avx(_local_920,_local_940);
            auVar185 = vminps_avx(_local_930,_local_950);
            auVar138 = vminps_avx(auVar111,auVar185);
            auVar111 = vmaxps_avx(_local_930,_local_950);
            auVar185 = vmaxps_avx(auVar141,auVar111);
            auVar141 = vandps_avx(auVar138,auVar228);
            auVar111 = vandps_avx(auVar185,auVar228);
            auVar141 = vmaxps_avx(auVar141,auVar111);
            auVar111 = vmovshdup_avx(auVar141);
            auVar111 = vmaxss_avx(auVar111,auVar141);
            auVar141 = vshufpd_avx(auVar141,auVar141,1);
            auVar141 = vmaxss_avx(auVar141,auVar111);
            local_8c0._0_4_ = auVar141._0_4_ * 1.9073486e-06;
            local_7a0._0_4_ = fVar130 * 1.9073486e-06;
            _local_620 = vshufps_avx(auVar185,auVar185,0xff);
            lVar100 = 5;
            auVar304 = ZEXT1664(CONCAT412(uStack_ab4,
                                          CONCAT48(uStack_ab8,CONCAT44(uStack_abc,local_ac0))));
            do {
              local_ac0 = auVar304._0_4_;
              uStack_abc = auVar304._4_4_;
              uStack_ab8 = auVar304._8_4_;
              uStack_ab4 = auVar304._12_4_;
              auVar141 = vshufps_avx(auVar304._0_16_,auVar304._0_16_,0);
              auVar106._0_4_ = auVar141._0_4_ * (float)local_a40._0_4_ + 0.0;
              auVar106._4_4_ = auVar141._4_4_ * (float)local_a40._4_4_ + 0.0;
              auVar106._8_4_ = auVar141._8_4_ * fStack_a38 + 0.0;
              auVar106._12_4_ = auVar141._12_4_ * fStack_a34 + 0.0;
              local_9e0._0_4_ = 1.0 - local_a80;
              fVar161 = local_a80 * local_a80;
              fVar163 = local_a80 * 3.0;
              fVar130 = fVar163 + -5.0;
              local_9a0._0_4_ = (float)local_9e0._0_4_ * (float)local_9e0._0_4_;
              auVar141 = ZEXT416((uint)(local_a80 * local_a80 * -(float)local_9e0._0_4_ * 0.5));
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              auVar111 = ZEXT416((uint)(((float)local_9e0._0_4_ * (float)local_9e0._0_4_ *
                                         ((float)local_9e0._0_4_ * 3.0 + -5.0) + 2.0) * 0.5));
              auVar111 = vshufps_avx(auVar111,auVar111,0);
              auVar185 = ZEXT416((uint)((fVar161 * fVar130 + 2.0) * 0.5));
              auVar185 = vshufps_avx(auVar185,auVar185,0);
              auVar138 = ZEXT416((uint)((float)local_9e0._0_4_ * (float)local_9e0._0_4_ * -local_a80
                                       * 0.5));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar181._0_4_ =
                   auVar138._0_4_ * (float)local_920._0_4_ +
                   auVar185._0_4_ * (float)local_940._0_4_ +
                   auVar111._0_4_ * (float)local_930._0_4_ + auVar141._0_4_ * (float)local_950._0_4_
              ;
              auVar181._4_4_ =
                   auVar138._4_4_ * (float)local_920._4_4_ +
                   auVar185._4_4_ * (float)local_940._4_4_ +
                   auVar111._4_4_ * (float)local_930._4_4_ + auVar141._4_4_ * (float)local_950._4_4_
              ;
              auVar181._8_4_ =
                   auVar138._8_4_ * fStack_918 +
                   auVar185._8_4_ * fStack_938 +
                   auVar111._8_4_ * fStack_928 + auVar141._8_4_ * fStack_948;
              auVar181._12_4_ =
                   auVar138._12_4_ * fStack_914 +
                   auVar185._12_4_ * fStack_934 +
                   auVar111._12_4_ * fStack_924 + auVar141._12_4_ * fStack_944;
              fVar167 = (float)local_9e0._0_4_ * -2.0;
              local_6e0._0_16_ = auVar181;
              auVar141 = vsubps_avx(auVar106,auVar181);
              _local_8e0 = auVar141;
              auVar141 = vdpps_avx(auVar141,auVar141,0x7f);
              local_aa0 = local_a80 * -9.0 + 4.0;
              fStack_a9c = 0.0;
              fStack_a98 = 0.0;
              fStack_a94 = 0.0;
              _local_860 = auVar141;
              local_980._0_16_ = ZEXT416((uint)(fVar163 + -1.0));
              if (auVar141._0_4_ < 0.0) {
                local_9c0._0_4_ = fVar161;
                local_9e0._0_16_ = ZEXT416((uint)local_9e0._0_4_);
                local_7c0._0_4_ = fVar163;
                local_720._0_4_ = local_a80 * 9.0;
                local_740._0_4_ = fVar130;
                local_760._0_4_ = fVar167;
                fVar210 = sqrtf(auVar141._0_4_);
                fVar130 = (float)local_740._0_4_;
                fVar167 = (float)local_760._0_4_;
                fVar161 = (float)local_9c0._0_4_;
                fVar163 = (float)local_7c0._0_4_;
                fVar222 = (float)local_720._0_4_;
              }
              else {
                auVar141 = vsqrtss_avx(auVar141,auVar141);
                fVar210 = auVar141._0_4_;
                fVar222 = local_a80 * 9.0;
              }
              auVar141 = ZEXT416((uint)((fVar161 + fVar167 * local_a80) * 0.5));
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              auVar111 = ZEXT416((uint)((((float)local_9e0._0_4_ + (float)local_9e0._0_4_) *
                                         (fVar163 + 2.0) +
                                        (float)local_9e0._0_4_ * (float)local_9e0._0_4_ * -3.0) *
                                       0.5));
              auVar111 = vshufps_avx(auVar111,auVar111,0);
              auVar185 = ZEXT416((uint)((fVar130 * (local_a80 + local_a80) + local_a80 * fVar163) *
                                       0.5));
              auVar185 = vshufps_avx(auVar185,auVar185,0);
              auVar138 = ZEXT416((uint)((local_a80 *
                                         ((float)local_9e0._0_4_ + (float)local_9e0._0_4_) -
                                        (float)local_9a0._0_4_) * 0.5));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar351._0_4_ =
                   (float)local_920._0_4_ * auVar138._0_4_ +
                   (float)local_940._0_4_ * auVar185._0_4_ +
                   (float)local_950._0_4_ * auVar141._0_4_ + (float)local_930._0_4_ * auVar111._0_4_
              ;
              auVar351._4_4_ =
                   (float)local_920._4_4_ * auVar138._4_4_ +
                   (float)local_940._4_4_ * auVar185._4_4_ +
                   (float)local_950._4_4_ * auVar141._4_4_ + (float)local_930._4_4_ * auVar111._4_4_
              ;
              auVar351._8_4_ =
                   fStack_918 * auVar138._8_4_ +
                   fStack_938 * auVar185._8_4_ +
                   fStack_948 * auVar141._8_4_ + fStack_928 * auVar111._8_4_;
              auVar351._12_4_ =
                   fStack_914 * auVar138._12_4_ +
                   fStack_934 * auVar185._12_4_ +
                   fStack_944 * auVar141._12_4_ + fStack_924 * auVar111._12_4_;
              auVar138 = vpermilps_avx(local_980._0_16_,0);
              auVar86._4_4_ = fStack_a9c;
              auVar86._0_4_ = local_aa0;
              auVar86._8_4_ = fStack_a98;
              auVar86._12_4_ = fStack_a94;
              auVar17 = vpermilps_avx(auVar86,0);
              auVar141 = vshufps_avx(ZEXT416((uint)(fVar222 + -5.0)),ZEXT416((uint)(fVar222 + -5.0))
                                     ,0);
              auVar111 = ZEXT416((uint)(local_a80 * -3.0 + 2.0));
              auVar185 = vshufps_avx(auVar111,auVar111,0);
              auVar111 = vdpps_avx(auVar351,auVar351,0x7f);
              auVar134._0_4_ =
                   (float)local_920._0_4_ * auVar185._0_4_ +
                   (float)local_940._0_4_ * auVar141._0_4_ +
                   (float)local_930._0_4_ * auVar17._0_4_ + (float)local_950._0_4_ * auVar138._0_4_;
              auVar134._4_4_ =
                   (float)local_920._4_4_ * auVar185._4_4_ +
                   (float)local_940._4_4_ * auVar141._4_4_ +
                   (float)local_930._4_4_ * auVar17._4_4_ + (float)local_950._4_4_ * auVar138._4_4_;
              auVar134._8_4_ =
                   fStack_918 * auVar185._8_4_ +
                   fStack_938 * auVar141._8_4_ +
                   fStack_928 * auVar17._8_4_ + fStack_948 * auVar138._8_4_;
              auVar134._12_4_ =
                   fStack_914 * auVar185._12_4_ +
                   fStack_934 * auVar141._12_4_ +
                   fStack_924 * auVar17._12_4_ + fStack_944 * auVar138._12_4_;
              auVar141 = vblendps_avx(auVar111,_DAT_01feba10,0xe);
              auVar185 = vrsqrtss_avx(auVar141,auVar141);
              fVar161 = auVar185._0_4_;
              fVar130 = auVar111._0_4_;
              auVar185 = vdpps_avx(auVar351,auVar134,0x7f);
              auVar138 = vshufps_avx(auVar111,auVar111,0);
              auVar135._0_4_ = auVar134._0_4_ * auVar138._0_4_;
              auVar135._4_4_ = auVar134._4_4_ * auVar138._4_4_;
              auVar135._8_4_ = auVar134._8_4_ * auVar138._8_4_;
              auVar135._12_4_ = auVar134._12_4_ * auVar138._12_4_;
              auVar185 = vshufps_avx(auVar185,auVar185,0);
              auVar229._0_4_ = auVar351._0_4_ * auVar185._0_4_;
              auVar229._4_4_ = auVar351._4_4_ * auVar185._4_4_;
              auVar229._8_4_ = auVar351._8_4_ * auVar185._8_4_;
              auVar229._12_4_ = auVar351._12_4_ * auVar185._12_4_;
              auVar138 = vsubps_avx(auVar135,auVar229);
              auVar185 = vrcpss_avx(auVar141,auVar141);
              auVar141 = vmaxss_avx(ZEXT416((uint)local_8c0._0_4_),
                                    ZEXT416((uint)((float)local_7a0._0_4_ * local_ac0)));
              local_aa0 = auVar141._0_4_;
              auVar141 = ZEXT416((uint)(auVar185._0_4_ * (2.0 - fVar130 * auVar185._0_4_)));
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              uVar97 = CONCAT44(auVar351._4_4_,auVar351._0_4_);
              auVar273._0_8_ = uVar97 ^ 0x8000000080000000;
              auVar273._8_4_ = -auVar351._8_4_;
              auVar273._12_4_ = -auVar351._12_4_;
              auVar185 = ZEXT416((uint)(fVar161 * 1.5 + fVar130 * -0.5 * fVar161 * fVar161 * fVar161
                                       ));
              auVar185 = vshufps_avx(auVar185,auVar185,0);
              auVar214._0_4_ = auVar185._0_4_ * auVar138._0_4_ * auVar141._0_4_;
              auVar214._4_4_ = auVar185._4_4_ * auVar138._4_4_ * auVar141._4_4_;
              auVar214._8_4_ = auVar185._8_4_ * auVar138._8_4_ * auVar141._8_4_;
              auVar214._12_4_ = auVar185._12_4_ * auVar138._12_4_ * auVar141._12_4_;
              local_980._0_16_ = auVar351;
              local_9e0._0_4_ = auVar351._0_4_ * auVar185._0_4_;
              local_9e0._4_4_ = auVar351._4_4_ * auVar185._4_4_;
              local_9e0._8_4_ = auVar351._8_4_ * auVar185._8_4_;
              local_9e0._12_4_ = auVar351._12_4_ * auVar185._12_4_;
              if (fVar130 < 0.0) {
                local_9a0._0_4_ = fVar210;
                local_9c0._0_16_ = auVar273;
                local_7c0._0_16_ = auVar214;
                fVar130 = sqrtf(fVar130);
                auVar214 = local_7c0._0_16_;
                auVar273 = local_9c0._0_16_;
              }
              else {
                auVar141 = vsqrtss_avx(auVar111,auVar111);
                fVar130 = auVar141._0_4_;
                local_9a0._0_4_ = fVar210;
              }
              auVar141 = vdpps_avx(_local_8e0,local_9e0._0_16_,0x7f);
              local_9c0._0_4_ =
                   ((float)local_8c0._0_4_ / fVar130) * ((float)local_9a0._0_4_ + 1.0) +
                   (float)local_9a0._0_4_ * (float)local_8c0._0_4_ + local_aa0;
              auVar111 = vdpps_avx(auVar273,local_9e0._0_16_,0x7f);
              auVar185 = vdpps_avx(_local_8e0,auVar214,0x7f);
              auVar138 = vdpps_avx(_local_a40,local_9e0._0_16_,0x7f);
              auVar17 = vdpps_avx(_local_8e0,auVar273,0x7f);
              fVar130 = auVar111._0_4_ + auVar185._0_4_;
              fVar161 = auVar141._0_4_;
              auVar107._0_4_ = fVar161 * fVar161;
              auVar107._4_4_ = auVar141._4_4_ * auVar141._4_4_;
              auVar107._8_4_ = auVar141._8_4_ * auVar141._8_4_;
              auVar107._12_4_ = auVar141._12_4_ * auVar141._12_4_;
              auVar185 = vsubps_avx(_local_860,auVar107);
              local_9e0._0_16_ = ZEXT416((uint)fVar130);
              auVar111 = vdpps_avx(_local_8e0,_local_a40,0x7f);
              fVar163 = auVar17._0_4_ - fVar161 * fVar130;
              local_9a0._0_16_ = auVar141;
              fVar161 = auVar111._0_4_ - auVar138._0_4_ * fVar161;
              auVar141 = vrsqrtss_avx(auVar185,auVar185);
              fVar167 = auVar185._0_4_;
              fVar130 = auVar141._0_4_;
              fVar130 = fVar130 * 1.5 + fVar167 * -0.5 * fVar130 * fVar130 * fVar130;
              if (fVar167 < 0.0) {
                local_7c0._0_16_ = auVar138;
                local_720._0_4_ = fVar163;
                local_740._0_4_ = fVar161;
                local_760._0_4_ = fVar130;
                fVar167 = sqrtf(fVar167);
                fVar130 = (float)local_760._0_4_;
                fVar163 = (float)local_720._0_4_;
                fVar161 = (float)local_740._0_4_;
                auVar138 = local_7c0._0_16_;
              }
              else {
                auVar141 = vsqrtss_avx(auVar185,auVar185);
                fVar167 = auVar141._0_4_;
              }
              auVar339 = ZEXT3264(_local_a20);
              auVar312 = ZEXT3264(_local_780);
              auVar185 = vpermilps_avx(local_6e0._0_16_,0xff);
              auVar17 = vpermilps_avx(local_980._0_16_,0xff);
              fVar163 = fVar163 * fVar130 - auVar17._0_4_;
              auVar230._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
              auVar230._8_4_ = auVar138._8_4_ ^ 0x80000000;
              auVar230._12_4_ = auVar138._12_4_ ^ 0x80000000;
              auVar247._0_4_ = -fVar163;
              auVar247._4_4_ = 0x80000000;
              auVar247._8_4_ = 0x80000000;
              auVar247._12_4_ = 0x80000000;
              auVar141 = vinsertps_avx(ZEXT416((uint)(fVar161 * fVar130)),auVar230,0x10);
              auVar111 = vmovsldup_avx(ZEXT416((uint)(local_9e0._0_4_ * fVar161 * fVar130 -
                                                     auVar138._0_4_ * fVar163)));
              auVar141 = vdivps_avx(auVar141,auVar111);
              auVar138 = ZEXT416((uint)(fVar167 - auVar185._0_4_));
              auVar185 = vinsertps_avx(local_9a0._0_16_,auVar138,0x10);
              auVar215._0_4_ = auVar185._0_4_ * auVar141._0_4_;
              auVar215._4_4_ = auVar185._4_4_ * auVar141._4_4_;
              auVar215._8_4_ = auVar185._8_4_ * auVar141._8_4_;
              auVar215._12_4_ = auVar185._12_4_ * auVar141._12_4_;
              auVar141 = vinsertps_avx(auVar247,local_9e0._0_16_,0x1c);
              auVar141 = vdivps_avx(auVar141,auVar111);
              auVar111 = vhaddps_avx(auVar215,auVar215);
              auVar182._0_4_ = auVar185._0_4_ * auVar141._0_4_;
              auVar182._4_4_ = auVar185._4_4_ * auVar141._4_4_;
              auVar182._8_4_ = auVar185._8_4_ * auVar141._8_4_;
              auVar182._12_4_ = auVar185._12_4_ * auVar141._12_4_;
              auVar141 = vhaddps_avx(auVar182,auVar182);
              local_a80 = local_a80 - auVar111._0_4_;
              uStack_a7c = 0;
              uStack_a78 = 0;
              uStack_a74 = 0;
              local_ac0 = local_ac0 - auVar141._0_4_;
              auVar304 = ZEXT464((uint)local_ac0);
              auVar231._8_4_ = 0x7fffffff;
              auVar231._0_8_ = 0x7fffffff7fffffff;
              auVar231._12_4_ = 0x7fffffff;
              auVar239 = ZEXT1664(auVar231);
              auVar141 = vandps_avx(local_9a0._0_16_,auVar231);
              bVar64 = true;
              fVar167 = (float)local_880._4_4_;
              fVar210 = fStack_878;
              fVar222 = fStack_874;
              fVar223 = fStack_870;
              fVar224 = fStack_86c;
              fVar225 = fStack_868;
              fVar161 = (float)local_880._0_4_;
              fVar240 = (float)local_7e0._4_4_;
              fVar241 = fStack_7d8;
              fVar242 = fStack_7d4;
              fVar244 = fStack_7d0;
              fVar258 = fStack_7cc;
              fVar260 = fStack_7c8;
              fVar130 = (float)local_7e0._0_4_;
              fVar262 = (float)local_800._4_4_;
              fVar243 = fStack_7f8;
              fVar268 = fStack_7f4;
              fVar280 = fStack_7f0;
              fVar281 = fStack_7ec;
              fVar283 = fStack_7e8;
              fVar163 = (float)local_800._0_4_;
              if ((float)local_9c0._0_4_ <= auVar141._0_4_) {
                auVar374 = ZEXT3264(_local_a20);
                auVar346 = ZEXT3264(_local_8a0);
              }
              else {
                auVar141 = vandps_avx(auVar138,auVar231);
                if (auVar141._0_4_ <
                    (float)local_620._0_4_ * 1.9073486e-06 + (float)local_9c0._0_4_ + local_aa0) {
                  local_ac0 = local_ac0 + (float)local_6b0._0_4_;
                  if ((((ray->org).field_0.m128[3] <= local_ac0) &&
                      (fVar285 = ray->tfar, local_ac0 <= fVar285)) &&
                     (local_aa0 = fVar285, 0.0 <= local_a80)) {
                    auVar374 = ZEXT3264(_local_a20);
                    if (1.0 < local_a80) {
LAB_0106b7c5:
                      unaff_R14B = 0;
                    }
                    else {
                      uStack_abc = 0;
                      uStack_ab8 = 0;
                      uStack_ab4 = 0;
                      auVar141 = vrsqrtss_avx(_local_860,_local_860);
                      fVar285 = auVar141._0_4_;
                      pGVar13 = (context->scene->geometries).items[local_a48].ptr;
                      if ((pGVar13->mask & ray->mask) == 0) goto LAB_0106b7c5;
                      auVar346 = ZEXT3264(_local_8a0);
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar141 = ZEXT416((uint)(fVar285 * 1.5 +
                                                 local_860._0_4_ * -0.5 * fVar285 *
                                                 fVar285 * fVar285));
                        auVar141 = vshufps_avx(auVar141,auVar141,0);
                        auVar136._0_4_ = auVar141._0_4_ * (float)local_8e0._0_4_;
                        auVar136._4_4_ = auVar141._4_4_ * (float)local_8e0._4_4_;
                        auVar136._8_4_ = auVar141._8_4_ * fStack_8d8;
                        auVar136._12_4_ = auVar141._12_4_ * fStack_8d4;
                        auVar108._0_4_ = local_980._0_4_ + auVar17._0_4_ * auVar136._0_4_;
                        auVar108._4_4_ = local_980._4_4_ + auVar17._4_4_ * auVar136._4_4_;
                        auVar108._8_4_ = local_980._8_4_ + auVar17._8_4_ * auVar136._8_4_;
                        auVar108._12_4_ = local_980._12_4_ + auVar17._12_4_ * auVar136._12_4_;
                        auVar141 = vshufps_avx(auVar136,auVar136,0xc9);
                        auVar111 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xc9);
                        auVar137._0_4_ = auVar111._0_4_ * auVar136._0_4_;
                        auVar137._4_4_ = auVar111._4_4_ * auVar136._4_4_;
                        auVar137._8_4_ = auVar111._8_4_ * auVar136._8_4_;
                        auVar137._12_4_ = auVar111._12_4_ * auVar136._12_4_;
                        auVar183._0_4_ = local_980._0_4_ * auVar141._0_4_;
                        auVar183._4_4_ = local_980._4_4_ * auVar141._4_4_;
                        auVar183._8_4_ = local_980._8_4_ * auVar141._8_4_;
                        auVar183._12_4_ = local_980._12_4_ * auVar141._12_4_;
                        auVar185 = vsubps_avx(auVar183,auVar137);
                        auVar141 = vshufps_avx(auVar185,auVar185,0xc9);
                        auVar111 = vshufps_avx(auVar108,auVar108,0xc9);
                        auVar184._0_4_ = auVar111._0_4_ * auVar141._0_4_;
                        auVar184._4_4_ = auVar111._4_4_ * auVar141._4_4_;
                        auVar184._8_4_ = auVar111._8_4_ * auVar141._8_4_;
                        auVar184._12_4_ = auVar111._12_4_ * auVar141._12_4_;
                        auVar141 = vshufps_avx(auVar185,auVar185,0xd2);
                        auVar109._0_4_ = auVar108._0_4_ * auVar141._0_4_;
                        auVar109._4_4_ = auVar108._4_4_ * auVar141._4_4_;
                        auVar109._8_4_ = auVar108._8_4_ * auVar141._8_4_;
                        auVar109._12_4_ = auVar108._12_4_ * auVar141._12_4_;
                        auVar111 = vsubps_avx(auVar184,auVar109);
                        auVar141 = vshufps_avx(auVar111,auVar111,0xe9);
                        local_840 = vmovlps_avx(auVar141);
                        local_838 = auVar111._0_4_;
                        local_830 = 0;
                        local_82c = (undefined4)local_808;
                        local_828 = (undefined4)local_a48;
                        local_824 = context->user->instID[0];
                        local_820 = context->user->instPrimID[0];
                        auVar304 = ZEXT464((uint)local_ac0);
                        ray->tfar = local_ac0;
                        local_ac4 = -1;
                        local_910.valid = &local_ac4;
                        local_910.geometryUserPtr = pGVar13->userPtr;
                        local_910.context = context->user;
                        local_910.hit = (RTCHitN *)&local_840;
                        local_910.N = 1;
                        local_910.ray = (RTCRayN *)ray;
                        local_834 = local_a80;
                        if (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0106b983:
                          p_Var16 = context->args->filter;
                          fVar161 = (float)local_880._0_4_;
                          fVar167 = (float)local_880._4_4_;
                          fVar210 = fStack_878;
                          fVar222 = fStack_874;
                          fVar223 = fStack_870;
                          fVar224 = fStack_86c;
                          fVar225 = fStack_868;
                          fVar130 = (float)local_7e0._0_4_;
                          fVar240 = (float)local_7e0._4_4_;
                          fVar241 = fStack_7d8;
                          fVar242 = fStack_7d4;
                          fVar244 = fStack_7d0;
                          fVar258 = fStack_7cc;
                          fVar260 = fStack_7c8;
                          fVar163 = (float)local_800._0_4_;
                          fVar262 = (float)local_800._4_4_;
                          fVar243 = fStack_7f8;
                          fVar268 = fStack_7f4;
                          fVar280 = fStack_7f0;
                          fVar281 = fStack_7ec;
                          fVar283 = fStack_7e8;
                          if (p_Var16 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar13->field_8).field_0x2 & 0x40) != 0)) {
                              auVar339 = ZEXT1664(auVar339._0_16_);
                              (*p_Var16)(&local_910);
                              auVar304 = ZEXT1664(CONCAT412(uStack_ab4,
                                                            CONCAT48(uStack_ab8,
                                                                     CONCAT44(uStack_abc,local_ac0))
                                                           ));
                              auVar312 = ZEXT3264(_local_780);
                              auVar346 = ZEXT3264(_local_8a0);
                              auVar374 = ZEXT3264(_local_a20);
                              auVar239 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              fVar161 = (float)local_880._0_4_;
                              fVar167 = (float)local_880._4_4_;
                              fVar210 = fStack_878;
                              fVar222 = fStack_874;
                              fVar223 = fStack_870;
                              fVar224 = fStack_86c;
                              fVar225 = fStack_868;
                              fVar130 = (float)local_7e0._0_4_;
                              fVar240 = (float)local_7e0._4_4_;
                              fVar241 = fStack_7d8;
                              fVar242 = fStack_7d4;
                              fVar244 = fStack_7d0;
                              fVar258 = fStack_7cc;
                              fVar260 = fStack_7c8;
                              fVar163 = (float)local_800._0_4_;
                              fVar262 = (float)local_800._4_4_;
                              fVar243 = fStack_7f8;
                              fVar268 = fStack_7f4;
                              fVar280 = fStack_7f0;
                              fVar281 = fStack_7ec;
                              fVar283 = fStack_7e8;
                            }
                            if (*local_910.valid == 0) {
                              unaff_R14B = 0;
                              goto LAB_0106ba28;
                            }
                          }
                          unaff_R14B = 1;
                        }
                        else {
                          auVar339 = ZEXT1664(local_a20._0_16_);
                          (*pGVar13->occlusionFilterN)(&local_910);
                          auVar304 = ZEXT1664(CONCAT412(uStack_ab4,
                                                        CONCAT48(uStack_ab8,
                                                                 CONCAT44(uStack_abc,local_ac0))));
                          auVar312 = ZEXT3264(_local_780);
                          auVar346 = ZEXT3264(_local_8a0);
                          auVar374 = ZEXT3264(_local_a20);
                          auVar239 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if (*local_910.valid != 0) goto LAB_0106b983;
                          unaff_R14B = 0;
                          fVar161 = (float)local_880._0_4_;
                          fVar167 = (float)local_880._4_4_;
                          fVar210 = fStack_878;
                          fVar222 = fStack_874;
                          fVar223 = fStack_870;
                          fVar224 = fStack_86c;
                          fVar225 = fStack_868;
                          fVar130 = (float)local_7e0._0_4_;
                          fVar240 = (float)local_7e0._4_4_;
                          fVar241 = fStack_7d8;
                          fVar242 = fStack_7d4;
                          fVar244 = fStack_7d0;
                          fVar258 = fStack_7cc;
                          fVar260 = fStack_7c8;
                          fVar163 = (float)local_800._0_4_;
                          fVar262 = (float)local_800._4_4_;
                          fVar243 = fStack_7f8;
                          fVar268 = fStack_7f4;
                          fVar280 = fStack_7f0;
                          fVar281 = fStack_7ec;
                          fVar283 = fStack_7e8;
                        }
LAB_0106ba28:
                        if (unaff_R14B == 0) {
                          ray->tfar = local_aa0;
                        }
                        bVar64 = false;
                        goto LAB_0106b79f;
                      }
                      unaff_R14B = 1;
                    }
                    auVar304 = ZEXT464((uint)local_ac0);
                    bVar64 = false;
                    auVar346 = ZEXT3264(_local_8a0);
                    goto LAB_0106b79f;
                  }
                  bVar64 = false;
                  unaff_R14B = 0;
                }
                auVar304 = ZEXT464((uint)local_ac0);
                auVar374 = ZEXT3264(_local_a20);
                auVar346 = ZEXT3264(_local_8a0);
              }
LAB_0106b79f:
              if (!bVar64) goto LAB_0106ba55;
              lVar100 = lVar100 + -1;
            } while (lVar100 != 0);
            unaff_R14B = 0;
            fVar161 = (float)local_880._0_4_;
            fVar167 = (float)local_880._4_4_;
            fVar210 = fStack_878;
            fVar222 = fStack_874;
            fVar223 = fStack_870;
            fVar224 = fStack_86c;
            fVar225 = fStack_868;
LAB_0106ba55:
            unaff_R14B = unaff_R14B & 1;
            bVar99 = bVar99 | unaff_R14B;
            fVar285 = ray->tfar;
            auVar122._4_4_ = fVar285;
            auVar122._0_4_ = fVar285;
            auVar122._8_4_ = fVar285;
            auVar122._12_4_ = fVar285;
            auVar122._16_4_ = fVar285;
            auVar122._20_4_ = fVar285;
            auVar122._24_4_ = fVar285;
            auVar122._28_4_ = fVar285;
            auVar92._4_4_ = fStack_55c;
            auVar92._0_4_ = local_560;
            auVar92._8_4_ = fStack_558;
            auVar92._12_4_ = fStack_554;
            auVar92._16_4_ = fStack_550;
            auVar92._20_4_ = fStack_54c;
            auVar92._24_4_ = fStack_548;
            auVar92._28_4_ = fStack_544;
            auVar121 = vcmpps_avx(auVar92,auVar122,2);
            auVar116 = vandps_avx(auVar121,local_500);
            auVar304 = ZEXT3264(auVar116);
            auVar28 = local_500 & auVar121;
            uVar97 = local_540;
            auVar25 = local_a00;
            local_500 = auVar116;
          } while ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar28 >> 0x7f,0) != '\0') ||
                     (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar28 >> 0xbf,0) != '\0') ||
                   (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar28[0x1f] < '\0');
        }
        auVar123._0_4_ =
             fVar130 * (float)local_5c0._0_4_ +
             fVar161 * (float)local_5a0._0_4_ + fVar163 * (float)local_580._0_4_;
        auVar123._4_4_ =
             fVar240 * (float)local_5c0._4_4_ +
             fVar167 * (float)local_5a0._4_4_ + fVar262 * (float)local_580._4_4_;
        auVar123._8_4_ = fVar241 * fStack_5b8 + fVar210 * fStack_598 + fVar243 * fStack_578;
        auVar123._12_4_ = fVar242 * fStack_5b4 + fVar222 * fStack_594 + fVar268 * fStack_574;
        auVar123._16_4_ = fVar244 * fStack_5b0 + fVar223 * fStack_590 + fVar280 * fStack_570;
        auVar123._20_4_ = fVar258 * fStack_5ac + fVar224 * fStack_58c + fVar281 * fStack_56c;
        auVar123._24_4_ = fVar260 * fStack_5a8 + fVar225 * fStack_588 + fVar283 * fStack_568;
        auVar123._28_4_ = auVar121._28_4_ + auVar121._28_4_ + auVar304._28_4_;
        auVar152._8_4_ = 0x7fffffff;
        auVar152._0_8_ = 0x7fffffff7fffffff;
        auVar152._12_4_ = 0x7fffffff;
        auVar152._16_4_ = 0x7fffffff;
        auVar152._20_4_ = 0x7fffffff;
        auVar152._24_4_ = 0x7fffffff;
        auVar152._28_4_ = 0x7fffffff;
        auVar121 = vandps_avx(auVar123,auVar152);
        auVar153._8_4_ = 0x3e99999a;
        auVar153._0_8_ = 0x3e99999a3e99999a;
        auVar153._12_4_ = 0x3e99999a;
        auVar153._16_4_ = 0x3e99999a;
        auVar153._20_4_ = 0x3e99999a;
        auVar153._24_4_ = 0x3e99999a;
        auVar153._28_4_ = 0x3e99999a;
        auVar121 = vcmpps_avx(auVar121,auVar153,1);
        auVar116 = vorps_avx(auVar121,local_260);
        auVar154._0_4_ = (float)local_700._0_4_ + (float)local_600._0_4_;
        auVar154._4_4_ = (float)local_700._4_4_ + (float)local_600._4_4_;
        auVar154._8_4_ = fStack_6f8 + fStack_5f8;
        auVar154._12_4_ = fStack_6f4 + fStack_5f4;
        auVar154._16_4_ = fStack_6f0 + fStack_5f0;
        auVar154._20_4_ = fStack_6ec + fStack_5ec;
        auVar154._24_4_ = fStack_6e8 + fStack_5e8;
        auVar154._28_4_ = fStack_6e4 + fStack_5e4;
        fVar130 = ray->tfar;
        auVar195._4_4_ = fVar130;
        auVar195._0_4_ = fVar130;
        auVar195._8_4_ = fVar130;
        auVar195._12_4_ = fVar130;
        auVar195._16_4_ = fVar130;
        auVar195._20_4_ = fVar130;
        auVar195._24_4_ = fVar130;
        auVar195._28_4_ = fVar130;
        auVar121 = vcmpps_avx(auVar154,auVar195,2);
        local_760 = vandps_avx(auVar121,auVar25);
        auVar155._8_4_ = 3;
        auVar155._0_8_ = 0x300000003;
        auVar155._12_4_ = 3;
        auVar155._16_4_ = 3;
        auVar155._20_4_ = 3;
        auVar155._24_4_ = 3;
        auVar155._28_4_ = 3;
        auVar196._8_4_ = 2;
        auVar196._0_8_ = 0x200000002;
        auVar196._12_4_ = 2;
        auVar196._16_4_ = 2;
        auVar196._20_4_ = 2;
        auVar196._24_4_ = 2;
        auVar196._28_4_ = 2;
        auVar121 = vblendvps_avx(auVar196,auVar155,auVar116);
        auVar141 = vpcmpgtd_avx(auVar121._16_16_,local_460);
        auVar111 = vpshufd_avx(local_4e0._0_16_,0);
        auVar111 = vpcmpgtd_avx(auVar121._0_16_,auVar111);
        auVar156._16_16_ = auVar141;
        auVar156._0_16_ = auVar111;
        _local_620 = vblendps_avx(ZEXT1632(auVar111),auVar156,0xf0);
        auVar121 = vandnps_avx(_local_620,local_760);
        auVar116 = local_760 & ~_local_620;
        if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar116 >> 0x7f,0) == '\0') &&
              (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar116 >> 0xbf,0) == '\0') &&
            (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar116[0x1f]) {
          auVar304 = ZEXT864(0);
          local_540 = uVar97;
        }
        else {
          local_720 = _local_440;
          local_740._4_4_ = (float)local_700._4_4_ + (float)local_440._4_4_;
          local_740._0_4_ = (float)local_700._0_4_ + (float)local_440._0_4_;
          fStack_738 = fStack_6f8 + fStack_438;
          fStack_734 = fStack_6f4 + fStack_434;
          fStack_730 = fStack_6f0 + fStack_430;
          fStack_72c = fStack_6ec + fStack_42c;
          fStack_728 = fStack_6e8 + fStack_428;
          fStack_724 = fStack_6e4 + fStack_424;
          auVar304 = ZEXT864(0);
          do {
            auVar232 = auVar239._0_16_;
            auVar157._8_4_ = 0x7f800000;
            auVar157._0_8_ = 0x7f8000007f800000;
            auVar157._12_4_ = 0x7f800000;
            auVar157._16_4_ = 0x7f800000;
            auVar157._20_4_ = 0x7f800000;
            auVar157._24_4_ = 0x7f800000;
            auVar157._28_4_ = 0x7f800000;
            auVar116 = vblendvps_avx(auVar157,local_720,auVar121);
            auVar28 = vshufps_avx(auVar116,auVar116,0xb1);
            auVar28 = vminps_avx(auVar116,auVar28);
            auVar25 = vshufpd_avx(auVar28,auVar28,5);
            auVar28 = vminps_avx(auVar28,auVar25);
            auVar25 = vperm2f128_avx(auVar28,auVar28,1);
            auVar28 = vminps_avx(auVar28,auVar25);
            auVar28 = vcmpps_avx(auVar116,auVar28,0);
            auVar25 = auVar121 & auVar28;
            auVar116 = auVar121;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar116 = vandps_avx(auVar28,auVar121);
            }
            uVar101 = vmovmskps_avx(auVar116);
            uVar95 = 0;
            if (uVar101 != 0) {
              for (; (uVar101 >> uVar95 & 1) == 0; uVar95 = uVar95 + 1) {
              }
            }
            uVar97 = (ulong)uVar95;
            local_520 = auVar121;
            *(undefined4 *)(local_520 + uVar97 * 4) = 0;
            aVar11 = (ray->dir).field_0;
            _local_a40 = (undefined1  [16])aVar11;
            auVar141 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
            local_ac0 = local_4a0[uVar97];
            uStack_abc = 0;
            uStack_ab8 = 0;
            uStack_ab4 = 0;
            local_a80 = *(float *)(local_420 + uVar97 * 4);
            auVar312 = ZEXT464((uint)local_a80);
            if (auVar141._0_4_ < 0.0) {
              uStack_abc = 0;
              uStack_ab8 = 0;
              uStack_ab4 = 0;
              uStack_a7c = 0;
              uStack_a78 = 0;
              uStack_a74 = 0;
              fVar130 = sqrtf(auVar141._0_4_);
              auVar312 = ZEXT1664(CONCAT412(uStack_a74,
                                            CONCAT48(uStack_a78,CONCAT44(uStack_a7c,local_a80))));
              auVar304 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar232._8_4_ = 0x7fffffff;
              auVar232._0_8_ = 0x7fffffff7fffffff;
              auVar232._12_4_ = 0x7fffffff;
            }
            else {
              auVar141 = vsqrtss_avx(auVar141,auVar141);
              fVar130 = auVar141._0_4_;
            }
            auVar111 = vminps_avx(_local_920,_local_940);
            auVar141 = vmaxps_avx(_local_920,_local_940);
            auVar185 = vminps_avx(_local_930,_local_950);
            auVar138 = vminps_avx(auVar111,auVar185);
            auVar111 = vmaxps_avx(_local_930,_local_950);
            auVar185 = vmaxps_avx(auVar141,auVar111);
            auVar141 = vandps_avx(auVar138,auVar232);
            auVar111 = vandps_avx(auVar185,auVar232);
            auVar141 = vmaxps_avx(auVar141,auVar111);
            auVar111 = vmovshdup_avx(auVar141);
            auVar111 = vmaxss_avx(auVar111,auVar141);
            auVar141 = vshufpd_avx(auVar141,auVar141,1);
            auVar141 = vmaxss_avx(auVar141,auVar111);
            local_8c0._0_4_ = auVar141._0_4_ * 1.9073486e-06;
            local_a00._0_4_ = fVar130 * 1.9073486e-06;
            local_7c0._0_16_ = vshufps_avx(auVar185,auVar185,0xff);
            lVar100 = 5;
            do {
              local_a80 = auVar312._0_4_;
              uStack_a7c = auVar312._4_4_;
              uStack_a78 = auVar312._8_4_;
              uStack_a74 = auVar312._12_4_;
              auVar141 = vshufps_avx(auVar312._0_16_,auVar312._0_16_,0);
              auVar110._0_4_ = auVar141._0_4_ * (float)local_a40._0_4_ + 0.0;
              auVar110._4_4_ = auVar141._4_4_ * (float)local_a40._4_4_ + 0.0;
              auVar110._8_4_ = auVar141._8_4_ * fStack_a38 + 0.0;
              auVar110._12_4_ = auVar141._12_4_ * fStack_a34 + 0.0;
              local_9e0._0_4_ = 1.0 - local_ac0;
              fVar161 = local_ac0 * local_ac0;
              fVar163 = local_ac0 * 3.0;
              fVar130 = fVar163 + -5.0;
              local_9a0._0_4_ = (float)local_9e0._0_4_ * (float)local_9e0._0_4_;
              auVar141 = ZEXT416((uint)(local_ac0 * local_ac0 * -(float)local_9e0._0_4_ * 0.5));
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              auVar111 = ZEXT416((uint)(((float)local_9e0._0_4_ * (float)local_9e0._0_4_ *
                                         ((float)local_9e0._0_4_ * 3.0 + -5.0) + 2.0) * 0.5));
              auVar111 = vshufps_avx(auVar111,auVar111,0);
              auVar185 = ZEXT416((uint)((fVar161 * fVar130 + 2.0) * 0.5));
              auVar185 = vshufps_avx(auVar185,auVar185,0);
              auVar138 = ZEXT416((uint)((float)local_9e0._0_4_ * (float)local_9e0._0_4_ * -local_ac0
                                       * 0.5));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar186._0_4_ =
                   auVar138._0_4_ * (float)local_920._0_4_ +
                   auVar185._0_4_ * (float)local_940._0_4_ +
                   auVar111._0_4_ * (float)local_930._0_4_ + auVar141._0_4_ * (float)local_950._0_4_
              ;
              auVar186._4_4_ =
                   auVar138._4_4_ * (float)local_920._4_4_ +
                   auVar185._4_4_ * (float)local_940._4_4_ +
                   auVar111._4_4_ * (float)local_930._4_4_ + auVar141._4_4_ * (float)local_950._4_4_
              ;
              auVar186._8_4_ =
                   auVar138._8_4_ * fStack_918 +
                   auVar185._8_4_ * fStack_938 +
                   auVar111._8_4_ * fStack_928 + auVar141._8_4_ * fStack_948;
              auVar186._12_4_ =
                   auVar138._12_4_ * fStack_914 +
                   auVar185._12_4_ * fStack_934 +
                   auVar111._12_4_ * fStack_924 + auVar141._12_4_ * fStack_944;
              fVar167 = (float)local_9e0._0_4_ * -2.0;
              local_6e0._0_16_ = auVar186;
              auVar141 = vsubps_avx(auVar110,auVar186);
              _local_8e0 = auVar141;
              auVar141 = vdpps_avx(auVar141,auVar141,0x7f);
              local_aa0 = local_ac0 * -9.0 + 4.0;
              fStack_a9c = 0.0;
              fStack_a98 = 0.0;
              fStack_a94 = 0.0;
              _local_860 = auVar141;
              local_980._0_16_ = ZEXT416((uint)(fVar163 + -1.0));
              if (auVar141._0_4_ < 0.0) {
                local_9c0._0_4_ = fVar161;
                local_9e0._0_16_ = ZEXT416((uint)local_9e0._0_4_);
                local_7a0._0_4_ = fVar163;
                local_880._0_4_ = local_ac0 * 9.0;
                local_7e0._0_4_ = fVar130;
                local_800._0_4_ = fVar167;
                fVar210 = sqrtf(auVar141._0_4_);
                auVar304 = ZEXT1664(ZEXT816(0) << 0x40);
                fVar163 = (float)local_7a0._0_4_;
                fVar130 = (float)local_7e0._0_4_;
                fVar167 = (float)local_800._0_4_;
                fVar161 = (float)local_9c0._0_4_;
                fVar222 = (float)local_880._0_4_;
              }
              else {
                auVar141 = vsqrtss_avx(auVar141,auVar141);
                fVar210 = auVar141._0_4_;
                fVar222 = local_ac0 * 9.0;
              }
              auVar141 = ZEXT416((uint)((fVar161 + fVar167 * local_ac0) * 0.5));
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              auVar111 = ZEXT416((uint)((((float)local_9e0._0_4_ + (float)local_9e0._0_4_) *
                                         (fVar163 + 2.0) +
                                        (float)local_9e0._0_4_ * (float)local_9e0._0_4_ * -3.0) *
                                       0.5));
              auVar111 = vshufps_avx(auVar111,auVar111,0);
              auVar185 = ZEXT416((uint)((fVar130 * (local_ac0 + local_ac0) + local_ac0 * fVar163) *
                                       0.5));
              auVar185 = vshufps_avx(auVar185,auVar185,0);
              auVar138 = ZEXT416((uint)((local_ac0 *
                                         ((float)local_9e0._0_4_ + (float)local_9e0._0_4_) -
                                        (float)local_9a0._0_4_) * 0.5));
              auVar138 = vshufps_avx(auVar138,auVar138,0);
              auVar343._0_4_ =
                   (float)local_920._0_4_ * auVar138._0_4_ +
                   (float)local_940._0_4_ * auVar185._0_4_ +
                   (float)local_950._0_4_ * auVar141._0_4_ + (float)local_930._0_4_ * auVar111._0_4_
              ;
              auVar343._4_4_ =
                   (float)local_920._4_4_ * auVar138._4_4_ +
                   (float)local_940._4_4_ * auVar185._4_4_ +
                   (float)local_950._4_4_ * auVar141._4_4_ + (float)local_930._4_4_ * auVar111._4_4_
              ;
              auVar343._8_4_ =
                   fStack_918 * auVar138._8_4_ +
                   fStack_938 * auVar185._8_4_ +
                   fStack_948 * auVar141._8_4_ + fStack_928 * auVar111._8_4_;
              auVar343._12_4_ =
                   fStack_914 * auVar138._12_4_ +
                   fStack_934 * auVar185._12_4_ +
                   fStack_944 * auVar141._12_4_ + fStack_924 * auVar111._12_4_;
              auVar138 = vpermilps_avx(local_980._0_16_,0);
              auVar87._4_4_ = fStack_a9c;
              auVar87._0_4_ = local_aa0;
              auVar87._8_4_ = fStack_a98;
              auVar87._12_4_ = fStack_a94;
              auVar17 = vpermilps_avx(auVar87,0);
              auVar141 = vshufps_avx(ZEXT416((uint)(fVar222 + -5.0)),ZEXT416((uint)(fVar222 + -5.0))
                                     ,0);
              auVar111 = ZEXT416((uint)(local_ac0 * -3.0 + 2.0));
              auVar185 = vshufps_avx(auVar111,auVar111,0);
              auVar111 = vdpps_avx(auVar343,auVar343,0x7f);
              auVar139._0_4_ =
                   (float)local_920._0_4_ * auVar185._0_4_ +
                   (float)local_940._0_4_ * auVar141._0_4_ +
                   (float)local_930._0_4_ * auVar17._0_4_ + (float)local_950._0_4_ * auVar138._0_4_;
              auVar139._4_4_ =
                   (float)local_920._4_4_ * auVar185._4_4_ +
                   (float)local_940._4_4_ * auVar141._4_4_ +
                   (float)local_930._4_4_ * auVar17._4_4_ + (float)local_950._4_4_ * auVar138._4_4_;
              auVar139._8_4_ =
                   fStack_918 * auVar185._8_4_ +
                   fStack_938 * auVar141._8_4_ +
                   fStack_928 * auVar17._8_4_ + fStack_948 * auVar138._8_4_;
              auVar139._12_4_ =
                   fStack_914 * auVar185._12_4_ +
                   fStack_934 * auVar141._12_4_ +
                   fStack_924 * auVar17._12_4_ + fStack_944 * auVar138._12_4_;
              auVar141 = vblendps_avx(auVar111,_DAT_01feba10,0xe);
              auVar185 = vrsqrtss_avx(auVar141,auVar141);
              fVar161 = auVar185._0_4_;
              fVar130 = auVar111._0_4_;
              auVar185 = vdpps_avx(auVar343,auVar139,0x7f);
              auVar138 = vshufps_avx(auVar111,auVar111,0);
              auVar140._0_4_ = auVar139._0_4_ * auVar138._0_4_;
              auVar140._4_4_ = auVar139._4_4_ * auVar138._4_4_;
              auVar140._8_4_ = auVar139._8_4_ * auVar138._8_4_;
              auVar140._12_4_ = auVar139._12_4_ * auVar138._12_4_;
              auVar185 = vshufps_avx(auVar185,auVar185,0);
              auVar233._0_4_ = auVar343._0_4_ * auVar185._0_4_;
              auVar233._4_4_ = auVar343._4_4_ * auVar185._4_4_;
              auVar233._8_4_ = auVar343._8_4_ * auVar185._8_4_;
              auVar233._12_4_ = auVar343._12_4_ * auVar185._12_4_;
              auVar138 = vsubps_avx(auVar140,auVar233);
              auVar185 = vrcpss_avx(auVar141,auVar141);
              auVar141 = vmaxss_avx(ZEXT416((uint)local_8c0._0_4_),
                                    ZEXT416((uint)((float)local_a00._0_4_ * local_a80)));
              local_aa0 = auVar141._0_4_;
              auVar141 = ZEXT416((uint)(auVar185._0_4_ * (2.0 - fVar130 * auVar185._0_4_)));
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              uVar97 = CONCAT44(auVar343._4_4_,auVar343._0_4_);
              auVar274._0_8_ = uVar97 ^ 0x8000000080000000;
              auVar274._8_4_ = -auVar343._8_4_;
              auVar274._12_4_ = -auVar343._12_4_;
              auVar185 = ZEXT416((uint)(fVar161 * 1.5 + fVar130 * -0.5 * fVar161 * fVar161 * fVar161
                                       ));
              auVar185 = vshufps_avx(auVar185,auVar185,0);
              auVar216._0_4_ = auVar185._0_4_ * auVar138._0_4_ * auVar141._0_4_;
              auVar216._4_4_ = auVar185._4_4_ * auVar138._4_4_ * auVar141._4_4_;
              auVar216._8_4_ = auVar185._8_4_ * auVar138._8_4_ * auVar141._8_4_;
              auVar216._12_4_ = auVar185._12_4_ * auVar138._12_4_ * auVar141._12_4_;
              local_980._0_16_ = auVar343;
              local_9e0._0_4_ = auVar343._0_4_ * auVar185._0_4_;
              local_9e0._4_4_ = auVar343._4_4_ * auVar185._4_4_;
              local_9e0._8_4_ = auVar343._8_4_ * auVar185._8_4_;
              local_9e0._12_4_ = auVar343._12_4_ * auVar185._12_4_;
              if (fVar130 < 0.0) {
                local_9a0._0_4_ = fVar210;
                local_9c0._0_16_ = auVar274;
                local_7a0._0_16_ = auVar216;
                fVar130 = sqrtf(fVar130);
                auVar304 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar216 = local_7a0._0_16_;
                auVar274 = local_9c0._0_16_;
              }
              else {
                auVar141 = vsqrtss_avx(auVar111,auVar111);
                fVar130 = auVar141._0_4_;
                local_9a0._0_4_ = fVar210;
              }
              auVar141 = vdpps_avx(_local_8e0,local_9e0._0_16_,0x7f);
              local_9c0._0_4_ =
                   ((float)local_8c0._0_4_ / fVar130) * ((float)local_9a0._0_4_ + 1.0) +
                   (float)local_9a0._0_4_ * (float)local_8c0._0_4_ + local_aa0;
              auVar111 = vdpps_avx(auVar274,local_9e0._0_16_,0x7f);
              auVar185 = vdpps_avx(_local_8e0,auVar216,0x7f);
              auVar138 = vdpps_avx(_local_a40,local_9e0._0_16_,0x7f);
              auVar17 = vdpps_avx(_local_8e0,auVar274,0x7f);
              fVar130 = auVar111._0_4_ + auVar185._0_4_;
              fVar161 = auVar141._0_4_;
              auVar112._0_4_ = fVar161 * fVar161;
              auVar112._4_4_ = auVar141._4_4_ * auVar141._4_4_;
              auVar112._8_4_ = auVar141._8_4_ * auVar141._8_4_;
              auVar112._12_4_ = auVar141._12_4_ * auVar141._12_4_;
              auVar185 = vsubps_avx(_local_860,auVar112);
              local_9e0._0_16_ = ZEXT416((uint)fVar130);
              auVar111 = vdpps_avx(_local_8e0,_local_a40,0x7f);
              fVar163 = auVar17._0_4_ - fVar161 * fVar130;
              local_9a0._0_16_ = auVar141;
              fVar161 = auVar111._0_4_ - auVar138._0_4_ * fVar161;
              auVar141 = vrsqrtss_avx(auVar185,auVar185);
              fVar167 = auVar185._0_4_;
              fVar130 = auVar141._0_4_;
              fVar130 = fVar130 * 1.5 + fVar167 * -0.5 * fVar130 * fVar130 * fVar130;
              if (fVar167 < 0.0) {
                local_7a0._0_16_ = auVar138;
                local_880._0_4_ = fVar163;
                local_7e0._0_4_ = fVar161;
                local_800._0_4_ = fVar130;
                fVar167 = sqrtf(fVar167);
                auVar304 = ZEXT1664(ZEXT816(0) << 0x40);
                fVar130 = (float)local_800._0_4_;
                fVar163 = (float)local_880._0_4_;
                fVar161 = (float)local_7e0._0_4_;
                auVar138 = local_7a0._0_16_;
              }
              else {
                auVar141 = vsqrtss_avx(auVar185,auVar185);
                fVar167 = auVar141._0_4_;
              }
              auVar339 = ZEXT3264(_local_a20);
              auVar185 = vpermilps_avx(local_6e0._0_16_,0xff);
              auVar17 = vpermilps_avx(local_980._0_16_,0xff);
              fVar163 = fVar163 * fVar130 - auVar17._0_4_;
              auVar234._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
              auVar234._8_4_ = auVar138._8_4_ ^ 0x80000000;
              auVar234._12_4_ = auVar138._12_4_ ^ 0x80000000;
              auVar248._0_4_ = -fVar163;
              auVar248._4_4_ = 0x80000000;
              auVar248._8_4_ = 0x80000000;
              auVar248._12_4_ = 0x80000000;
              auVar141 = vinsertps_avx(ZEXT416((uint)(fVar161 * fVar130)),auVar234,0x10);
              auVar111 = vmovsldup_avx(ZEXT416((uint)(local_9e0._0_4_ * fVar161 * fVar130 -
                                                     auVar138._0_4_ * fVar163)));
              auVar141 = vdivps_avx(auVar141,auVar111);
              auVar138 = ZEXT416((uint)(fVar167 - auVar185._0_4_));
              auVar185 = vinsertps_avx(local_9a0._0_16_,auVar138,0x10);
              auVar217._0_4_ = auVar185._0_4_ * auVar141._0_4_;
              auVar217._4_4_ = auVar185._4_4_ * auVar141._4_4_;
              auVar217._8_4_ = auVar185._8_4_ * auVar141._8_4_;
              auVar217._12_4_ = auVar185._12_4_ * auVar141._12_4_;
              auVar141 = vinsertps_avx(auVar248,local_9e0._0_16_,0x1c);
              auVar141 = vdivps_avx(auVar141,auVar111);
              auVar111 = vhaddps_avx(auVar217,auVar217);
              auVar187._0_4_ = auVar185._0_4_ * auVar141._0_4_;
              auVar187._4_4_ = auVar185._4_4_ * auVar141._4_4_;
              auVar187._8_4_ = auVar185._8_4_ * auVar141._8_4_;
              auVar187._12_4_ = auVar185._12_4_ * auVar141._12_4_;
              auVar141 = vhaddps_avx(auVar187,auVar187);
              local_ac0 = local_ac0 - auVar111._0_4_;
              uStack_abc = 0;
              uStack_ab8 = 0;
              uStack_ab4 = 0;
              local_a80 = local_a80 - auVar141._0_4_;
              auVar312 = ZEXT464((uint)local_a80);
              auVar235._8_4_ = 0x7fffffff;
              auVar235._0_8_ = 0x7fffffff7fffffff;
              auVar235._12_4_ = 0x7fffffff;
              auVar239 = ZEXT1664(auVar235);
              auVar141 = vandps_avx(local_9a0._0_16_,auVar235);
              bVar64 = true;
              if ((float)local_9c0._0_4_ <= auVar141._0_4_) {
LAB_0106c39c:
                auVar374 = ZEXT3264(_local_a20);
                auVar346 = ZEXT3264(_local_8a0);
              }
              else {
                auVar141 = vandps_avx(auVar138,auVar235);
                if ((float)local_7c0._0_4_ * 1.9073486e-06 + (float)local_9c0._0_4_ + local_aa0 <=
                    auVar141._0_4_) goto LAB_0106c39c;
                local_a80 = local_a80 + (float)local_6b0._0_4_;
                auVar312 = ZEXT464((uint)local_a80);
                bVar64 = false;
                if (local_a80 < (ray->org).field_0.m128[3]) {
                  unaff_R14B = 0;
                  goto LAB_0106c39c;
                }
                fVar130 = ray->tfar;
                auVar374 = ZEXT3264(_local_a20);
                if ((fVar130 < local_a80) || (local_ac0 < 0.0)) {
                  bVar64 = false;
                  unaff_R14B = 0;
                  goto LAB_0106c39c;
                }
                auVar346 = ZEXT3264(_local_8a0);
                if (1.0 < local_ac0) {
LAB_0106c3b9:
                  bVar64 = false;
                  unaff_R14B = 0;
                }
                else {
                  auVar141 = vrsqrtss_avx(_local_860,_local_860);
                  fVar161 = auVar141._0_4_;
                  pGVar13 = (context->scene->geometries).items[local_a48].ptr;
                  if ((pGVar13->mask & ray->mask) == 0) goto LAB_0106c3b9;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    unaff_R14B = 1;
                  }
                  else {
                    auVar141 = ZEXT416((uint)(fVar161 * 1.5 +
                                             local_860._0_4_ * -0.5 * fVar161 * fVar161 * fVar161));
                    auVar141 = vshufps_avx(auVar141,auVar141,0);
                    auVar142._0_4_ = auVar141._0_4_ * (float)local_8e0._0_4_;
                    auVar142._4_4_ = auVar141._4_4_ * (float)local_8e0._4_4_;
                    auVar142._8_4_ = auVar141._8_4_ * fStack_8d8;
                    auVar142._12_4_ = auVar141._12_4_ * fStack_8d4;
                    auVar113._0_4_ = local_980._0_4_ + auVar17._0_4_ * auVar142._0_4_;
                    auVar113._4_4_ = local_980._4_4_ + auVar17._4_4_ * auVar142._4_4_;
                    auVar113._8_4_ = local_980._8_4_ + auVar17._8_4_ * auVar142._8_4_;
                    auVar113._12_4_ = local_980._12_4_ + auVar17._12_4_ * auVar142._12_4_;
                    auVar141 = vshufps_avx(auVar142,auVar142,0xc9);
                    auVar111 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xc9);
                    auVar143._0_4_ = auVar111._0_4_ * auVar142._0_4_;
                    auVar143._4_4_ = auVar111._4_4_ * auVar142._4_4_;
                    auVar143._8_4_ = auVar111._8_4_ * auVar142._8_4_;
                    auVar143._12_4_ = auVar111._12_4_ * auVar142._12_4_;
                    auVar188._0_4_ = local_980._0_4_ * auVar141._0_4_;
                    auVar188._4_4_ = local_980._4_4_ * auVar141._4_4_;
                    auVar188._8_4_ = local_980._8_4_ * auVar141._8_4_;
                    auVar188._12_4_ = local_980._12_4_ * auVar141._12_4_;
                    auVar185 = vsubps_avx(auVar188,auVar143);
                    auVar141 = vshufps_avx(auVar185,auVar185,0xc9);
                    auVar111 = vshufps_avx(auVar113,auVar113,0xc9);
                    auVar189._0_4_ = auVar111._0_4_ * auVar141._0_4_;
                    auVar189._4_4_ = auVar111._4_4_ * auVar141._4_4_;
                    auVar189._8_4_ = auVar111._8_4_ * auVar141._8_4_;
                    auVar189._12_4_ = auVar111._12_4_ * auVar141._12_4_;
                    auVar141 = vshufps_avx(auVar185,auVar185,0xd2);
                    auVar114._0_4_ = auVar113._0_4_ * auVar141._0_4_;
                    auVar114._4_4_ = auVar113._4_4_ * auVar141._4_4_;
                    auVar114._8_4_ = auVar113._8_4_ * auVar141._8_4_;
                    auVar114._12_4_ = auVar113._12_4_ * auVar141._12_4_;
                    auVar111 = vsubps_avx(auVar189,auVar114);
                    auVar141 = vshufps_avx(auVar111,auVar111,0xe9);
                    local_840 = vmovlps_avx(auVar141);
                    local_838 = auVar111._0_4_;
                    local_830 = 0;
                    local_82c = (undefined4)local_808;
                    local_828 = (undefined4)local_a48;
                    local_824 = context->user->instID[0];
                    local_820 = context->user->instPrimID[0];
                    ray->tfar = local_a80;
                    local_ac4 = -1;
                    local_910.valid = &local_ac4;
                    local_910.geometryUserPtr = pGVar13->userPtr;
                    local_910.context = context->user;
                    local_910.hit = (RTCHitN *)&local_840;
                    local_910.N = 1;
                    uStack_abc = 0;
                    uStack_ab8 = 0;
                    uStack_ab4 = 0;
                    uStack_a7c = 0;
                    uStack_a78 = 0;
                    uStack_a74 = 0;
                    local_aa0 = fVar130;
                    local_910.ray = (RTCRayN *)ray;
                    local_834 = local_ac0;
                    if (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0106c53f:
                      p_Var16 = context->args->filter;
                      if (p_Var16 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar13->field_8).field_0x2 & 0x40) != 0)) {
                          auVar339 = ZEXT1664(auVar339._0_16_);
                          (*p_Var16)(&local_910);
                          auVar312 = ZEXT1664(CONCAT412(uStack_a74,
                                                        CONCAT48(uStack_a78,
                                                                 CONCAT44(uStack_a7c,local_a80))));
                          auVar346 = ZEXT3264(_local_8a0);
                          auVar374 = ZEXT3264(_local_a20);
                          auVar304 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar239 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        if (*local_910.valid == 0) goto LAB_0106c5ad;
                      }
                      unaff_R14B = 1;
                    }
                    else {
                      auVar339 = ZEXT1664(local_a20._0_16_);
                      (*pGVar13->occlusionFilterN)(&local_910);
                      auVar312 = ZEXT1664(CONCAT412(uStack_a74,
                                                    CONCAT48(uStack_a78,
                                                             CONCAT44(uStack_a7c,local_a80))));
                      auVar346 = ZEXT3264(_local_8a0);
                      auVar374 = ZEXT3264(_local_a20);
                      auVar304 = ZEXT1664(ZEXT816(0) << 0x40);
                      auVar239 = ZEXT1664(CONCAT412(0x7fffffff,
                                                    CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      if (*local_910.valid != 0) goto LAB_0106c53f;
LAB_0106c5ad:
                      unaff_R14B = 0;
                    }
                    if (unaff_R14B == 0) {
                      ray->tfar = local_aa0;
                    }
                  }
                  bVar64 = false;
                }
              }
              if (!bVar64) goto LAB_0106c5c7;
              lVar100 = lVar100 + -1;
            } while (lVar100 != 0);
            unaff_R14B = 0;
LAB_0106c5c7:
            unaff_R14B = unaff_R14B & 1;
            bVar99 = bVar99 | unaff_R14B;
            fVar130 = ray->tfar;
            auVar124._4_4_ = fVar130;
            auVar124._0_4_ = fVar130;
            auVar124._8_4_ = fVar130;
            auVar124._12_4_ = fVar130;
            auVar124._16_4_ = fVar130;
            auVar124._20_4_ = fVar130;
            auVar124._24_4_ = fVar130;
            auVar124._28_4_ = fVar130;
            auVar116 = vcmpps_avx(_local_740,auVar124,2);
            auVar121 = vandps_avx(auVar116,local_520);
            local_520 = local_520 & auVar116;
            auVar312 = ZEXT3264(_local_780);
          } while ((((((((local_520 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_520 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_520 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_520 >> 0x7f,0) != '\0') ||
                     (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_520 >> 0xbf,0) != '\0') ||
                   (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_520[0x1f] < '\0');
        }
        auVar121 = vandps_avx(local_5e0,local_4c0);
        auVar116 = vandps_avx(_local_620,local_760);
        auVar197._0_4_ = (float)local_700._0_4_ + local_400._0_4_;
        auVar197._4_4_ = (float)local_700._4_4_ + local_400._4_4_;
        auVar197._8_4_ = fStack_6f8 + local_400._8_4_;
        auVar197._12_4_ = fStack_6f4 + local_400._12_4_;
        auVar197._16_4_ = fStack_6f0 + local_400._16_4_;
        auVar197._20_4_ = fStack_6ec + local_400._20_4_;
        auVar197._24_4_ = fStack_6e8 + local_400._24_4_;
        auVar197._28_4_ = fStack_6e4 + local_400._28_4_;
        fVar130 = ray->tfar;
        auVar238._4_4_ = fVar130;
        auVar238._0_4_ = fVar130;
        auVar238._8_4_ = fVar130;
        auVar238._12_4_ = fVar130;
        auVar238._16_4_ = fVar130;
        auVar238._20_4_ = fVar130;
        auVar238._24_4_ = fVar130;
        auVar238._28_4_ = fVar130;
        auVar28 = vcmpps_avx(auVar197,auVar238,2);
        auVar121 = vandps_avx(auVar28,auVar121);
        auVar256._0_4_ = (float)local_700._0_4_ + local_440._0_4_;
        auVar256._4_4_ = (float)local_700._4_4_ + local_440._4_4_;
        auVar256._8_4_ = fStack_6f8 + local_440._8_4_;
        auVar256._12_4_ = fStack_6f4 + local_440._12_4_;
        auVar256._16_4_ = fStack_6f0 + local_440._16_4_;
        auVar256._20_4_ = fStack_6ec + local_440._20_4_;
        auVar256._24_4_ = fStack_6e8 + local_440._24_4_;
        auVar256._28_4_ = fStack_6e4 + local_440._28_4_;
        auVar28 = vcmpps_avx(auVar256,auVar238,2);
        auVar116 = vandps_avx(auVar28,auVar116);
        auVar116 = vorps_avx(auVar121,auVar116);
        if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar116 >> 0x7f,0) != '\0') ||
              (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar116 >> 0xbf,0) != '\0') ||
            (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar116[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar96 * 0x60) = auVar116;
          auVar121 = vblendvps_avx(_local_440,local_400,auVar121);
          *(undefined1 (*) [32])(auStack_160 + uVar96 * 0x60) = auVar121;
          uVar8 = vmovlps_avx(local_6a0);
          *(undefined8 *)(afStack_140 + uVar96 * 0x18) = uVar8;
          auStack_138[uVar96 * 0x18] = (int)local_540 + 1;
          uVar96 = (ulong)((int)uVar96 + 1);
        }
      }
    }
    fVar130 = ray->tfar;
    auVar119._4_4_ = fVar130;
    auVar119._0_4_ = fVar130;
    auVar119._8_4_ = fVar130;
    auVar119._12_4_ = fVar130;
    auVar119._16_4_ = fVar130;
    auVar119._20_4_ = fVar130;
    auVar119._24_4_ = fVar130;
    auVar119._28_4_ = fVar130;
    uVar97 = uVar96;
    do {
      if ((int)uVar97 == 0) {
        if (bVar99 != 0) {
          return local_ad1;
        }
        fVar130 = ray->tfar;
        auVar115._4_4_ = fVar130;
        auVar115._0_4_ = fVar130;
        auVar115._8_4_ = fVar130;
        auVar115._12_4_ = fVar130;
        auVar141 = vcmpps_avx(local_450,auVar115,2);
        uVar95 = vmovmskps_avx(auVar141);
        uVar95 = (uint)local_688 - 1 & (uint)local_688 & uVar95;
        local_ad1 = uVar95 != 0;
        if (!local_ad1) {
          return local_ad1;
        }
        goto LAB_01069af2;
      }
      uVar96 = (ulong)((int)uVar97 - 1);
      lVar100 = uVar96 * 0x60;
      auVar121 = *(undefined1 (*) [32])(auStack_160 + lVar100);
      auVar146._0_4_ = (float)local_700._0_4_ + auVar121._0_4_;
      auVar146._4_4_ = (float)local_700._4_4_ + auVar121._4_4_;
      auVar146._8_4_ = fStack_6f8 + auVar121._8_4_;
      auVar146._12_4_ = fStack_6f4 + auVar121._12_4_;
      auVar146._16_4_ = fStack_6f0 + auVar121._16_4_;
      auVar146._20_4_ = fStack_6ec + auVar121._20_4_;
      auVar146._24_4_ = fStack_6e8 + auVar121._24_4_;
      auVar146._28_4_ = fStack_6e4 + auVar121._28_4_;
      auVar28 = vcmpps_avx(auVar146,auVar119,2);
      auVar116 = vandps_avx(auVar28,*(undefined1 (*) [32])(auStack_180 + lVar100));
      local_400 = auVar116;
      auVar25 = *(undefined1 (*) [32])(auStack_180 + lVar100) & auVar28;
      bVar82 = (auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar83 = (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar81 = (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar80 = SUB321(auVar25 >> 0x7f,0) == '\0';
      bVar79 = (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar78 = SUB321(auVar25 >> 0xbf,0) == '\0';
      bVar77 = (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar64 = -1 < auVar25[0x1f];
      if (((((((!bVar82 || !bVar83) || !bVar81) || !bVar80) || !bVar79) || !bVar78) || !bVar77) ||
          !bVar64) {
        auVar220._8_4_ = 0x7f800000;
        auVar220._0_8_ = 0x7f8000007f800000;
        auVar220._12_4_ = 0x7f800000;
        auVar220._16_4_ = 0x7f800000;
        auVar220._20_4_ = 0x7f800000;
        auVar220._24_4_ = 0x7f800000;
        auVar220._28_4_ = 0x7f800000;
        auVar121 = vblendvps_avx(auVar220,auVar121,auVar116);
        auVar28 = vshufps_avx(auVar121,auVar121,0xb1);
        auVar28 = vminps_avx(auVar121,auVar28);
        auVar25 = vshufpd_avx(auVar28,auVar28,5);
        auVar25 = vminps_avx(auVar28,auVar25);
        auVar28 = vperm2f128_avx(auVar25,auVar25,1);
        auVar25 = vminps_avx(auVar25,auVar28);
        auVar121 = vcmpps_avx(auVar121,auVar25,0);
        auVar25 = auVar116 & auVar121;
        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0x7f,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0xbf,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar25[0x1f] < '\0') {
          auVar116 = vandps_avx(auVar121,auVar116);
        }
        fVar130 = afStack_140[uVar96 * 0x18 + 1];
        local_540 = (ulong)auStack_138[uVar96 * 0x18];
        uVar101 = vmovmskps_avx(auVar116);
        uVar95 = 0;
        if (uVar101 != 0) {
          for (; (uVar101 >> uVar95 & 1) == 0; uVar95 = uVar95 + 1) {
          }
        }
        fVar161 = afStack_140[uVar96 * 0x18];
        *(undefined4 *)(local_400 + (ulong)uVar95 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar100) = local_400;
        if ((((((((local_400 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_400 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_400 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_400 >> 0x7f,0) != '\0') ||
              (local_400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_400 >> 0xbf,0) != '\0') ||
            (local_400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_400[0x1f] < '\0') {
          uVar96 = uVar97;
        }
        auVar141 = vshufps_avx(ZEXT416((uint)(fVar130 - fVar161)),ZEXT416((uint)(fVar130 - fVar161))
                               ,0);
        local_440._4_4_ = fVar161 + auVar141._4_4_ * 0.14285715;
        local_440._0_4_ = fVar161 + auVar141._0_4_ * 0.0;
        fStack_438 = fVar161 + auVar141._8_4_ * 0.2857143;
        fStack_434 = fVar161 + auVar141._12_4_ * 0.42857146;
        fStack_430 = fVar161 + auVar141._0_4_ * 0.5714286;
        fStack_42c = fVar161 + auVar141._4_4_ * 0.71428573;
        fStack_428 = fVar161 + auVar141._8_4_ * 0.8571429;
        fStack_424 = fVar161 + auVar141._12_4_;
        local_6a0._8_8_ = 0;
        local_6a0._0_8_ = *(ulong *)(local_440 + (ulong)uVar95 * 4);
      }
      auVar239 = ZEXT3264(auVar28);
      uVar97 = uVar96;
    } while (((((((bVar82 && bVar83) && bVar81) && bVar80) && bVar79) && bVar78) && bVar77) &&
             bVar64);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }